

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCRayQueryContext *pRVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  bool bVar74;
  undefined1 auVar75 [12];
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  uint uVar95;
  long lVar96;
  ulong uVar97;
  ulong uVar98;
  byte unaff_R13B;
  __m128 a;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar111 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar129;
  float fVar130;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar171;
  float fVar172;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar173;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar174;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [28];
  float fVar218;
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar211 [32];
  float fVar220;
  float fVar223;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  float fVar224;
  float fVar243;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [28];
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar248;
  undefined1 auVar237 [32];
  float fVar245;
  float fVar247;
  float fVar249;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar240 [32];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar269;
  float fVar272;
  undefined1 auVar253 [16];
  float fVar275;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar278;
  float fVar281;
  float fVar283;
  undefined1 auVar259 [32];
  float fVar270;
  float fVar273;
  float fVar276;
  float fVar279;
  float fVar282;
  float fVar284;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar271;
  float fVar274;
  float fVar277;
  float fVar280;
  float fVar285;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  undefined1 auVar290 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar303;
  float fVar307;
  float fVar315;
  float fVar319;
  float fVar323;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar311;
  undefined1 auVar296 [32];
  float fVar304;
  float fVar305;
  float fVar308;
  float fVar309;
  float fVar312;
  float fVar313;
  float fVar316;
  float fVar317;
  float fVar320;
  float fVar321;
  float fVar324;
  float fVar325;
  undefined1 auVar297 [32];
  float fVar306;
  float fVar310;
  float fVar314;
  float fVar318;
  float fVar322;
  float fVar326;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar328;
  undefined1 auVar329 [16];
  float fVar327;
  undefined1 auVar330 [16];
  float fVar343;
  float fVar345;
  float fVar351;
  float fVar354;
  float fVar357;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar349;
  float fVar352;
  float fVar355;
  float fVar358;
  undefined1 auVar338 [32];
  float fVar347;
  float fVar350;
  float fVar353;
  float fVar356;
  float fVar359;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [64];
  undefined1 auVar367 [28];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar371;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [64];
  undefined1 auVar380 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar389 [16];
  float fVar388;
  float fVar392;
  float fVar393;
  float fVar395;
  float fVar396;
  float fVar397;
  float in_register_0000151c;
  undefined1 auVar390 [32];
  float fVar394;
  float fVar398;
  undefined1 auVar391 [32];
  float fVar399;
  undefined1 auVar400 [16];
  float fVar406;
  float fVar407;
  float fVar409;
  float fVar410;
  float fVar411;
  undefined1 auVar401 [32];
  float fVar412;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar408;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float in_register_0000159c;
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  float fVar417;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float in_register_000015dc;
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c69;
  undefined1 local_c40 [32];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined1 (*local_a60) [32];
  ulong local_a58;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  ulong local_720;
  undefined1 auStack_718 [24];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600 [4];
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar8 = prim[1];
  uVar98 = (ulong)(byte)PVar8;
  lVar96 = uVar98 * 5;
  fVar250 = *(float *)(prim + uVar98 * 0x19 + 0x12);
  auVar136 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar136 = vinsertps_avx(auVar136,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar136 = vsubps_avx(auVar136,*(undefined1 (*) [16])(prim + uVar98 * 0x19 + 6));
  auVar134._0_4_ = fVar250 * auVar136._0_4_;
  auVar134._4_4_ = fVar250 * auVar136._4_4_;
  auVar134._8_4_ = fVar250 * auVar136._8_4_;
  auVar134._12_4_ = fVar250 * auVar136._12_4_;
  auVar253._0_4_ = fVar250 * auVar19._0_4_;
  auVar253._4_4_ = fVar250 * auVar19._4_4_;
  auVar253._8_4_ = fVar250 * auVar19._8_4_;
  auVar253._12_4_ = fVar250 * auVar19._12_4_;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 10)));
  auVar120._16_16_ = auVar19;
  auVar120._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 10)));
  auVar186._16_16_ = auVar19;
  auVar186._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 10)));
  auVar118 = vcvtdq2ps_avx(auVar186);
  auVar211._16_16_ = auVar19;
  auVar211._0_16_ = auVar136;
  auVar13 = vcvtdq2ps_avx(auVar211);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xb + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xb + 10)));
  auVar235._16_16_ = auVar19;
  auVar235._0_16_ = auVar136;
  uVar94 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar235);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar293._16_16_ = auVar19;
  auVar293._0_16_ = auVar136;
  auVar15 = vcvtdq2ps_avx(auVar293);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar98 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar98 + 10)));
  auVar331._16_16_ = auVar19;
  auVar331._0_16_ = auVar136;
  auVar363 = vcvtdq2ps_avx(auVar331);
  lVar10 = uVar98 * 9;
  uVar94 = (ulong)(uint)((int)lVar10 * 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar361._16_16_ = auVar19;
  auVar361._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar98 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar98 + 10)));
  auVar16 = vcvtdq2ps_avx(auVar361);
  auVar368._16_16_ = auVar19;
  auVar368._0_16_ = auVar136;
  auVar17 = vcvtdq2ps_avx(auVar368);
  uVar94 = (ulong)(uint)((int)lVar96 << 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar372._16_16_ = auVar19;
  auVar372._0_16_ = auVar136;
  auVar18 = vcvtdq2ps_avx(auVar372);
  auVar136 = vshufps_avx(auVar253,auVar253,0);
  auVar19 = vshufps_avx(auVar253,auVar253,0x55);
  auVar146 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar250 = auVar146._0_4_;
  fVar269 = auVar146._4_4_;
  fVar272 = auVar146._8_4_;
  fVar275 = auVar146._12_4_;
  fVar278 = auVar19._0_4_;
  fVar281 = auVar19._4_4_;
  fVar283 = auVar19._8_4_;
  fVar200 = auVar19._12_4_;
  fVar224 = auVar136._0_4_;
  fVar218 = auVar136._4_4_;
  fVar241 = auVar136._8_4_;
  fVar219 = auVar136._12_4_;
  auVar390._0_4_ = fVar224 * auVar120._0_4_ + fVar278 * auVar118._0_4_ + fVar250 * auVar13._0_4_;
  auVar390._4_4_ = fVar218 * auVar120._4_4_ + fVar281 * auVar118._4_4_ + fVar269 * auVar13._4_4_;
  auVar390._8_4_ = fVar241 * auVar120._8_4_ + fVar283 * auVar118._8_4_ + fVar272 * auVar13._8_4_;
  auVar390._12_4_ = fVar219 * auVar120._12_4_ + fVar200 * auVar118._12_4_ + fVar275 * auVar13._12_4_
  ;
  auVar390._16_4_ = fVar224 * auVar120._16_4_ + fVar278 * auVar118._16_4_ + fVar250 * auVar13._16_4_
  ;
  auVar390._20_4_ = fVar218 * auVar120._20_4_ + fVar281 * auVar118._20_4_ + fVar269 * auVar13._20_4_
  ;
  auVar390._24_4_ = fVar241 * auVar120._24_4_ + fVar283 * auVar118._24_4_ + fVar272 * auVar13._24_4_
  ;
  auVar390._28_4_ = fVar200 + in_register_000015dc + in_register_0000151c;
  auVar381._0_4_ = fVar224 * auVar14._0_4_ + fVar278 * auVar15._0_4_ + fVar250 * auVar363._0_4_;
  auVar381._4_4_ = fVar218 * auVar14._4_4_ + fVar281 * auVar15._4_4_ + fVar269 * auVar363._4_4_;
  auVar381._8_4_ = fVar241 * auVar14._8_4_ + fVar283 * auVar15._8_4_ + fVar272 * auVar363._8_4_;
  auVar381._12_4_ = fVar219 * auVar14._12_4_ + fVar200 * auVar15._12_4_ + fVar275 * auVar363._12_4_;
  auVar381._16_4_ = fVar224 * auVar14._16_4_ + fVar278 * auVar15._16_4_ + fVar250 * auVar363._16_4_;
  auVar381._20_4_ = fVar218 * auVar14._20_4_ + fVar281 * auVar15._20_4_ + fVar269 * auVar363._20_4_;
  auVar381._24_4_ = fVar241 * auVar14._24_4_ + fVar283 * auVar15._24_4_ + fVar272 * auVar363._24_4_;
  auVar381._28_4_ = fVar200 + in_register_000015dc + in_register_0000159c;
  auVar259._0_4_ = fVar224 * auVar16._0_4_ + fVar278 * auVar17._0_4_ + auVar18._0_4_ * fVar250;
  auVar259._4_4_ = fVar218 * auVar16._4_4_ + fVar281 * auVar17._4_4_ + auVar18._4_4_ * fVar269;
  auVar259._8_4_ = fVar241 * auVar16._8_4_ + fVar283 * auVar17._8_4_ + auVar18._8_4_ * fVar272;
  auVar259._12_4_ = fVar219 * auVar16._12_4_ + fVar200 * auVar17._12_4_ + auVar18._12_4_ * fVar275;
  auVar259._16_4_ = fVar224 * auVar16._16_4_ + fVar278 * auVar17._16_4_ + auVar18._16_4_ * fVar250;
  auVar259._20_4_ = fVar218 * auVar16._20_4_ + fVar281 * auVar17._20_4_ + auVar18._20_4_ * fVar269;
  auVar259._24_4_ = fVar241 * auVar16._24_4_ + fVar283 * auVar17._24_4_ + auVar18._24_4_ * fVar272;
  auVar259._28_4_ = fVar219 + fVar200 + fVar275;
  auVar136 = vshufps_avx(auVar134,auVar134,0);
  auVar19 = vshufps_avx(auVar134,auVar134,0x55);
  auVar146 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar269 = auVar146._0_4_;
  fVar272 = auVar146._4_4_;
  fVar275 = auVar146._8_4_;
  fVar278 = auVar146._12_4_;
  fVar218 = auVar19._0_4_;
  fVar241 = auVar19._4_4_;
  fVar219 = auVar19._8_4_;
  fVar242 = auVar19._12_4_;
  fVar281 = auVar136._0_4_;
  fVar283 = auVar136._4_4_;
  fVar200 = auVar136._8_4_;
  fVar224 = auVar136._12_4_;
  fVar250 = auVar120._28_4_;
  auVar294._0_4_ = fVar281 * auVar120._0_4_ + fVar218 * auVar118._0_4_ + fVar269 * auVar13._0_4_;
  auVar294._4_4_ = fVar283 * auVar120._4_4_ + fVar241 * auVar118._4_4_ + fVar272 * auVar13._4_4_;
  auVar294._8_4_ = fVar200 * auVar120._8_4_ + fVar219 * auVar118._8_4_ + fVar275 * auVar13._8_4_;
  auVar294._12_4_ = fVar224 * auVar120._12_4_ + fVar242 * auVar118._12_4_ + fVar278 * auVar13._12_4_
  ;
  auVar294._16_4_ = fVar281 * auVar120._16_4_ + fVar218 * auVar118._16_4_ + fVar269 * auVar13._16_4_
  ;
  auVar294._20_4_ = fVar283 * auVar120._20_4_ + fVar241 * auVar118._20_4_ + fVar272 * auVar13._20_4_
  ;
  auVar294._24_4_ = fVar200 * auVar120._24_4_ + fVar219 * auVar118._24_4_ + fVar275 * auVar13._24_4_
  ;
  auVar294._28_4_ = fVar250 + auVar118._28_4_ + auVar13._28_4_;
  auVar187._0_4_ = fVar281 * auVar14._0_4_ + fVar218 * auVar15._0_4_ + fVar269 * auVar363._0_4_;
  auVar187._4_4_ = fVar283 * auVar14._4_4_ + fVar241 * auVar15._4_4_ + fVar272 * auVar363._4_4_;
  auVar187._8_4_ = fVar200 * auVar14._8_4_ + fVar219 * auVar15._8_4_ + fVar275 * auVar363._8_4_;
  auVar187._12_4_ = fVar224 * auVar14._12_4_ + fVar242 * auVar15._12_4_ + fVar278 * auVar363._12_4_;
  auVar187._16_4_ = fVar281 * auVar14._16_4_ + fVar218 * auVar15._16_4_ + fVar269 * auVar363._16_4_;
  auVar187._20_4_ = fVar283 * auVar14._20_4_ + fVar241 * auVar15._20_4_ + fVar272 * auVar363._20_4_;
  auVar187._24_4_ = fVar200 * auVar14._24_4_ + fVar219 * auVar15._24_4_ + fVar275 * auVar363._24_4_;
  auVar187._28_4_ = fVar250 + auVar13._28_4_ + auVar363._28_4_;
  auVar111._0_4_ = fVar281 * auVar16._0_4_ + fVar218 * auVar17._0_4_ + auVar18._0_4_ * fVar269;
  auVar111._4_4_ = fVar283 * auVar16._4_4_ + fVar241 * auVar17._4_4_ + auVar18._4_4_ * fVar272;
  auVar111._8_4_ = fVar200 * auVar16._8_4_ + fVar219 * auVar17._8_4_ + auVar18._8_4_ * fVar275;
  auVar111._12_4_ = fVar224 * auVar16._12_4_ + fVar242 * auVar17._12_4_ + auVar18._12_4_ * fVar278;
  auVar111._16_4_ = fVar281 * auVar16._16_4_ + fVar218 * auVar17._16_4_ + auVar18._16_4_ * fVar269;
  auVar111._20_4_ = fVar283 * auVar16._20_4_ + fVar241 * auVar17._20_4_ + auVar18._20_4_ * fVar272;
  auVar111._24_4_ = fVar200 * auVar16._24_4_ + fVar219 * auVar17._24_4_ + auVar18._24_4_ * fVar275;
  auVar111._28_4_ = fVar250 + auVar15._28_4_ + fVar278;
  auVar236._8_4_ = 0x7fffffff;
  auVar236._0_8_ = 0x7fffffff7fffffff;
  auVar236._12_4_ = 0x7fffffff;
  auVar236._16_4_ = 0x7fffffff;
  auVar236._20_4_ = 0x7fffffff;
  auVar236._24_4_ = 0x7fffffff;
  auVar236._28_4_ = 0x7fffffff;
  auVar332._8_4_ = 0x219392ef;
  auVar332._0_8_ = 0x219392ef219392ef;
  auVar332._12_4_ = 0x219392ef;
  auVar332._16_4_ = 0x219392ef;
  auVar332._20_4_ = 0x219392ef;
  auVar332._24_4_ = 0x219392ef;
  auVar332._28_4_ = 0x219392ef;
  auVar120 = vandps_avx(auVar390,auVar236);
  auVar120 = vcmpps_avx(auVar120,auVar332,1);
  auVar118 = vblendvps_avx(auVar390,auVar332,auVar120);
  auVar120 = vandps_avx(auVar381,auVar236);
  auVar120 = vcmpps_avx(auVar120,auVar332,1);
  auVar13 = vblendvps_avx(auVar381,auVar332,auVar120);
  auVar120 = vandps_avx(auVar259,auVar236);
  auVar120 = vcmpps_avx(auVar120,auVar332,1);
  auVar120 = vblendvps_avx(auVar259,auVar332,auVar120);
  auVar14 = vrcpps_avx(auVar118);
  fVar250 = auVar14._0_4_;
  fVar269 = auVar14._4_4_;
  auVar15._4_4_ = auVar118._4_4_ * fVar269;
  auVar15._0_4_ = auVar118._0_4_ * fVar250;
  fVar272 = auVar14._8_4_;
  auVar15._8_4_ = auVar118._8_4_ * fVar272;
  fVar275 = auVar14._12_4_;
  auVar15._12_4_ = auVar118._12_4_ * fVar275;
  fVar278 = auVar14._16_4_;
  auVar15._16_4_ = auVar118._16_4_ * fVar278;
  fVar281 = auVar14._20_4_;
  auVar15._20_4_ = auVar118._20_4_ * fVar281;
  fVar283 = auVar14._24_4_;
  auVar15._24_4_ = auVar118._24_4_ * fVar283;
  auVar15._28_4_ = auVar118._28_4_;
  auVar333._8_4_ = 0x3f800000;
  auVar333._0_8_ = &DAT_3f8000003f800000;
  auVar333._12_4_ = 0x3f800000;
  auVar333._16_4_ = 0x3f800000;
  auVar333._20_4_ = 0x3f800000;
  auVar333._24_4_ = 0x3f800000;
  auVar333._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar333,auVar15);
  fVar250 = fVar250 + fVar250 * auVar15._0_4_;
  fVar269 = fVar269 + fVar269 * auVar15._4_4_;
  fVar272 = fVar272 + fVar272 * auVar15._8_4_;
  fVar275 = fVar275 + fVar275 * auVar15._12_4_;
  fVar278 = fVar278 + fVar278 * auVar15._16_4_;
  fVar281 = fVar281 + fVar281 * auVar15._20_4_;
  fVar283 = fVar283 + fVar283 * auVar15._24_4_;
  auVar118 = vrcpps_avx(auVar13);
  fVar200 = auVar118._0_4_;
  fVar218 = auVar118._4_4_;
  auVar363._4_4_ = fVar218 * auVar13._4_4_;
  auVar363._0_4_ = fVar200 * auVar13._0_4_;
  fVar219 = auVar118._8_4_;
  auVar363._8_4_ = fVar219 * auVar13._8_4_;
  fVar220 = auVar118._12_4_;
  auVar363._12_4_ = fVar220 * auVar13._12_4_;
  fVar221 = auVar118._16_4_;
  auVar363._16_4_ = fVar221 * auVar13._16_4_;
  fVar222 = auVar118._20_4_;
  auVar363._20_4_ = fVar222 * auVar13._20_4_;
  fVar223 = auVar118._24_4_;
  auVar363._24_4_ = fVar223 * auVar13._24_4_;
  auVar363._28_4_ = auVar13._28_4_;
  auVar118 = vsubps_avx(auVar333,auVar363);
  fVar200 = fVar200 + fVar200 * auVar118._0_4_;
  fVar218 = fVar218 + fVar218 * auVar118._4_4_;
  fVar219 = fVar219 + fVar219 * auVar118._8_4_;
  fVar220 = fVar220 + fVar220 * auVar118._12_4_;
  fVar221 = fVar221 + fVar221 * auVar118._16_4_;
  fVar222 = fVar222 + fVar222 * auVar118._20_4_;
  fVar223 = fVar223 + fVar223 * auVar118._24_4_;
  auVar118 = vrcpps_avx(auVar120);
  fVar224 = auVar118._0_4_;
  fVar241 = auVar118._4_4_;
  auVar13._4_4_ = fVar241 * auVar120._4_4_;
  auVar13._0_4_ = fVar224 * auVar120._0_4_;
  fVar242 = auVar118._8_4_;
  auVar13._8_4_ = fVar242 * auVar120._8_4_;
  fVar243 = auVar118._12_4_;
  auVar13._12_4_ = fVar243 * auVar120._12_4_;
  fVar244 = auVar118._16_4_;
  auVar13._16_4_ = fVar244 * auVar120._16_4_;
  fVar246 = auVar118._20_4_;
  auVar13._20_4_ = fVar246 * auVar120._20_4_;
  fVar248 = auVar118._24_4_;
  auVar13._24_4_ = fVar248 * auVar120._24_4_;
  auVar13._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar333,auVar13);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar136 = vpmovsxwd_avx(auVar136);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar98 * 7 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar19);
  fVar224 = fVar224 + fVar224 * auVar120._0_4_;
  fVar241 = fVar241 + fVar241 * auVar120._4_4_;
  fVar242 = fVar242 + fVar242 * auVar120._8_4_;
  fVar243 = fVar243 + fVar243 * auVar120._12_4_;
  fVar244 = fVar244 + fVar244 * auVar120._16_4_;
  fVar246 = fVar246 + fVar246 * auVar120._20_4_;
  fVar248 = fVar248 + fVar248 * auVar120._24_4_;
  auVar149._16_16_ = auVar19;
  auVar149._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar149);
  auVar120 = vsubps_avx(auVar120,auVar294);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + lVar10 + 6);
  auVar136 = vpmovsxwd_avx(auVar146);
  auVar329._8_8_ = 0;
  auVar329._0_8_ = *(ulong *)(prim + lVar10 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar329);
  auVar135._0_4_ = fVar250 * auVar120._0_4_;
  auVar135._4_4_ = fVar269 * auVar120._4_4_;
  auVar135._8_4_ = fVar272 * auVar120._8_4_;
  auVar135._12_4_ = fVar275 * auVar120._12_4_;
  auVar16._16_4_ = fVar278 * auVar120._16_4_;
  auVar16._0_16_ = auVar135;
  auVar16._20_4_ = fVar281 * auVar120._20_4_;
  auVar16._24_4_ = fVar283 * auVar120._24_4_;
  auVar16._28_4_ = auVar120._28_4_;
  auVar334._16_16_ = auVar19;
  auVar334._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar334);
  auVar120 = vsubps_avx(auVar120,auVar294);
  lVar96 = (ulong)(byte)PVar8 * 0x10;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar136 = vpmovsxwd_avx(auVar107);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar182);
  lVar96 = lVar96 + uVar98 * -2;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar146 = vpmovsxwd_avx(auVar207);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar329 = vpmovsxwd_avx(auVar4);
  auVar254._0_4_ = fVar250 * auVar120._0_4_;
  auVar254._4_4_ = fVar269 * auVar120._4_4_;
  auVar254._8_4_ = fVar272 * auVar120._8_4_;
  auVar254._12_4_ = fVar275 * auVar120._12_4_;
  auVar17._16_4_ = fVar278 * auVar120._16_4_;
  auVar17._0_16_ = auVar254;
  auVar17._20_4_ = fVar281 * auVar120._20_4_;
  auVar17._24_4_ = fVar283 * auVar120._24_4_;
  auVar17._28_4_ = auVar14._28_4_ + auVar15._28_4_;
  auVar295._16_16_ = auVar329;
  auVar295._0_16_ = auVar146;
  auVar120 = vcvtdq2ps_avx(auVar295);
  auVar120 = vsubps_avx(auVar120,auVar187);
  auVar290._0_4_ = fVar200 * auVar120._0_4_;
  auVar290._4_4_ = fVar218 * auVar120._4_4_;
  auVar290._8_4_ = fVar219 * auVar120._8_4_;
  auVar290._12_4_ = fVar220 * auVar120._12_4_;
  auVar14._16_4_ = fVar221 * auVar120._16_4_;
  auVar14._0_16_ = auVar290;
  auVar14._20_4_ = fVar222 * auVar120._20_4_;
  auVar14._24_4_ = fVar223 * auVar120._24_4_;
  auVar14._28_4_ = auVar120._28_4_;
  auVar335._16_16_ = auVar19;
  auVar335._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar335);
  auVar120 = vsubps_avx(auVar120,auVar187);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar94 + uVar98 + 6);
  auVar136 = vpmovsxwd_avx(auVar5);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar94 + uVar98 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar145);
  auVar178._0_4_ = fVar200 * auVar120._0_4_;
  auVar178._4_4_ = fVar218 * auVar120._4_4_;
  auVar178._8_4_ = fVar219 * auVar120._8_4_;
  auVar178._12_4_ = fVar220 * auVar120._12_4_;
  auVar18._16_4_ = fVar221 * auVar120._16_4_;
  auVar18._0_16_ = auVar178;
  auVar18._20_4_ = fVar222 * auVar120._20_4_;
  auVar18._24_4_ = fVar223 * auVar120._24_4_;
  auVar18._28_4_ = auVar120._28_4_;
  auVar212._16_16_ = auVar19;
  auVar212._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar212);
  auVar120 = vsubps_avx(auVar120,auVar111);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar98 * 0x17 + 6);
  auVar136 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar98 * 0x17 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar7);
  auVar201._0_4_ = fVar224 * auVar120._0_4_;
  auVar201._4_4_ = fVar241 * auVar120._4_4_;
  auVar201._8_4_ = fVar242 * auVar120._8_4_;
  auVar201._12_4_ = fVar243 * auVar120._12_4_;
  auVar20._16_4_ = fVar244 * auVar120._16_4_;
  auVar20._0_16_ = auVar201;
  auVar20._20_4_ = fVar246 * auVar120._20_4_;
  auVar20._24_4_ = fVar248 * auVar120._24_4_;
  auVar20._28_4_ = auVar120._28_4_;
  auVar336._16_16_ = auVar19;
  auVar336._0_16_ = auVar136;
  auVar120 = vcvtdq2ps_avx(auVar336);
  auVar120 = vsubps_avx(auVar120,auVar111);
  auVar99._0_4_ = fVar224 * auVar120._0_4_;
  auVar99._4_4_ = fVar241 * auVar120._4_4_;
  auVar99._8_4_ = fVar242 * auVar120._8_4_;
  auVar99._12_4_ = fVar243 * auVar120._12_4_;
  auVar364._16_4_ = fVar244 * auVar120._16_4_;
  auVar364._0_16_ = auVar99;
  auVar364._20_4_ = fVar246 * auVar120._20_4_;
  auVar364._24_4_ = fVar248 * auVar120._24_4_;
  auVar364._28_4_ = auVar120._28_4_;
  auVar136 = vpminsd_avx(auVar16._16_16_,auVar17._16_16_);
  auVar19 = vpminsd_avx(auVar135,auVar254);
  auVar362._16_16_ = auVar136;
  auVar362._0_16_ = auVar19;
  auVar136 = vpminsd_avx(auVar14._16_16_,auVar18._16_16_);
  auVar19 = vpminsd_avx(auVar290,auVar178);
  auVar382._16_16_ = auVar136;
  auVar382._0_16_ = auVar19;
  auVar120 = vmaxps_avx(auVar362,auVar382);
  auVar136 = vpminsd_avx(auVar20._16_16_,auVar364._16_16_);
  auVar19 = vpminsd_avx(auVar201,auVar99);
  auVar401._16_16_ = auVar136;
  auVar401._0_16_ = auVar19;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar413._4_4_ = uVar2;
  auVar413._0_4_ = uVar2;
  auVar413._8_4_ = uVar2;
  auVar413._12_4_ = uVar2;
  auVar413._16_4_ = uVar2;
  auVar413._20_4_ = uVar2;
  auVar413._24_4_ = uVar2;
  auVar413._28_4_ = uVar2;
  auVar118 = vmaxps_avx(auVar401,auVar413);
  auVar120 = vmaxps_avx(auVar120,auVar118);
  local_3a0._4_4_ = auVar120._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar120._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar120._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar120._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar120._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar120._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar120._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar120._28_4_;
  auVar136 = vpmaxsd_avx(auVar16._16_16_,auVar17._16_16_);
  auVar19 = vpmaxsd_avx(auVar135,auVar254);
  auVar150._16_16_ = auVar136;
  auVar150._0_16_ = auVar19;
  auVar136 = vpmaxsd_avx(auVar14._16_16_,auVar18._16_16_);
  auVar19 = vpmaxsd_avx(auVar290,auVar178);
  auVar188._16_16_ = auVar136;
  auVar188._0_16_ = auVar19;
  auVar120 = vminps_avx(auVar150,auVar188);
  auVar136 = vpmaxsd_avx(auVar20._16_16_,auVar364._16_16_);
  auVar19 = vpmaxsd_avx(auVar201,auVar99);
  auVar112._16_16_ = auVar136;
  auVar112._0_16_ = auVar19;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar189._4_4_ = uVar2;
  auVar189._0_4_ = uVar2;
  auVar189._8_4_ = uVar2;
  auVar189._12_4_ = uVar2;
  auVar189._16_4_ = uVar2;
  auVar189._20_4_ = uVar2;
  auVar189._24_4_ = uVar2;
  auVar189._28_4_ = uVar2;
  auVar118 = vminps_avx(auVar112,auVar189);
  auVar120 = vminps_avx(auVar120,auVar118);
  auVar118._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar118._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar118._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar118._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar118._16_4_ = auVar120._16_4_ * 1.0000004;
  auVar118._20_4_ = auVar120._20_4_ * 1.0000004;
  auVar118._24_4_ = auVar120._24_4_ * 1.0000004;
  auVar118._28_4_ = auVar120._28_4_;
  auVar120 = vcmpps_avx(local_3a0,auVar118,2);
  auVar136 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar151._16_16_ = auVar136;
  auVar151._0_16_ = auVar136;
  auVar118 = vcvtdq2ps_avx(auVar151);
  auVar118 = vcmpps_avx(_DAT_02020f40,auVar118,1);
  auVar120 = vandps_avx(auVar120,auVar118);
  uVar92 = vmovmskps_avx(auVar120);
  local_c69 = uVar92 != 0;
  if (uVar92 == 0) {
    return local_c69;
  }
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  uVar92 = uVar92 & 0xff;
  local_440 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  uVar93 = 1 << ((byte)k & 0x1f);
  local_a60 = (undefined1 (*) [32])&local_500;
  local_a68 = (undefined8 *)(mm_lookupmask_ps + ((uVar93 & 0xf) << 4));
  local_a70 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar93 >> 4) * 0x10);
  local_8d0 = prim;
LAB_0112598a:
  local_8c8 = (ulong)uVar92;
  lVar96 = 0;
  if (local_8c8 != 0) {
    for (; (uVar92 >> lVar96 & 1) == 0; lVar96 = lVar96 + 1) {
    }
  }
  local_a58 = (ulong)*(uint *)(local_8d0 + 2);
  pGVar9 = (context->scene->geometries).items[local_a58].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_8d0 + lVar96 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar136 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar98);
  auVar19 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * (uVar98 + 1));
  auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar329 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar250 = *(float *)(ray + k * 4 + 0x80);
  auVar380._4_4_ = fVar250;
  auVar380._0_4_ = fVar250;
  auVar380._8_4_ = fVar250;
  auVar380._12_4_ = fVar250;
  fStack_af0 = fVar250;
  _local_b00 = auVar380;
  fStack_aec = fVar250;
  fStack_ae8 = fVar250;
  fStack_ae4 = fVar250;
  fVar269 = *(float *)(ray + k * 4 + 0xa0);
  auVar389._4_4_ = fVar269;
  auVar389._0_4_ = fVar269;
  auVar389._8_4_ = fVar269;
  auVar389._12_4_ = fVar269;
  fStack_9f0 = fVar269;
  _local_a00 = auVar389;
  fStack_9ec = fVar269;
  fStack_9e8 = fVar269;
  fStack_9e4 = fVar269;
  auVar146 = vunpcklps_avx(auVar380,auVar389);
  fVar272 = *(float *)(ray + k * 4 + 0xc0);
  auVar400._4_4_ = fVar272;
  auVar400._0_4_ = fVar272;
  auVar400._8_4_ = fVar272;
  auVar400._12_4_ = fVar272;
  fStack_950 = fVar272;
  _local_960 = auVar400;
  fStack_94c = fVar272;
  fStack_948 = fVar272;
  fStack_944 = fVar272;
  _local_990 = vinsertps_avx(auVar146,auVar400,0x28);
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + uVar98 * (long)pGVar9[2].pointQueryFunc);
  auVar225._0_4_ = auVar136._0_4_ + *pfVar1 * 0.33333334;
  auVar225._4_4_ = auVar136._4_4_ + pfVar1[1] * 0.33333334;
  auVar225._8_4_ = auVar136._8_4_ + pfVar1[2] * 0.33333334;
  auVar225._12_4_ = auVar136._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * (uVar98 + 1));
  auVar100._0_4_ = *pfVar1 * 0.33333334;
  auVar100._4_4_ = pfVar1[1] * 0.33333334;
  auVar100._8_4_ = pfVar1[2] * 0.33333334;
  auVar100._12_4_ = pfVar1[3] * 0.33333334;
  auVar182 = vsubps_avx(auVar19,auVar100);
  auVar101._0_4_ = (auVar19._0_4_ + auVar136._0_4_ + auVar225._0_4_ + auVar182._0_4_) * 0.25;
  auVar101._4_4_ = (auVar19._4_4_ + auVar136._4_4_ + auVar225._4_4_ + auVar182._4_4_) * 0.25;
  auVar101._8_4_ = (auVar19._8_4_ + auVar136._8_4_ + auVar225._8_4_ + auVar182._8_4_) * 0.25;
  auVar101._12_4_ = (auVar19._12_4_ + auVar136._12_4_ + auVar225._12_4_ + auVar182._12_4_) * 0.25;
  auVar146 = vsubps_avx(auVar101,auVar329);
  auVar146 = vdpps_avx(auVar146,_local_990,0x7f);
  local_9a0 = vdpps_avx(_local_990,_local_990,0x7f);
  auVar107 = vrcpss_avx(local_9a0,local_9a0);
  fVar275 = auVar146._0_4_ * auVar107._0_4_ * (2.0 - local_9a0._0_4_ * auVar107._0_4_);
  auVar146 = vshufps_avx(ZEXT416((uint)fVar275),ZEXT416((uint)fVar275),0);
  local_9e0 = auVar146._0_4_;
  fStack_9dc = auVar146._4_4_;
  fStack_9d8 = auVar146._8_4_;
  fStack_9d4 = auVar146._12_4_;
  auVar202._0_4_ = auVar329._0_4_ + local_990._0_4_ * local_9e0;
  auVar202._4_4_ = auVar329._4_4_ + local_990._4_4_ * fStack_9dc;
  auVar202._8_4_ = auVar329._8_4_ + local_990._8_4_ * fStack_9d8;
  auVar202._12_4_ = auVar329._12_4_ + local_990._12_4_ * fStack_9d4;
  auVar146 = vblendps_avx(auVar202,_DAT_01feba10,8);
  _local_b30 = vsubps_avx(auVar136,auVar146);
  auVar302 = ZEXT1664(_local_b30);
  _local_b40 = vsubps_avx(auVar182,auVar146);
  auVar268 = ZEXT1664(_local_b40);
  _local_b50 = vsubps_avx(auVar225,auVar146);
  _local_b60 = vsubps_avx(auVar19,auVar146);
  auVar217 = ZEXT1664(_local_b60);
  auVar136 = vshufps_avx(_local_b30,_local_b30,0);
  local_2a0._16_16_ = auVar136;
  local_2a0._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001250 = auVar136;
  _local_1a0 = auVar136;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001250 = auVar136;
  _local_1c0 = auVar136;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0xff);
  local_2c0._16_16_ = auVar136;
  local_2c0._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0);
  local_2e0._16_16_ = auVar136;
  local_2e0._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0x55);
  local_300._16_16_ = auVar136;
  local_300._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0xaa);
  local_800._16_16_ = auVar136;
  local_800._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0xff);
  local_aa0._16_16_ = auVar136;
  local_aa0._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0);
  local_320._16_16_ = auVar136;
  local_320._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0x55);
  local_340._16_16_ = auVar136;
  local_340._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar136;
  _local_1e0 = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar136;
  _local_200 = auVar136;
  auVar136 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar136;
  _local_220 = auVar136;
  auVar136 = vshufps_avx(_local_b60,_local_b60,0x55);
  local_360._16_16_ = auVar136;
  local_360._0_16_ = auVar136;
  auVar136 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar136;
  _local_240 = auVar136;
  auVar136 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar136;
  _local_260 = auVar136;
  auVar136 = ZEXT416((uint)(fVar250 * fVar250 + fVar269 * fVar269 + fVar272 * fVar272));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  local_280._16_16_ = auVar136;
  local_280._0_16_ = auVar136;
  fVar250 = *(float *)(ray + k * 4 + 0x60);
  local_8f0 = ZEXT416((uint)fVar275);
  auVar136 = vshufps_avx(ZEXT416((uint)(fVar250 - fVar275)),ZEXT416((uint)(fVar250 - fVar275)),0);
  local_380._16_16_ = auVar136;
  local_380._0_16_ = auVar136;
  auVar136 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + 2)),0);
  local_480._16_16_ = auVar136;
  local_480._0_16_ = auVar136;
  auVar136 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar96 * 4 + 6)),0);
  local_4a0._16_16_ = auVar136;
  local_4a0._0_16_ = auVar136;
  uVar94 = 0;
  uVar97 = 0;
  uVar98 = 1;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_280,auVar114);
  auVar136 = vsqrtss_avx(local_9a0,local_9a0);
  auVar19 = vsqrtss_avx(local_9a0,local_9a0);
  auVar376 = ZEXT3264(local_aa0);
  local_8e0 = ZEXT816(0x3f80000000000000);
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = &DAT_3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar237._16_4_ = 0x3f800000;
  auVar237._20_4_ = 0x3f800000;
  auVar237._24_4_ = 0x3f800000;
  auVar237._28_4_ = 0x3f800000;
  fStack_9d0 = local_9e0;
  fStack_9cc = fStack_9dc;
  fStack_9c8 = fStack_9d8;
  fStack_9c4 = fStack_9d4;
  do {
    auVar146 = vmovshdup_avx(local_8e0);
    fVar224 = auVar146._0_4_ - local_8e0._0_4_;
    auVar146 = vshufps_avx(local_8e0,local_8e0,0);
    local_760._16_16_ = auVar146;
    local_760._0_16_ = auVar146;
    auVar329 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
    local_780._16_16_ = auVar329;
    local_780._0_16_ = auVar329;
    fVar277 = auVar329._0_4_;
    fVar280 = auVar329._4_4_;
    fVar285 = auVar329._8_4_;
    fVar173 = auVar329._12_4_;
    fVar252 = auVar146._0_4_;
    auVar152._0_4_ = fVar252 + fVar277 * 0.0;
    fVar271 = auVar146._4_4_;
    auVar152._4_4_ = fVar271 + fVar280 * 0.14285715;
    fVar274 = auVar146._8_4_;
    auVar152._8_4_ = fVar274 + fVar285 * 0.2857143;
    fVar129 = auVar146._12_4_;
    auVar152._12_4_ = fVar129 + fVar173 * 0.42857146;
    auVar152._16_4_ = fVar252 + fVar277 * 0.5714286;
    auVar152._20_4_ = fVar271 + fVar280 * 0.71428573;
    auVar152._24_4_ = fVar274 + fVar285 * 0.8571429;
    auVar152._28_4_ = fVar129 + fVar173;
    auVar120 = vsubps_avx(auVar237,auVar152);
    fVar269 = auVar120._0_4_;
    fVar272 = auVar120._4_4_;
    fVar275 = auVar120._8_4_;
    fVar278 = auVar120._12_4_;
    fVar281 = auVar120._16_4_;
    fVar283 = auVar120._20_4_;
    fVar200 = auVar120._24_4_;
    fVar218 = local_2c0._28_4_;
    fVar286 = local_320._0_4_ * auVar152._0_4_ + local_2e0._0_4_ * fVar269;
    fVar303 = local_320._4_4_ * auVar152._4_4_ + local_2e0._4_4_ * fVar272;
    fVar307 = local_320._8_4_ * auVar152._8_4_ + local_2e0._8_4_ * fVar275;
    fVar311 = local_320._12_4_ * auVar152._12_4_ + local_2e0._12_4_ * fVar278;
    fVar315 = local_320._16_4_ * auVar152._16_4_ + local_2e0._16_4_ * fVar281;
    fVar319 = local_320._20_4_ * auVar152._20_4_ + local_2e0._20_4_ * fVar283;
    fVar323 = local_320._24_4_ * auVar152._24_4_ + local_2e0._24_4_ * fVar200;
    fVar241 = local_340._0_4_ * auVar152._0_4_ + local_300._0_4_ * fVar269;
    fVar219 = local_340._4_4_ * auVar152._4_4_ + local_300._4_4_ * fVar272;
    fVar242 = local_340._8_4_ * auVar152._8_4_ + local_300._8_4_ * fVar275;
    fVar220 = local_340._12_4_ * auVar152._12_4_ + local_300._12_4_ * fVar278;
    fVar243 = local_340._16_4_ * auVar152._16_4_ + local_300._16_4_ * fVar281;
    fVar221 = local_340._20_4_ * auVar152._20_4_ + local_300._20_4_ * fVar283;
    fVar244 = local_340._24_4_ * auVar152._24_4_ + local_300._24_4_ * fVar200;
    fVar222 = (float)local_1e0._0_4_ * auVar152._0_4_ + local_800._0_4_ * fVar269;
    fVar246 = (float)local_1e0._4_4_ * auVar152._4_4_ + local_800._4_4_ * fVar272;
    fVar223 = fStack_1d8 * auVar152._8_4_ + local_800._8_4_ * fVar275;
    fVar248 = fStack_1d4 * auVar152._12_4_ + local_800._12_4_ * fVar278;
    fVar245 = fStack_1d0 * auVar152._16_4_ + local_800._16_4_ * fVar281;
    fVar247 = fStack_1cc * auVar152._20_4_ + local_800._20_4_ * fVar283;
    fVar249 = fStack_1c8 * auVar152._24_4_ + local_800._24_4_ * fVar200;
    fVar251 = (float)local_200._0_4_ * auVar152._0_4_ + auVar376._0_4_ * fVar269;
    fVar270 = (float)local_200._4_4_ * auVar152._4_4_ + auVar376._4_4_ * fVar272;
    fVar273 = fStack_1f8 * auVar152._8_4_ + auVar376._8_4_ * fVar275;
    fVar276 = fStack_1f4 * auVar152._12_4_ + auVar376._12_4_ * fVar278;
    fVar279 = fStack_1f0 * auVar152._16_4_ + auVar376._16_4_ * fVar281;
    fVar282 = fStack_1ec * auVar152._20_4_ + auVar376._20_4_ * fVar283;
    fVar284 = fStack_1e8 * auVar152._24_4_ + auVar376._24_4_ * fVar200;
    fVar412 = fVar218 + local_320._28_4_;
    fVar398 = local_360._28_4_ + fVar218;
    auVar369._0_4_ =
         fVar269 * (local_2e0._0_4_ * auVar152._0_4_ + local_2a0._0_4_ * fVar269) +
         auVar152._0_4_ * fVar286;
    auVar369._4_4_ =
         fVar272 * (local_2e0._4_4_ * auVar152._4_4_ + local_2a0._4_4_ * fVar272) +
         auVar152._4_4_ * fVar303;
    auVar369._8_4_ =
         fVar275 * (local_2e0._8_4_ * auVar152._8_4_ + local_2a0._8_4_ * fVar275) +
         auVar152._8_4_ * fVar307;
    auVar369._12_4_ =
         fVar278 * (local_2e0._12_4_ * auVar152._12_4_ + local_2a0._12_4_ * fVar278) +
         auVar152._12_4_ * fVar311;
    auVar369._16_4_ =
         fVar281 * (local_2e0._16_4_ * auVar152._16_4_ + local_2a0._16_4_ * fVar281) +
         auVar152._16_4_ * fVar315;
    auVar369._20_4_ =
         fVar283 * (local_2e0._20_4_ * auVar152._20_4_ + local_2a0._20_4_ * fVar283) +
         auVar152._20_4_ * fVar319;
    auVar369._24_4_ =
         fVar200 * (local_2e0._24_4_ * auVar152._24_4_ + local_2a0._24_4_ * fVar200) +
         auVar152._24_4_ * fVar323;
    auVar369._28_4_ = local_800._28_4_ + fVar218;
    auVar373._0_4_ =
         fVar269 * (local_300._0_4_ * auVar152._0_4_ + fVar269 * (float)local_1a0._0_4_) +
         auVar152._0_4_ * fVar241;
    auVar373._4_4_ =
         fVar272 * (local_300._4_4_ * auVar152._4_4_ + fVar272 * (float)local_1a0._4_4_) +
         auVar152._4_4_ * fVar219;
    auVar373._8_4_ =
         fVar275 * (local_300._8_4_ * auVar152._8_4_ + fVar275 * fStack_198) +
         auVar152._8_4_ * fVar242;
    auVar373._12_4_ =
         fVar278 * (local_300._12_4_ * auVar152._12_4_ + fVar278 * fStack_194) +
         auVar152._12_4_ * fVar220;
    auVar373._16_4_ =
         fVar281 * (local_300._16_4_ * auVar152._16_4_ + fVar281 * fStack_190) +
         auVar152._16_4_ * fVar243;
    auVar373._20_4_ =
         fVar283 * (local_300._20_4_ * auVar152._20_4_ + fVar283 * fStack_18c) +
         auVar152._20_4_ * fVar221;
    auVar373._24_4_ =
         fVar200 * (local_300._24_4_ * auVar152._24_4_ + fVar200 * fStack_188) +
         auVar152._24_4_ * fVar244;
    auVar373._28_4_ = auVar376._28_4_ + fVar218;
    auVar383._0_4_ =
         fVar269 * (local_800._0_4_ * auVar152._0_4_ + fVar269 * (float)local_1c0._0_4_) +
         auVar152._0_4_ * fVar222;
    auVar383._4_4_ =
         fVar272 * (local_800._4_4_ * auVar152._4_4_ + fVar272 * (float)local_1c0._4_4_) +
         auVar152._4_4_ * fVar246;
    auVar383._8_4_ =
         fVar275 * (local_800._8_4_ * auVar152._8_4_ + fVar275 * fStack_1b8) +
         auVar152._8_4_ * fVar223;
    auVar383._12_4_ =
         fVar278 * (local_800._12_4_ * auVar152._12_4_ + fVar278 * fStack_1b4) +
         auVar152._12_4_ * fVar248;
    auVar383._16_4_ =
         fVar281 * (local_800._16_4_ * auVar152._16_4_ + fVar281 * fStack_1b0) +
         auVar152._16_4_ * fVar245;
    auVar383._20_4_ =
         fVar283 * (local_800._20_4_ * auVar152._20_4_ + fVar283 * fStack_1ac) +
         auVar152._20_4_ * fVar247;
    auVar383._24_4_ =
         fVar200 * (local_800._24_4_ * auVar152._24_4_ + fVar200 * fStack_1a8) +
         auVar152._24_4_ * fVar249;
    auVar383._28_4_ = fStack_1c4 + fVar218;
    auVar337._0_4_ =
         auVar152._0_4_ * fVar251 +
         fVar269 * (auVar376._0_4_ * auVar152._0_4_ + local_2c0._0_4_ * fVar269);
    auVar337._4_4_ =
         auVar152._4_4_ * fVar270 +
         fVar272 * (auVar376._4_4_ * auVar152._4_4_ + local_2c0._4_4_ * fVar272);
    auVar337._8_4_ =
         auVar152._8_4_ * fVar273 +
         fVar275 * (auVar376._8_4_ * auVar152._8_4_ + local_2c0._8_4_ * fVar275);
    auVar337._12_4_ =
         auVar152._12_4_ * fVar276 +
         fVar278 * (auVar376._12_4_ * auVar152._12_4_ + local_2c0._12_4_ * fVar278);
    auVar337._16_4_ =
         auVar152._16_4_ * fVar279 +
         fVar281 * (auVar376._16_4_ * auVar152._16_4_ + local_2c0._16_4_ * fVar281);
    auVar337._20_4_ =
         auVar152._20_4_ * fVar282 +
         fVar283 * (auVar376._20_4_ * auVar152._20_4_ + local_2c0._20_4_ * fVar283);
    auVar337._24_4_ =
         auVar152._24_4_ * fVar284 +
         fVar200 * (auVar376._24_4_ * auVar152._24_4_ + local_2c0._24_4_ * fVar200);
    auVar337._28_4_ = fStack_1c4 + local_340._28_4_;
    auVar296._0_4_ =
         (auVar152._0_4_ * (float)local_220._0_4_ + local_320._0_4_ * fVar269) * auVar152._0_4_ +
         fVar269 * fVar286;
    auVar296._4_4_ =
         (auVar152._4_4_ * (float)local_220._4_4_ + local_320._4_4_ * fVar272) * auVar152._4_4_ +
         fVar272 * fVar303;
    auVar296._8_4_ =
         (auVar152._8_4_ * fStack_218 + local_320._8_4_ * fVar275) * auVar152._8_4_ +
         fVar275 * fVar307;
    auVar296._12_4_ =
         (auVar152._12_4_ * fStack_214 + local_320._12_4_ * fVar278) * auVar152._12_4_ +
         fVar278 * fVar311;
    auVar296._16_4_ =
         (auVar152._16_4_ * fStack_210 + local_320._16_4_ * fVar281) * auVar152._16_4_ +
         fVar281 * fVar315;
    auVar296._20_4_ =
         (auVar152._20_4_ * fStack_20c + local_320._20_4_ * fVar283) * auVar152._20_4_ +
         fVar283 * fVar319;
    auVar296._24_4_ =
         (auVar152._24_4_ * fStack_208 + local_320._24_4_ * fVar200) * auVar152._24_4_ +
         fVar200 * fVar323;
    auVar296._28_4_ = fStack_1c4 + auVar217._28_4_ + auVar302._28_4_;
    auVar213._0_4_ =
         (local_360._0_4_ * auVar152._0_4_ + local_340._0_4_ * fVar269) * auVar152._0_4_ +
         fVar269 * fVar241;
    auVar213._4_4_ =
         (local_360._4_4_ * auVar152._4_4_ + local_340._4_4_ * fVar272) * auVar152._4_4_ +
         fVar272 * fVar219;
    auVar213._8_4_ =
         (local_360._8_4_ * auVar152._8_4_ + local_340._8_4_ * fVar275) * auVar152._8_4_ +
         fVar275 * fVar242;
    auVar213._12_4_ =
         (local_360._12_4_ * auVar152._12_4_ + local_340._12_4_ * fVar278) * auVar152._12_4_ +
         fVar278 * fVar220;
    auVar213._16_4_ =
         (local_360._16_4_ * auVar152._16_4_ + local_340._16_4_ * fVar281) * auVar152._16_4_ +
         fVar281 * fVar243;
    auVar213._20_4_ =
         (local_360._20_4_ * auVar152._20_4_ + local_340._20_4_ * fVar283) * auVar152._20_4_ +
         fVar283 * fVar221;
    auVar213._24_4_ =
         (local_360._24_4_ * auVar152._24_4_ + local_340._24_4_ * fVar200) * auVar152._24_4_ +
         fVar200 * fVar244;
    auVar213._28_4_ = fStack_1c4 + auVar237._28_4_ + auVar217._28_4_;
    auVar238._0_4_ =
         (auVar152._0_4_ * (float)local_240._0_4_ + (float)local_1e0._0_4_ * fVar269) *
         auVar152._0_4_ + fVar269 * fVar222;
    auVar238._4_4_ =
         (auVar152._4_4_ * (float)local_240._4_4_ + (float)local_1e0._4_4_ * fVar272) *
         auVar152._4_4_ + fVar272 * fVar246;
    auVar238._8_4_ =
         (auVar152._8_4_ * fStack_238 + fStack_1d8 * fVar275) * auVar152._8_4_ + fVar275 * fVar223;
    auVar238._12_4_ =
         (auVar152._12_4_ * fStack_234 + fStack_1d4 * fVar278) * auVar152._12_4_ + fVar278 * fVar248
    ;
    auVar238._16_4_ =
         (auVar152._16_4_ * fStack_230 + fStack_1d0 * fVar281) * auVar152._16_4_ + fVar281 * fVar245
    ;
    auVar238._20_4_ =
         (auVar152._20_4_ * fStack_22c + fStack_1cc * fVar283) * auVar152._20_4_ + fVar283 * fVar247
    ;
    auVar238._24_4_ =
         (auVar152._24_4_ * fStack_228 + fStack_1c8 * fVar200) * auVar152._24_4_ + fVar200 * fVar249
    ;
    auVar238._28_4_ = fVar398 + auVar268._28_4_ + auVar237._28_4_;
    auVar260._0_4_ =
         (auVar152._0_4_ * (float)local_260._0_4_ + (float)local_200._0_4_ * fVar269) *
         auVar152._0_4_ + fVar269 * fVar251;
    auVar260._4_4_ =
         (auVar152._4_4_ * (float)local_260._4_4_ + (float)local_200._4_4_ * fVar272) *
         auVar152._4_4_ + fVar272 * fVar270;
    auVar260._8_4_ =
         (auVar152._8_4_ * fStack_258 + fStack_1f8 * fVar275) * auVar152._8_4_ + fVar275 * fVar273;
    auVar260._12_4_ =
         (auVar152._12_4_ * fStack_254 + fStack_1f4 * fVar278) * auVar152._12_4_ + fVar278 * fVar276
    ;
    auVar260._16_4_ =
         (auVar152._16_4_ * fStack_250 + fStack_1f0 * fVar281) * auVar152._16_4_ + fVar281 * fVar279
    ;
    auVar260._20_4_ =
         (auVar152._20_4_ * fStack_24c + fStack_1ec * fVar283) * auVar152._20_4_ + fVar283 * fVar282
    ;
    auVar260._24_4_ =
         (auVar152._24_4_ * fStack_248 + fStack_1e8 * fVar200) * auVar152._24_4_ + fVar200 * fVar284
    ;
    auVar260._28_4_ = fVar412 + fVar218 + auVar268._28_4_;
    auVar402._0_4_ = auVar369._0_4_ * fVar269 + auVar152._0_4_ * auVar296._0_4_;
    auVar402._4_4_ = auVar369._4_4_ * fVar272 + auVar152._4_4_ * auVar296._4_4_;
    auVar402._8_4_ = auVar369._8_4_ * fVar275 + auVar152._8_4_ * auVar296._8_4_;
    auVar402._12_4_ = auVar369._12_4_ * fVar278 + auVar152._12_4_ * auVar296._12_4_;
    auVar402._16_4_ = auVar369._16_4_ * fVar281 + auVar152._16_4_ * auVar296._16_4_;
    auVar402._20_4_ = auVar369._20_4_ * fVar283 + auVar152._20_4_ * auVar296._20_4_;
    auVar402._24_4_ = auVar369._24_4_ * fVar200 + auVar152._24_4_ * auVar296._24_4_;
    auVar402._28_4_ = fVar412 + fStack_1c4;
    auVar414._0_4_ = auVar373._0_4_ * fVar269 + auVar152._0_4_ * auVar213._0_4_;
    auVar414._4_4_ = auVar373._4_4_ * fVar272 + auVar152._4_4_ * auVar213._4_4_;
    auVar414._8_4_ = auVar373._8_4_ * fVar275 + auVar152._8_4_ * auVar213._8_4_;
    auVar414._12_4_ = auVar373._12_4_ * fVar278 + auVar152._12_4_ * auVar213._12_4_;
    auVar414._16_4_ = auVar373._16_4_ * fVar281 + auVar152._16_4_ * auVar213._16_4_;
    auVar414._20_4_ = auVar373._20_4_ * fVar283 + auVar152._20_4_ * auVar213._20_4_;
    auVar414._24_4_ = auVar373._24_4_ * fVar200 + auVar152._24_4_ * auVar213._24_4_;
    auVar414._28_4_ = fStack_1c4 + fVar398;
    auVar418._0_4_ = auVar383._0_4_ * fVar269 + auVar152._0_4_ * auVar238._0_4_;
    auVar418._4_4_ = auVar383._4_4_ * fVar272 + auVar152._4_4_ * auVar238._4_4_;
    auVar418._8_4_ = auVar383._8_4_ * fVar275 + auVar152._8_4_ * auVar238._8_4_;
    auVar418._12_4_ = auVar383._12_4_ * fVar278 + auVar152._12_4_ * auVar238._12_4_;
    auVar418._16_4_ = auVar383._16_4_ * fVar281 + auVar152._16_4_ * auVar238._16_4_;
    auVar418._20_4_ = auVar383._20_4_ * fVar283 + auVar152._20_4_ * auVar238._20_4_;
    auVar418._24_4_ = auVar383._24_4_ * fVar200 + auVar152._24_4_ * auVar238._24_4_;
    auVar418._28_4_ = fVar398 + fStack_1c4;
    local_7a0._0_4_ = fVar269 * auVar337._0_4_ + auVar152._0_4_ * auVar260._0_4_;
    local_7a0._4_4_ = fVar272 * auVar337._4_4_ + auVar152._4_4_ * auVar260._4_4_;
    local_7a0._8_4_ = fVar275 * auVar337._8_4_ + auVar152._8_4_ * auVar260._8_4_;
    local_7a0._12_4_ = fVar278 * auVar337._12_4_ + auVar152._12_4_ * auVar260._12_4_;
    local_7a0._16_4_ = fVar281 * auVar337._16_4_ + auVar152._16_4_ * auVar260._16_4_;
    local_7a0._20_4_ = fVar283 * auVar337._20_4_ + auVar152._20_4_ * auVar260._20_4_;
    local_7a0._24_4_ = fVar200 * auVar337._24_4_ + auVar152._24_4_ * auVar260._24_4_;
    local_7a0._28_4_ = auVar120._28_4_ + auVar152._28_4_;
    auVar13 = vsubps_avx(auVar296,auVar369);
    auVar120 = vsubps_avx(auVar213,auVar373);
    auVar118 = vsubps_avx(auVar238,auVar383);
    auVar14 = vsubps_avx(auVar260,auVar337);
    auVar146 = vshufps_avx(ZEXT416((uint)(fVar224 * 0.04761905)),
                           ZEXT416((uint)(fVar224 * 0.04761905)),0);
    fVar221 = auVar146._0_4_;
    fVar287 = fVar221 * auVar13._0_4_ * 3.0;
    fVar244 = auVar146._4_4_;
    fVar304 = fVar244 * auVar13._4_4_ * 3.0;
    auVar21._4_4_ = fVar304;
    auVar21._0_4_ = fVar287;
    fVar248 = auVar146._8_4_;
    fVar308 = fVar248 * auVar13._8_4_ * 3.0;
    auVar21._8_4_ = fVar308;
    fVar219 = auVar146._12_4_;
    fVar312 = fVar219 * auVar13._12_4_ * 3.0;
    auVar21._12_4_ = fVar312;
    fVar316 = fVar221 * auVar13._16_4_ * 3.0;
    auVar21._16_4_ = fVar316;
    fVar320 = fVar244 * auVar13._20_4_ * 3.0;
    auVar21._20_4_ = fVar320;
    fVar324 = fVar248 * auVar13._24_4_ * 3.0;
    auVar21._24_4_ = fVar324;
    auVar21._28_4_ = auVar296._28_4_;
    fVar327 = fVar221 * auVar120._0_4_ * 3.0;
    fVar343 = fVar244 * auVar120._4_4_ * 3.0;
    auVar22._4_4_ = fVar343;
    auVar22._0_4_ = fVar327;
    fVar345 = fVar248 * auVar120._8_4_ * 3.0;
    auVar22._8_4_ = fVar345;
    fVar348 = fVar219 * auVar120._12_4_ * 3.0;
    auVar22._12_4_ = fVar348;
    fVar351 = fVar221 * auVar120._16_4_ * 3.0;
    auVar22._16_4_ = fVar351;
    fVar354 = fVar244 * auVar120._20_4_ * 3.0;
    auVar22._20_4_ = fVar354;
    fVar357 = fVar248 * auVar120._24_4_ * 3.0;
    auVar22._24_4_ = fVar357;
    auVar22._28_4_ = auVar337._28_4_;
    fVar388 = fVar221 * auVar118._0_4_ * 3.0;
    fVar392 = fVar244 * auVar118._4_4_ * 3.0;
    auVar23._4_4_ = fVar392;
    auVar23._0_4_ = fVar388;
    fVar393 = fVar248 * auVar118._8_4_ * 3.0;
    auVar23._8_4_ = fVar393;
    fVar394 = fVar219 * auVar118._12_4_ * 3.0;
    auVar23._12_4_ = fVar394;
    fVar395 = fVar221 * auVar118._16_4_ * 3.0;
    auVar23._16_4_ = fVar395;
    fVar396 = fVar244 * auVar118._20_4_ * 3.0;
    auVar23._20_4_ = fVar396;
    fVar397 = fVar248 * auVar118._24_4_ * 3.0;
    auVar23._24_4_ = fVar397;
    auVar23._28_4_ = fVar398;
    fVar281 = fVar221 * auVar14._0_4_ * 3.0;
    fVar283 = fVar244 * auVar14._4_4_ * 3.0;
    auVar24._4_4_ = fVar283;
    auVar24._0_4_ = fVar281;
    fVar241 = fVar248 * auVar14._8_4_ * 3.0;
    auVar24._8_4_ = fVar241;
    fVar219 = fVar219 * auVar14._12_4_ * 3.0;
    auVar24._12_4_ = fVar219;
    fVar221 = fVar221 * auVar14._16_4_ * 3.0;
    auVar24._16_4_ = fVar221;
    fVar244 = fVar244 * auVar14._20_4_ * 3.0;
    auVar24._20_4_ = fVar244;
    fVar248 = fVar248 * auVar14._24_4_ * 3.0;
    auVar24._24_4_ = fVar248;
    auVar24._28_4_ = auVar13._28_4_;
    auVar120 = vperm2f128_avx(auVar414,auVar414,1);
    auVar120 = vshufps_avx(auVar120,auVar414,0x30);
    local_ac0 = vshufps_avx(auVar414,auVar120,0x29);
    auVar120 = vperm2f128_avx(auVar418,auVar418,1);
    auVar120 = vshufps_avx(auVar120,auVar418,0x30);
    _local_ae0 = vshufps_avx(auVar418,auVar120,0x29);
    auVar118 = vsubps_avx(local_7a0,auVar24);
    auVar120 = vperm2f128_avx(auVar118,auVar118,1);
    auVar120 = vshufps_avx(auVar120,auVar118,0x30);
    local_7c0 = vshufps_avx(auVar118,auVar120,0x29);
    auVar14 = vsubps_avx(local_ac0,auVar414);
    auVar15 = vsubps_avx(_local_ae0,auVar418);
    fVar272 = auVar14._0_4_;
    fVar200 = auVar14._4_4_;
    auVar25._4_4_ = fVar392 * fVar200;
    auVar25._0_4_ = fVar388 * fVar272;
    fVar242 = auVar14._8_4_;
    auVar25._8_4_ = fVar393 * fVar242;
    fVar222 = auVar14._12_4_;
    auVar25._12_4_ = fVar394 * fVar222;
    fVar247 = auVar14._16_4_;
    auVar25._16_4_ = fVar395 * fVar247;
    fVar276 = auVar14._20_4_;
    auVar25._20_4_ = fVar396 * fVar276;
    fVar303 = auVar14._24_4_;
    auVar25._24_4_ = fVar397 * fVar303;
    auVar25._28_4_ = auVar118._28_4_;
    fVar275 = auVar15._0_4_;
    fVar224 = auVar15._4_4_;
    auVar26._4_4_ = fVar343 * fVar224;
    auVar26._0_4_ = fVar327 * fVar275;
    fVar220 = auVar15._8_4_;
    auVar26._8_4_ = fVar345 * fVar220;
    fVar246 = auVar15._12_4_;
    auVar26._12_4_ = fVar348 * fVar246;
    fVar249 = auVar15._16_4_;
    auVar26._16_4_ = fVar351 * fVar249;
    fVar279 = auVar15._20_4_;
    auVar26._20_4_ = fVar354 * fVar279;
    fVar307 = auVar15._24_4_;
    auVar26._24_4_ = fVar357 * fVar307;
    auVar26._28_4_ = auVar120._28_4_;
    auVar15 = vsubps_avx(auVar26,auVar25);
    auVar120 = vperm2f128_avx(auVar402,auVar402,1);
    auVar120 = vshufps_avx(auVar120,auVar402,0x30);
    auVar14 = vshufps_avx(auVar402,auVar120,0x29);
    auVar120 = vsubps_avx(auVar14,auVar402);
    auVar27._4_4_ = fVar304 * fVar224;
    auVar27._0_4_ = fVar287 * fVar275;
    auVar27._8_4_ = fVar308 * fVar220;
    auVar27._12_4_ = fVar312 * fVar246;
    auVar27._16_4_ = fVar316 * fVar249;
    auVar27._20_4_ = fVar320 * fVar279;
    auVar27._24_4_ = fVar324 * fVar307;
    auVar27._28_4_ = auVar14._28_4_;
    fVar278 = auVar120._0_4_;
    fVar218 = auVar120._4_4_;
    auVar28._4_4_ = fVar392 * fVar218;
    auVar28._0_4_ = fVar388 * fVar278;
    fVar243 = auVar120._8_4_;
    auVar28._8_4_ = fVar393 * fVar243;
    fVar223 = auVar120._12_4_;
    auVar28._12_4_ = fVar394 * fVar223;
    fVar251 = auVar120._16_4_;
    auVar28._16_4_ = fVar395 * fVar251;
    fVar282 = auVar120._20_4_;
    auVar28._20_4_ = fVar396 * fVar282;
    fVar311 = auVar120._24_4_;
    auVar28._24_4_ = fVar397 * fVar311;
    auVar28._28_4_ = local_ae0._28_4_;
    auVar363 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar218 * fVar343;
    auVar29._0_4_ = fVar278 * fVar327;
    auVar29._8_4_ = fVar243 * fVar345;
    auVar29._12_4_ = fVar223 * fVar348;
    auVar29._16_4_ = fVar251 * fVar351;
    auVar29._20_4_ = fVar282 * fVar354;
    auVar29._24_4_ = fVar311 * fVar357;
    auVar29._28_4_ = local_ae0._28_4_;
    auVar30._4_4_ = fVar200 * fVar304;
    auVar30._0_4_ = fVar272 * fVar287;
    auVar30._8_4_ = fVar242 * fVar308;
    auVar30._12_4_ = fVar222 * fVar312;
    auVar30._16_4_ = fVar247 * fVar316;
    auVar30._20_4_ = fVar276 * fVar320;
    auVar30._24_4_ = fVar303 * fVar324;
    auVar30._28_4_ = auVar373._28_4_;
    auVar16 = vsubps_avx(auVar30,auVar29);
    fVar269 = auVar16._28_4_;
    fVar245 = auVar363._28_4_ + fVar269;
    auVar214._0_4_ = fVar278 * fVar278 + fVar272 * fVar272 + fVar275 * fVar275;
    auVar214._4_4_ = fVar218 * fVar218 + fVar200 * fVar200 + fVar224 * fVar224;
    auVar214._8_4_ = fVar243 * fVar243 + fVar242 * fVar242 + fVar220 * fVar220;
    auVar214._12_4_ = fVar223 * fVar223 + fVar222 * fVar222 + fVar246 * fVar246;
    auVar214._16_4_ = fVar251 * fVar251 + fVar247 * fVar247 + fVar249 * fVar249;
    auVar214._20_4_ = fVar282 * fVar282 + fVar276 * fVar276 + fVar279 * fVar279;
    auVar214._24_4_ = fVar311 * fVar311 + fVar303 * fVar303 + fVar307 * fVar307;
    auVar214._28_4_ = fVar269 + fVar269 + fVar245;
    auVar120 = vrcpps_avx(auVar214);
    fVar270 = auVar120._0_4_;
    fVar273 = auVar120._4_4_;
    auVar31._4_4_ = fVar273 * auVar214._4_4_;
    auVar31._0_4_ = fVar270 * auVar214._0_4_;
    fVar284 = auVar120._8_4_;
    auVar31._8_4_ = fVar284 * auVar214._8_4_;
    fVar286 = auVar120._12_4_;
    auVar31._12_4_ = fVar286 * auVar214._12_4_;
    fVar315 = auVar120._16_4_;
    auVar31._16_4_ = fVar315 * auVar214._16_4_;
    fVar319 = auVar120._20_4_;
    auVar31._20_4_ = fVar319 * auVar214._20_4_;
    fVar323 = auVar120._24_4_;
    auVar31._24_4_ = fVar323 * auVar214._24_4_;
    auVar31._28_4_ = auVar373._28_4_;
    auVar403._8_4_ = 0x3f800000;
    auVar403._0_8_ = &DAT_3f8000003f800000;
    auVar403._12_4_ = 0x3f800000;
    auVar403._16_4_ = 0x3f800000;
    auVar403._20_4_ = 0x3f800000;
    auVar403._24_4_ = 0x3f800000;
    auVar403._28_4_ = 0x3f800000;
    auVar17 = vsubps_avx(auVar403,auVar31);
    fVar270 = auVar17._0_4_ * fVar270 + fVar270;
    fVar273 = auVar17._4_4_ * fVar273 + fVar273;
    fVar284 = auVar17._8_4_ * fVar284 + fVar284;
    fVar286 = auVar17._12_4_ * fVar286 + fVar286;
    fVar315 = auVar17._16_4_ * fVar315 + fVar315;
    fVar319 = auVar17._20_4_ * fVar319 + fVar319;
    fVar323 = auVar17._24_4_ * fVar323 + fVar323;
    auVar118 = vperm2f128_avx(auVar22,auVar22,1);
    auVar118 = vshufps_avx(auVar118,auVar22,0x30);
    local_9c0 = vshufps_avx(auVar22,auVar118,0x29);
    auVar118 = vperm2f128_avx(auVar23,auVar23,1);
    auVar118 = vshufps_avx(auVar118,auVar23,0x30);
    local_980 = vshufps_avx(auVar23,auVar118,0x29);
    fVar399 = local_980._0_4_;
    fVar406 = local_980._4_4_;
    auVar32._4_4_ = fVar406 * fVar200;
    auVar32._0_4_ = fVar399 * fVar272;
    fVar407 = local_980._8_4_;
    auVar32._8_4_ = fVar407 * fVar242;
    fVar408 = local_980._12_4_;
    auVar32._12_4_ = fVar408 * fVar222;
    fVar409 = local_980._16_4_;
    auVar32._16_4_ = fVar409 * fVar247;
    fVar410 = local_980._20_4_;
    auVar32._20_4_ = fVar410 * fVar276;
    fVar411 = local_980._24_4_;
    auVar32._24_4_ = fVar411 * fVar303;
    auVar32._28_4_ = auVar118._28_4_;
    fVar328 = local_9c0._0_4_;
    fVar344 = local_9c0._4_4_;
    auVar33._4_4_ = fVar344 * fVar224;
    auVar33._0_4_ = fVar328 * fVar275;
    fVar346 = local_9c0._8_4_;
    auVar33._8_4_ = fVar346 * fVar220;
    fVar349 = local_9c0._12_4_;
    auVar33._12_4_ = fVar349 * fVar246;
    fVar352 = local_9c0._16_4_;
    auVar33._16_4_ = fVar352 * fVar249;
    fVar355 = local_9c0._20_4_;
    auVar33._20_4_ = fVar355 * fVar279;
    fVar358 = local_9c0._24_4_;
    auVar33._24_4_ = fVar358 * fVar307;
    auVar33._28_4_ = fVar398;
    auVar18 = vsubps_avx(auVar33,auVar32);
    auVar118 = vperm2f128_avx(auVar21,auVar21,1);
    auVar118 = vshufps_avx(auVar118,auVar21,0x30);
    local_940 = vshufps_avx(auVar21,auVar118,0x29);
    fVar288 = local_940._0_4_;
    fVar305 = local_940._4_4_;
    auVar34._4_4_ = fVar305 * fVar224;
    auVar34._0_4_ = fVar288 * fVar275;
    fVar309 = local_940._8_4_;
    auVar34._8_4_ = fVar309 * fVar220;
    fVar313 = local_940._12_4_;
    auVar34._12_4_ = fVar313 * fVar246;
    fVar317 = local_940._16_4_;
    auVar34._16_4_ = fVar317 * fVar249;
    fVar321 = local_940._20_4_;
    auVar34._20_4_ = fVar321 * fVar279;
    fVar325 = local_940._24_4_;
    auVar34._24_4_ = fVar325 * fVar307;
    auVar34._28_4_ = auVar118._28_4_;
    auVar35._4_4_ = fVar406 * fVar218;
    auVar35._0_4_ = fVar399 * fVar278;
    auVar35._8_4_ = fVar407 * fVar243;
    auVar35._12_4_ = fVar408 * fVar223;
    auVar35._16_4_ = fVar409 * fVar251;
    auVar35._20_4_ = fVar410 * fVar282;
    uVar92 = local_980._28_4_;
    auVar35._24_4_ = fVar411 * fVar311;
    auVar35._28_4_ = uVar92;
    auVar20 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar218 * fVar344;
    auVar36._0_4_ = fVar278 * fVar328;
    auVar36._8_4_ = fVar243 * fVar346;
    auVar36._12_4_ = fVar223 * fVar349;
    auVar36._16_4_ = fVar251 * fVar352;
    auVar36._20_4_ = fVar282 * fVar355;
    auVar36._24_4_ = fVar311 * fVar358;
    auVar36._28_4_ = uVar92;
    auVar37._4_4_ = fVar200 * fVar305;
    auVar37._0_4_ = fVar272 * fVar288;
    auVar37._8_4_ = fVar242 * fVar309;
    auVar37._12_4_ = fVar222 * fVar313;
    auVar37._16_4_ = fVar247 * fVar317;
    auVar37._20_4_ = fVar276 * fVar321;
    auVar37._24_4_ = fVar303 * fVar325;
    auVar37._28_4_ = auVar414._28_4_;
    auVar118 = vsubps_avx(auVar37,auVar36);
    fVar269 = auVar118._28_4_;
    auVar38._4_4_ =
         (auVar15._4_4_ * auVar15._4_4_ +
         auVar363._4_4_ * auVar363._4_4_ + auVar16._4_4_ * auVar16._4_4_) * fVar273;
    auVar38._0_4_ =
         (auVar15._0_4_ * auVar15._0_4_ +
         auVar363._0_4_ * auVar363._0_4_ + auVar16._0_4_ * auVar16._0_4_) * fVar270;
    auVar38._8_4_ =
         (auVar15._8_4_ * auVar15._8_4_ +
         auVar363._8_4_ * auVar363._8_4_ + auVar16._8_4_ * auVar16._8_4_) * fVar284;
    auVar38._12_4_ =
         (auVar15._12_4_ * auVar15._12_4_ +
         auVar363._12_4_ * auVar363._12_4_ + auVar16._12_4_ * auVar16._12_4_) * fVar286;
    auVar38._16_4_ =
         (auVar15._16_4_ * auVar15._16_4_ +
         auVar363._16_4_ * auVar363._16_4_ + auVar16._16_4_ * auVar16._16_4_) * fVar315;
    auVar38._20_4_ =
         (auVar15._20_4_ * auVar15._20_4_ +
         auVar363._20_4_ * auVar363._20_4_ + auVar16._20_4_ * auVar16._20_4_) * fVar319;
    auVar38._24_4_ =
         (auVar15._24_4_ * auVar15._24_4_ +
         auVar363._24_4_ * auVar363._24_4_ + auVar16._24_4_ * auVar16._24_4_) * fVar323;
    auVar38._28_4_ = auVar15._28_4_ + fVar245;
    auVar39._4_4_ =
         (auVar18._4_4_ * auVar18._4_4_ +
         auVar20._4_4_ * auVar20._4_4_ + auVar118._4_4_ * auVar118._4_4_) * fVar273;
    auVar39._0_4_ =
         (auVar18._0_4_ * auVar18._0_4_ +
         auVar20._0_4_ * auVar20._0_4_ + auVar118._0_4_ * auVar118._0_4_) * fVar270;
    auVar39._8_4_ =
         (auVar18._8_4_ * auVar18._8_4_ +
         auVar20._8_4_ * auVar20._8_4_ + auVar118._8_4_ * auVar118._8_4_) * fVar284;
    auVar39._12_4_ =
         (auVar18._12_4_ * auVar18._12_4_ +
         auVar20._12_4_ * auVar20._12_4_ + auVar118._12_4_ * auVar118._12_4_) * fVar286;
    auVar39._16_4_ =
         (auVar18._16_4_ * auVar18._16_4_ +
         auVar20._16_4_ * auVar20._16_4_ + auVar118._16_4_ * auVar118._16_4_) * fVar315;
    auVar39._20_4_ =
         (auVar18._20_4_ * auVar18._20_4_ +
         auVar20._20_4_ * auVar20._20_4_ + auVar118._20_4_ * auVar118._20_4_) * fVar319;
    auVar39._24_4_ =
         (auVar18._24_4_ * auVar18._24_4_ +
         auVar20._24_4_ * auVar20._24_4_ + auVar118._24_4_ * auVar118._24_4_) * fVar323;
    auVar39._28_4_ = auVar17._28_4_ + auVar120._28_4_;
    auVar120 = vmaxps_avx(auVar38,auVar39);
    auVar118 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar118 = vshufps_avx(auVar118,local_7a0,0x30);
    local_7e0 = vshufps_avx(local_7a0,auVar118,0x29);
    auVar153._0_4_ = (float)local_7a0._0_4_ + fVar281;
    auVar153._4_4_ = local_7a0._4_4_ + fVar283;
    auVar153._8_4_ = local_7a0._8_4_ + fVar241;
    auVar153._12_4_ = local_7a0._12_4_ + fVar219;
    auVar153._16_4_ = local_7a0._16_4_ + fVar221;
    auVar153._20_4_ = local_7a0._20_4_ + fVar244;
    auVar153._24_4_ = local_7a0._24_4_ + fVar248;
    auVar153._28_4_ = local_7a0._28_4_ + auVar13._28_4_;
    auVar118 = vmaxps_avx(local_7a0,auVar153);
    auVar13 = vmaxps_avx(local_7c0,local_7e0);
    auVar118 = vmaxps_avx(auVar118,auVar13);
    auVar13 = vrsqrtps_avx(auVar214);
    fVar281 = auVar13._0_4_;
    fVar283 = auVar13._4_4_;
    fVar241 = auVar13._8_4_;
    fVar219 = auVar13._12_4_;
    fVar221 = auVar13._16_4_;
    fVar244 = auVar13._20_4_;
    fVar248 = auVar13._24_4_;
    fVar371 = fVar281 * 1.5 + fVar281 * fVar281 * fVar281 * auVar214._0_4_ * -0.5;
    fVar377 = fVar283 * 1.5 + fVar283 * fVar283 * fVar283 * auVar214._4_4_ * -0.5;
    fVar378 = fVar241 * 1.5 + fVar241 * fVar241 * fVar241 * auVar214._8_4_ * -0.5;
    fVar379 = fVar219 * 1.5 + fVar219 * fVar219 * fVar219 * auVar214._12_4_ * -0.5;
    fStack_730 = fVar221 * 1.5 + fVar221 * fVar221 * fVar221 * auVar214._16_4_ * -0.5;
    fStack_72c = fVar244 * 1.5 + fVar244 * fVar244 * fVar244 * auVar214._20_4_ * -0.5;
    fStack_728 = fVar248 * 1.5 + fVar248 * fVar248 * fVar248 * auVar214._24_4_ * -0.5;
    fStack_724 = auVar13._28_4_ + auVar214._28_4_;
    auVar363 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar15 = vsubps_avx(auVar363,auVar414);
    auVar363 = vsubps_avx(auVar363,auVar418);
    fVar417 = auVar363._0_4_;
    fVar420 = auVar363._4_4_;
    fVar421 = auVar363._8_4_;
    fVar422 = auVar363._12_4_;
    fVar423 = auVar363._16_4_;
    fVar424 = auVar363._20_4_;
    fVar425 = auVar363._24_4_;
    fVar281 = auVar15._0_4_;
    fVar241 = auVar15._4_4_;
    fVar221 = auVar15._8_4_;
    fVar248 = auVar15._12_4_;
    fVar270 = auVar15._16_4_;
    fVar284 = auVar15._20_4_;
    fVar315 = auVar15._24_4_;
    auVar364 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar363 = vsubps_avx(auVar364,auVar402);
    fVar283 = auVar363._0_4_;
    fVar219 = auVar363._4_4_;
    fVar244 = auVar363._8_4_;
    fVar245 = auVar363._12_4_;
    fVar273 = auVar363._16_4_;
    fVar286 = auVar363._20_4_;
    fVar319 = auVar363._24_4_;
    auVar391._0_4_ =
         (float)local_b00._0_4_ * fVar283 +
         (float)local_a00._0_4_ * fVar281 + fVar417 * (float)local_960._0_4_;
    auVar391._4_4_ =
         (float)local_b00._4_4_ * fVar219 +
         (float)local_a00._4_4_ * fVar241 + fVar420 * (float)local_960._4_4_;
    auVar391._8_4_ = fStack_af8 * fVar244 + fStack_9f8 * fVar221 + fVar421 * fStack_958;
    auVar391._12_4_ = fStack_af4 * fVar245 + fStack_9f4 * fVar248 + fVar422 * fStack_954;
    auVar391._16_4_ = fStack_af0 * fVar273 + fStack_9f0 * fVar270 + fVar423 * fStack_950;
    auVar391._20_4_ = fStack_aec * fVar286 + fStack_9ec * fVar284 + fVar424 * fStack_94c;
    auVar391._24_4_ = fStack_ae8 * fVar319 + fStack_9e8 * fVar315 + fVar425 * fStack_948;
    auVar391._28_4_ = fVar269 + auVar20._28_4_ + fVar269 + auVar13._28_4_;
    auVar404._0_4_ = fVar283 * fVar283 + fVar281 * fVar281 + fVar417 * fVar417;
    auVar404._4_4_ = fVar219 * fVar219 + fVar241 * fVar241 + fVar420 * fVar420;
    auVar404._8_4_ = fVar244 * fVar244 + fVar221 * fVar221 + fVar421 * fVar421;
    auVar404._12_4_ = fVar245 * fVar245 + fVar248 * fVar248 + fVar422 * fVar422;
    auVar404._16_4_ = fVar273 * fVar273 + fVar270 * fVar270 + fVar423 * fVar423;
    auVar404._20_4_ = fVar286 * fVar286 + fVar284 * fVar284 + fVar424 * fVar424;
    auVar404._24_4_ = fVar319 * fVar319 + fVar315 * fVar315 + fVar425 * fVar425;
    auVar404._28_4_ = auVar414._28_4_ + auVar414._28_4_ + fVar269;
    fVar323 = (float)local_b00._0_4_ * fVar278 * fVar371 +
              fVar272 * fVar371 * (float)local_a00._0_4_ +
              fVar371 * fVar275 * (float)local_960._0_4_;
    fVar398 = (float)local_b00._4_4_ * fVar218 * fVar377 +
              fVar200 * fVar377 * (float)local_a00._4_4_ +
              fVar377 * fVar224 * (float)local_960._4_4_;
    fVar412 = fStack_af8 * fVar243 * fVar378 +
              fVar242 * fVar378 * fStack_9f8 + fVar378 * fVar220 * fStack_958;
    fVar130 = fStack_af4 * fVar223 * fVar379 +
              fVar222 * fVar379 * fStack_9f4 + fVar379 * fVar246 * fStack_954;
    fVar131 = fStack_af0 * fVar251 * fStack_730 +
              fVar247 * fStack_730 * fStack_9f0 + fStack_730 * fVar249 * fStack_950;
    fVar132 = fStack_aec * fVar282 * fStack_72c +
              fVar276 * fStack_72c * fStack_9ec + fStack_72c * fVar279 * fStack_94c;
    fVar133 = fStack_ae8 * fVar311 * fStack_728 +
              fVar303 * fStack_728 * fStack_9e8 + fStack_728 * fVar307 * fStack_948;
    fVar269 = fStack_ae4 + fStack_9e4 + fStack_944;
    local_4c0 = fVar283 * fVar278 * fVar371 +
                fVar272 * fVar371 * fVar281 + fVar417 * fVar371 * fVar275;
    fStack_4bc = fVar219 * fVar218 * fVar377 +
                 fVar200 * fVar377 * fVar241 + fVar420 * fVar377 * fVar224;
    fStack_4b8 = fVar244 * fVar243 * fVar378 +
                 fVar242 * fVar378 * fVar221 + fVar421 * fVar378 * fVar220;
    fStack_4b4 = fVar245 * fVar223 * fVar379 +
                 fVar222 * fVar379 * fVar248 + fVar422 * fVar379 * fVar246;
    fStack_4b0 = fVar273 * fVar251 * fStack_730 +
                 fVar247 * fStack_730 * fVar270 + fVar423 * fStack_730 * fVar249;
    fStack_4ac = fVar286 * fVar282 * fStack_72c +
                 fVar276 * fStack_72c * fVar284 + fVar424 * fStack_72c * fVar279;
    fStack_4a8 = fVar319 * fVar311 * fStack_728 +
                 fVar303 * fStack_728 * fVar315 + fVar425 * fStack_728 * fVar307;
    fStack_4a4 = fStack_9e4 + fVar269;
    auVar40._4_4_ = fVar398 * fStack_4bc;
    auVar40._0_4_ = fVar323 * local_4c0;
    auVar40._8_4_ = fVar412 * fStack_4b8;
    auVar40._12_4_ = fVar130 * fStack_4b4;
    auVar40._16_4_ = fVar131 * fStack_4b0;
    auVar40._20_4_ = fVar132 * fStack_4ac;
    auVar40._24_4_ = fVar133 * fStack_4a8;
    auVar40._28_4_ = fVar269;
    auVar16 = vsubps_avx(auVar391,auVar40);
    auVar41._4_4_ = fStack_4bc * fStack_4bc;
    auVar41._0_4_ = local_4c0 * local_4c0;
    auVar41._8_4_ = fStack_4b8 * fStack_4b8;
    auVar41._12_4_ = fStack_4b4 * fStack_4b4;
    auVar41._16_4_ = fStack_4b0 * fStack_4b0;
    auVar41._20_4_ = fStack_4ac * fStack_4ac;
    auVar41._24_4_ = fStack_4a8 * fStack_4a8;
    auVar41._28_4_ = fStack_9e4;
    auVar17 = vsubps_avx(auVar404,auVar41);
    auVar13 = vsqrtps_avx(auVar120);
    fVar269 = (auVar13._0_4_ + auVar118._0_4_) * 1.0000002;
    fVar171 = (auVar13._4_4_ + auVar118._4_4_) * 1.0000002;
    fVar172 = (auVar13._8_4_ + auVar118._8_4_) * 1.0000002;
    fVar174 = (auVar13._12_4_ + auVar118._12_4_) * 1.0000002;
    fVar175 = (auVar13._16_4_ + auVar118._16_4_) * 1.0000002;
    fVar176 = (auVar13._20_4_ + auVar118._20_4_) * 1.0000002;
    fVar177 = (auVar13._24_4_ + auVar118._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar171 * fVar171;
    auVar42._0_4_ = fVar269 * fVar269;
    auVar42._8_4_ = fVar172 * fVar172;
    auVar42._12_4_ = fVar174 * fVar174;
    auVar42._16_4_ = fVar175 * fVar175;
    auVar42._20_4_ = fVar176 * fVar176;
    auVar42._24_4_ = fVar177 * fVar177;
    auVar42._28_4_ = auVar13._28_4_ + auVar118._28_4_;
    fVar171 = auVar16._0_4_ + auVar16._0_4_;
    fVar172 = auVar16._4_4_ + auVar16._4_4_;
    local_b20._0_8_ = CONCAT44(fVar172,fVar171);
    local_b20._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    local_b20._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    local_b20._16_4_ = auVar16._16_4_ + auVar16._16_4_;
    local_b20._20_4_ = auVar16._20_4_ + auVar16._20_4_;
    local_b20._24_4_ = auVar16._24_4_ + auVar16._24_4_;
    local_b20._28_4_ = auVar16._28_4_ + auVar16._28_4_;
    auVar118 = vsubps_avx(auVar17,auVar42);
    auVar43._4_4_ = fVar398 * fVar398;
    auVar43._0_4_ = fVar323 * fVar323;
    auVar43._8_4_ = fVar412 * fVar412;
    auVar43._12_4_ = fVar130 * fVar130;
    auVar43._16_4_ = fVar131 * fVar131;
    auVar43._20_4_ = fVar132 * fVar132;
    auVar43._24_4_ = fVar133 * fVar133;
    auVar43._28_4_ = fStack_724;
    auVar16 = vsubps_avx(local_280,auVar43);
    auVar44._4_4_ = fVar172 * fVar172;
    auVar44._0_4_ = fVar171 * fVar171;
    auVar44._8_4_ = local_b20._8_4_ * local_b20._8_4_;
    auVar44._12_4_ = local_b20._12_4_ * local_b20._12_4_;
    auVar44._16_4_ = local_b20._16_4_ * local_b20._16_4_;
    auVar44._20_4_ = local_b20._20_4_ * local_b20._20_4_;
    auVar44._24_4_ = local_b20._24_4_ * local_b20._24_4_;
    auVar44._28_4_ = local_280._28_4_;
    fVar174 = auVar16._0_4_;
    fVar175 = auVar16._4_4_;
    fVar176 = auVar16._8_4_;
    fVar177 = auVar16._12_4_;
    fVar385 = auVar16._16_4_;
    fVar386 = auVar16._20_4_;
    fVar387 = auVar16._24_4_;
    auVar45._4_4_ = fVar175 * 4.0 * auVar118._4_4_;
    auVar45._0_4_ = fVar174 * 4.0 * auVar118._0_4_;
    auVar45._8_4_ = fVar176 * 4.0 * auVar118._8_4_;
    auVar45._12_4_ = fVar177 * 4.0 * auVar118._12_4_;
    auVar45._16_4_ = fVar385 * 4.0 * auVar118._16_4_;
    auVar45._20_4_ = fVar386 * 4.0 * auVar118._20_4_;
    auVar45._24_4_ = fVar387 * 4.0 * auVar118._24_4_;
    auVar45._28_4_ = 0x40800000;
    auVar18 = vsubps_avx(auVar44,auVar45);
    auVar120 = vcmpps_avx(auVar18,auVar364,5);
    fVar269 = auVar16._28_4_;
    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0x7f,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar120 >> 0xbf,0) == '\0') &&
        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar120[0x1f])
    {
      local_c40._8_4_ = 0x7f800000;
      local_c40._0_8_ = 0x7f8000007f800000;
      local_c40._12_4_ = 0x7f800000;
      local_c40._16_4_ = 0x7f800000;
      local_c40._20_4_ = 0x7f800000;
      local_c40._24_4_ = 0x7f800000;
      local_c40._28_4_ = 0x7f800000;
      auVar415._8_4_ = 0xff800000;
      auVar415._0_8_ = 0xff800000ff800000;
      auVar415._12_4_ = 0xff800000;
      auVar415._16_4_ = 0xff800000;
      auVar415._20_4_ = 0xff800000;
      auVar415._24_4_ = 0xff800000;
      auVar415._28_4_ = 0xff800000;
    }
    else {
      auVar112 = vsqrtps_avx(auVar18);
      auVar297._0_4_ = fVar174 + fVar174;
      auVar297._4_4_ = fVar175 + fVar175;
      auVar297._8_4_ = fVar176 + fVar176;
      auVar297._12_4_ = fVar177 + fVar177;
      auVar297._16_4_ = fVar385 + fVar385;
      auVar297._20_4_ = fVar386 + fVar386;
      auVar297._24_4_ = fVar387 + fVar387;
      auVar297._28_4_ = fVar269 + fVar269;
      auVar111 = vrcpps_avx(auVar297);
      auVar20 = vcmpps_avx(auVar18,auVar364,5);
      fVar289 = auVar111._0_4_;
      fVar306 = auVar111._4_4_;
      auVar46._4_4_ = auVar297._4_4_ * fVar306;
      auVar46._0_4_ = auVar297._0_4_ * fVar289;
      fVar310 = auVar111._8_4_;
      auVar46._8_4_ = auVar297._8_4_ * fVar310;
      fVar314 = auVar111._12_4_;
      auVar46._12_4_ = auVar297._12_4_ * fVar314;
      fVar318 = auVar111._16_4_;
      auVar46._16_4_ = auVar297._16_4_ * fVar318;
      fVar322 = auVar111._20_4_;
      auVar46._20_4_ = auVar297._20_4_ * fVar322;
      fVar326 = auVar111._24_4_;
      auVar46._24_4_ = auVar297._24_4_ * fVar326;
      auVar46._28_4_ = auVar297._28_4_;
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar115._16_4_ = 0x3f800000;
      auVar115._20_4_ = 0x3f800000;
      auVar115._24_4_ = 0x3f800000;
      auVar115._28_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar115,auVar46);
      fVar289 = fVar289 + fVar289 * auVar18._0_4_;
      fVar306 = fVar306 + fVar306 * auVar18._4_4_;
      fVar310 = fVar310 + fVar310 * auVar18._8_4_;
      fVar314 = fVar314 + fVar314 * auVar18._12_4_;
      fVar318 = fVar318 + fVar318 * auVar18._16_4_;
      fVar322 = fVar322 + fVar322 * auVar18._20_4_;
      fVar326 = fVar326 + fVar326 * auVar18._24_4_;
      auVar338._0_8_ = CONCAT44(fVar172,fVar171) ^ 0x8000000080000000;
      auVar338._8_4_ = -local_b20._8_4_;
      auVar338._12_4_ = -local_b20._12_4_;
      auVar338._16_4_ = -local_b20._16_4_;
      auVar338._20_4_ = -local_b20._20_4_;
      auVar338._24_4_ = -local_b20._24_4_;
      auVar338._28_4_ = -local_b20._28_4_;
      auVar364 = vsubps_avx(auVar338,auVar112);
      fVar171 = auVar364._0_4_ * fVar289;
      fVar172 = auVar364._4_4_ * fVar306;
      auVar47._4_4_ = fVar172;
      auVar47._0_4_ = fVar171;
      fVar347 = auVar364._8_4_ * fVar310;
      auVar47._8_4_ = fVar347;
      fVar350 = auVar364._12_4_ * fVar314;
      auVar47._12_4_ = fVar350;
      fVar353 = auVar364._16_4_ * fVar318;
      auVar47._16_4_ = fVar353;
      fVar356 = auVar364._20_4_ * fVar322;
      auVar47._20_4_ = fVar356;
      fVar359 = auVar364._24_4_ * fVar326;
      auVar47._24_4_ = fVar359;
      auVar47._28_4_ = auVar364._28_4_;
      auVar364 = vsubps_avx(auVar112,local_b20);
      fVar289 = auVar364._0_4_ * fVar289;
      fVar306 = auVar364._4_4_ * fVar306;
      auVar48._4_4_ = fVar306;
      auVar48._0_4_ = fVar289;
      fVar310 = auVar364._8_4_ * fVar310;
      auVar48._8_4_ = fVar310;
      fVar314 = auVar364._12_4_ * fVar314;
      auVar48._12_4_ = fVar314;
      fVar318 = auVar364._16_4_ * fVar318;
      auVar48._16_4_ = fVar318;
      fVar322 = auVar364._20_4_ * fVar322;
      auVar48._20_4_ = fVar322;
      fVar326 = auVar364._24_4_ * fVar326;
      auVar48._24_4_ = fVar326;
      auVar48._28_4_ = auVar364._28_4_;
      fStack_5e4 = fStack_4a4 + auVar111._28_4_ + auVar18._28_4_;
      local_600[0] = fVar371 * (local_4c0 + fVar323 * fVar171);
      local_600[1] = fVar377 * (fStack_4bc + fVar398 * fVar172);
      local_600[2] = fVar378 * (fStack_4b8 + fVar412 * fVar347);
      local_600[3] = fVar379 * (fStack_4b4 + fVar130 * fVar350);
      fStack_5f0 = fStack_730 * (fStack_4b0 + fVar131 * fVar353);
      fStack_5ec = fStack_72c * (fStack_4ac + fVar132 * fVar356);
      fStack_5e8 = fStack_728 * (fStack_4a8 + fVar133 * fVar359);
      local_620[0] = fVar371 * (local_4c0 + fVar323 * fVar289);
      local_620[1] = fVar377 * (fStack_4bc + fVar398 * fVar306);
      local_620[2] = fVar378 * (fStack_4b8 + fVar412 * fVar310);
      local_620[3] = fVar379 * (fStack_4b4 + fVar130 * fVar314);
      fStack_610 = fStack_730 * (fStack_4b0 + fVar131 * fVar318);
      fStack_60c = fStack_72c * (fStack_4ac + fVar132 * fVar322);
      fStack_608 = fStack_728 * (fStack_4a8 + fVar133 * fVar326);
      fStack_604 = fStack_4a4 + fStack_5e4;
      auVar298._8_4_ = 0x7f800000;
      auVar298._0_8_ = 0x7f8000007f800000;
      auVar298._12_4_ = 0x7f800000;
      auVar298._16_4_ = 0x7f800000;
      auVar298._20_4_ = 0x7f800000;
      auVar298._24_4_ = 0x7f800000;
      auVar298._28_4_ = 0x7f800000;
      local_c40 = vblendvps_avx(auVar298,auVar47,auVar20);
      auVar339._8_4_ = 0x7fffffff;
      auVar339._0_8_ = 0x7fffffff7fffffff;
      auVar339._12_4_ = 0x7fffffff;
      auVar339._16_4_ = 0x7fffffff;
      auVar339._20_4_ = 0x7fffffff;
      auVar339._24_4_ = 0x7fffffff;
      auVar339._28_4_ = 0x7fffffff;
      auVar18 = vandps_avx(auVar43,auVar339);
      auVar18 = vmaxps_avx(local_460,auVar18);
      auVar49._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar18._28_4_;
      auVar18 = vandps_avx(auVar16,auVar339);
      auVar18 = vcmpps_avx(auVar18,auVar49,1);
      auVar299._8_4_ = 0xff800000;
      auVar299._0_8_ = 0xff800000ff800000;
      auVar299._12_4_ = 0xff800000;
      auVar299._16_4_ = 0xff800000;
      auVar299._20_4_ = 0xff800000;
      auVar299._24_4_ = 0xff800000;
      auVar299._28_4_ = 0xff800000;
      auVar415 = vblendvps_avx(auVar299,auVar48,auVar20);
      auVar364 = auVar20 & auVar18;
      if ((((((((auVar364 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar364 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar364 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar364 >> 0x7f,0) != '\0') ||
            (auVar364 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar364 >> 0xbf,0) != '\0') ||
          (auVar364 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar364[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar18,auVar20);
        auVar146 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
        auVar364 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar18 = vcmpps_avx(auVar118,auVar364,2);
        auVar375._8_4_ = 0xff800000;
        auVar375._0_8_ = 0xff800000ff800000;
        auVar375._12_4_ = 0xff800000;
        auVar375._16_4_ = 0xff800000;
        auVar375._20_4_ = 0xff800000;
        auVar375._24_4_ = 0xff800000;
        auVar375._28_4_ = 0xff800000;
        auVar405._8_4_ = 0x7f800000;
        auVar405._0_8_ = 0x7f8000007f800000;
        auVar405._12_4_ = 0x7f800000;
        auVar405._16_4_ = 0x7f800000;
        auVar405._20_4_ = 0x7f800000;
        auVar405._24_4_ = 0x7f800000;
        auVar405._28_4_ = 0x7f800000;
        auVar118 = vblendvps_avx(auVar405,auVar375,auVar18);
        auVar329 = vpmovsxwd_avx(auVar146);
        auVar146 = vpunpckhwd_avx(auVar146,auVar146);
        auVar267._16_16_ = auVar146;
        auVar267._0_16_ = auVar329;
        local_c40 = vblendvps_avx(local_c40,auVar118,auVar267);
        auVar118 = vblendvps_avx(auVar375,auVar405,auVar18);
        auVar415 = vblendvps_avx(auVar415,auVar118,auVar267);
        auVar118 = vcmpps_avx(auVar364,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar198._0_4_ = auVar120._0_4_ ^ auVar118._0_4_;
        auVar198._4_4_ = auVar120._4_4_ ^ auVar118._4_4_;
        auVar198._8_4_ = auVar120._8_4_ ^ auVar118._8_4_;
        auVar198._12_4_ = auVar120._12_4_ ^ auVar118._12_4_;
        auVar198._16_4_ = auVar120._16_4_ ^ auVar118._16_4_;
        auVar198._20_4_ = auVar120._20_4_ ^ auVar118._20_4_;
        auVar198._24_4_ = auVar120._24_4_ ^ auVar118._24_4_;
        auVar198._28_4_ = auVar120._28_4_ ^ auVar118._28_4_;
        auVar120 = vorps_avx(auVar18,auVar198);
        auVar120 = vandps_avx(auVar20,auVar120);
      }
    }
    auVar302 = ZEXT3264(local_b20);
    auVar268 = ZEXT3264(local_440);
    auVar118 = local_440 & auVar120;
    auVar376 = ZEXT3264(local_aa0);
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0x7f,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar118 >> 0xbf,0) == '\0') &&
        (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar118[0x1f])
    {
LAB_01126438:
      auVar237._8_4_ = 0x3f800000;
      auVar237._0_8_ = &DAT_3f8000003f800000;
      auVar237._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
    }
    else {
      auVar146 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8f0._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8f0._0_4_
                                           )),0);
      auVar154._16_16_ = auVar146;
      auVar154._0_16_ = auVar146;
      auVar20 = vminps_avx(auVar154,auVar415);
      fVar322 = local_440._28_4_;
      auVar116._0_4_ =
           (float)local_b00._0_4_ * fVar287 +
           (float)local_a00._0_4_ * fVar327 + (float)local_960._0_4_ * fVar388;
      auVar116._4_4_ =
           (float)local_b00._4_4_ * fVar304 +
           (float)local_a00._4_4_ * fVar343 + (float)local_960._4_4_ * fVar392;
      auVar116._8_4_ = fStack_af8 * fVar308 + fStack_9f8 * fVar345 + fStack_958 * fVar393;
      auVar116._12_4_ = fStack_af4 * fVar312 + fStack_9f4 * fVar348 + fStack_954 * fVar394;
      auVar116._16_4_ = fStack_af0 * fVar316 + fStack_9f0 * fVar351 + fStack_950 * fVar395;
      auVar116._20_4_ = fStack_aec * fVar320 + fStack_9ec * fVar354 + fStack_94c * fVar396;
      auVar116._24_4_ = fStack_ae8 * fVar324 + fStack_9e8 * fVar357 + fStack_948 * fVar397;
      auVar116._28_4_ = auVar296._28_4_ + fVar322 + auVar363._28_4_;
      auVar118 = vrcpps_avx(auVar116);
      fVar171 = auVar118._0_4_;
      fVar172 = auVar118._4_4_;
      auVar50._4_4_ = auVar116._4_4_ * fVar172;
      auVar50._0_4_ = auVar116._0_4_ * fVar171;
      fVar289 = auVar118._8_4_;
      auVar50._8_4_ = auVar116._8_4_ * fVar289;
      fVar306 = auVar118._12_4_;
      auVar50._12_4_ = auVar116._12_4_ * fVar306;
      fVar310 = auVar118._16_4_;
      auVar50._16_4_ = auVar116._16_4_ * fVar310;
      fVar314 = auVar118._20_4_;
      auVar50._20_4_ = auVar116._20_4_ * fVar314;
      fVar318 = auVar118._24_4_;
      auVar50._24_4_ = auVar116._24_4_ * fVar318;
      auVar50._28_4_ = fVar322;
      auVar374._8_4_ = 0x3f800000;
      auVar374._0_8_ = &DAT_3f8000003f800000;
      auVar374._12_4_ = 0x3f800000;
      auVar374._16_4_ = 0x3f800000;
      auVar374._20_4_ = 0x3f800000;
      auVar374._24_4_ = 0x3f800000;
      auVar374._28_4_ = 0x3f800000;
      auVar364 = vsubps_avx(auVar374,auVar50);
      auVar340._8_4_ = 0x7fffffff;
      auVar340._0_8_ = 0x7fffffff7fffffff;
      auVar340._12_4_ = 0x7fffffff;
      auVar340._16_4_ = 0x7fffffff;
      auVar340._20_4_ = 0x7fffffff;
      auVar340._24_4_ = 0x7fffffff;
      auVar340._28_4_ = 0x7fffffff;
      auVar118 = vandps_avx(auVar116,auVar340);
      auVar370._8_4_ = 0x219392ef;
      auVar370._0_8_ = 0x219392ef219392ef;
      auVar370._12_4_ = 0x219392ef;
      auVar370._16_4_ = 0x219392ef;
      auVar370._20_4_ = 0x219392ef;
      auVar370._24_4_ = 0x219392ef;
      auVar370._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar118,auVar370,1);
      auVar51._4_4_ =
           (fVar172 + fVar172 * auVar364._4_4_) *
           -(fVar219 * fVar304 + fVar241 * fVar343 + fVar420 * fVar392);
      auVar51._0_4_ =
           (fVar171 + fVar171 * auVar364._0_4_) *
           -(fVar283 * fVar287 + fVar281 * fVar327 + fVar417 * fVar388);
      auVar51._8_4_ =
           (fVar289 + fVar289 * auVar364._8_4_) *
           -(fVar244 * fVar308 + fVar221 * fVar345 + fVar421 * fVar393);
      auVar51._12_4_ =
           (fVar306 + fVar306 * auVar364._12_4_) *
           -(fVar245 * fVar312 + fVar248 * fVar348 + fVar422 * fVar394);
      auVar51._16_4_ =
           (fVar310 + fVar310 * auVar364._16_4_) *
           -(fVar273 * fVar316 + fVar270 * fVar351 + fVar423 * fVar395);
      auVar51._20_4_ =
           (fVar314 + fVar314 * auVar364._20_4_) *
           -(fVar286 * fVar320 + fVar284 * fVar354 + fVar424 * fVar396);
      auVar51._24_4_ =
           (fVar318 + fVar318 * auVar364._24_4_) *
           -(fVar319 * fVar324 + fVar315 * fVar357 + fVar425 * fVar397);
      auVar51._28_4_ = -(auVar363._28_4_ + auVar15._28_4_ + fVar322);
      auVar75 = ZEXT812(0);
      auVar367 = ZEXT1228(auVar75) << 0x20;
      auVar118 = vcmpps_avx(auVar116,ZEXT1232(auVar75) << 0x20,1);
      auVar118 = vorps_avx(auVar18,auVar118);
      auVar365._8_4_ = 0xff800000;
      auVar365._0_8_ = 0xff800000ff800000;
      auVar365._12_4_ = 0xff800000;
      auVar365._16_4_ = 0xff800000;
      auVar365._20_4_ = 0xff800000;
      auVar365._24_4_ = 0xff800000;
      auVar365._28_4_ = 0xff800000;
      auVar118 = vblendvps_avx(auVar51,auVar365,auVar118);
      auVar15 = vcmpps_avx(auVar116,ZEXT1232(auVar75) << 0x20,6);
      auVar15 = vorps_avx(auVar18,auVar15);
      auVar384._8_4_ = 0x7f800000;
      auVar384._0_8_ = 0x7f8000007f800000;
      auVar384._12_4_ = 0x7f800000;
      auVar384._16_4_ = 0x7f800000;
      auVar384._20_4_ = 0x7f800000;
      auVar384._24_4_ = 0x7f800000;
      auVar384._28_4_ = 0x7f800000;
      auVar15 = vblendvps_avx(auVar51,auVar384,auVar15);
      auVar363 = vmaxps_avx(local_380,local_c40);
      auVar363 = vmaxps_avx(auVar363,auVar118);
      auVar15 = vminps_avx(auVar20,auVar15);
      auVar111 = ZEXT1232(auVar75) << 0x20;
      auVar118 = vsubps_avx(auVar111,local_ac0);
      auVar18 = vsubps_avx(auVar111,_local_ae0);
      auVar52._4_4_ = auVar18._4_4_ * -fVar406;
      auVar52._0_4_ = auVar18._0_4_ * -fVar399;
      auVar52._8_4_ = auVar18._8_4_ * -fVar407;
      auVar52._12_4_ = auVar18._12_4_ * -fVar408;
      auVar52._16_4_ = auVar18._16_4_ * -fVar409;
      auVar52._20_4_ = auVar18._20_4_ * -fVar410;
      auVar52._24_4_ = auVar18._24_4_ * -fVar411;
      auVar52._28_4_ = auVar18._28_4_;
      auVar53._4_4_ = fVar344 * auVar118._4_4_;
      auVar53._0_4_ = fVar328 * auVar118._0_4_;
      auVar53._8_4_ = fVar346 * auVar118._8_4_;
      auVar53._12_4_ = fVar349 * auVar118._12_4_;
      auVar53._16_4_ = fVar352 * auVar118._16_4_;
      auVar53._20_4_ = fVar355 * auVar118._20_4_;
      auVar53._24_4_ = fVar358 * auVar118._24_4_;
      auVar53._28_4_ = auVar118._28_4_;
      auVar118 = vsubps_avx(auVar52,auVar53);
      auVar14 = vsubps_avx(auVar111,auVar14);
      auVar54._4_4_ = fVar305 * auVar14._4_4_;
      auVar54._0_4_ = fVar288 * auVar14._0_4_;
      auVar54._8_4_ = fVar309 * auVar14._8_4_;
      auVar54._12_4_ = fVar313 * auVar14._12_4_;
      auVar54._16_4_ = fVar317 * auVar14._16_4_;
      auVar54._20_4_ = fVar321 * auVar14._20_4_;
      uVar2 = auVar14._28_4_;
      auVar54._24_4_ = fVar325 * auVar14._24_4_;
      auVar54._28_4_ = uVar2;
      auVar18 = vsubps_avx(auVar118,auVar54);
      auVar55._4_4_ = (float)local_960._4_4_ * -fVar406;
      auVar55._0_4_ = (float)local_960._0_4_ * -fVar399;
      auVar55._8_4_ = fStack_958 * -fVar407;
      auVar55._12_4_ = fStack_954 * -fVar408;
      auVar55._16_4_ = fStack_950 * -fVar409;
      auVar55._20_4_ = fStack_94c * -fVar410;
      auVar55._24_4_ = fStack_948 * -fVar411;
      auVar55._28_4_ = uVar92 ^ 0x80000000;
      auVar56._4_4_ = (float)local_a00._4_4_ * fVar344;
      auVar56._0_4_ = (float)local_a00._0_4_ * fVar328;
      auVar56._8_4_ = fStack_9f8 * fVar346;
      auVar56._12_4_ = fStack_9f4 * fVar349;
      auVar56._16_4_ = fStack_9f0 * fVar352;
      auVar56._20_4_ = fStack_9ec * fVar355;
      auVar56._24_4_ = fStack_9e8 * fVar358;
      auVar56._28_4_ = uVar2;
      auVar237._8_4_ = 0x3f800000;
      auVar237._0_8_ = &DAT_3f8000003f800000;
      auVar237._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
      auVar118 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = (float)local_b00._4_4_ * fVar305;
      auVar57._0_4_ = (float)local_b00._0_4_ * fVar288;
      auVar57._8_4_ = fStack_af8 * fVar309;
      auVar57._12_4_ = fStack_af4 * fVar313;
      auVar57._16_4_ = fStack_af0 * fVar317;
      auVar57._20_4_ = fStack_aec * fVar321;
      auVar57._24_4_ = fStack_ae8 * fVar325;
      auVar57._28_4_ = uVar2;
      auVar20 = vsubps_avx(auVar118,auVar57);
      auVar118 = vrcpps_avx(auVar20);
      fVar281 = auVar118._0_4_;
      fVar283 = auVar118._4_4_;
      auVar58._4_4_ = auVar20._4_4_ * fVar283;
      auVar58._0_4_ = auVar20._0_4_ * fVar281;
      fVar241 = auVar118._8_4_;
      auVar58._8_4_ = auVar20._8_4_ * fVar241;
      fVar219 = auVar118._12_4_;
      auVar58._12_4_ = auVar20._12_4_ * fVar219;
      fVar221 = auVar118._16_4_;
      auVar58._16_4_ = auVar20._16_4_ * fVar221;
      fVar244 = auVar118._20_4_;
      auVar58._20_4_ = auVar20._20_4_ * fVar244;
      fVar248 = auVar118._24_4_;
      auVar58._24_4_ = auVar20._24_4_ * fVar248;
      auVar58._28_4_ = fStack_ae4;
      auVar364 = vsubps_avx(auVar237,auVar58);
      auVar118 = vandps_avx(auVar20,auVar340);
      auVar190._8_4_ = 0x219392ef;
      auVar190._0_8_ = 0x219392ef219392ef;
      auVar190._12_4_ = 0x219392ef;
      auVar190._16_4_ = 0x219392ef;
      auVar190._20_4_ = 0x219392ef;
      auVar190._24_4_ = 0x219392ef;
      auVar190._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar118,auVar190,1);
      auVar302 = ZEXT3264(auVar14);
      auVar59._4_4_ = (fVar283 + fVar283 * auVar364._4_4_) * -auVar18._4_4_;
      auVar59._0_4_ = (fVar281 + fVar281 * auVar364._0_4_) * -auVar18._0_4_;
      auVar59._8_4_ = (fVar241 + fVar241 * auVar364._8_4_) * -auVar18._8_4_;
      auVar59._12_4_ = (fVar219 + fVar219 * auVar364._12_4_) * -auVar18._12_4_;
      auVar59._16_4_ = (fVar221 + fVar221 * auVar364._16_4_) * -auVar18._16_4_;
      auVar59._20_4_ = (fVar244 + fVar244 * auVar364._20_4_) * -auVar18._20_4_;
      auVar59._24_4_ = (fVar248 + fVar248 * auVar364._24_4_) * -auVar18._24_4_;
      auVar59._28_4_ = auVar18._28_4_ ^ 0x80000000;
      auVar118 = vcmpps_avx(auVar20,auVar111,1);
      auVar118 = vorps_avx(auVar14,auVar118);
      auVar118 = vblendvps_avx(auVar59,auVar365,auVar118);
      _local_880 = vmaxps_avx(auVar363,auVar118);
      auVar268 = ZEXT3264(local_440);
      auVar363 = ZEXT1232(auVar75) << 0x20;
      auVar118 = vcmpps_avx(auVar20,auVar363,6);
      auVar118 = vorps_avx(auVar14,auVar118);
      auVar118 = vblendvps_avx(auVar59,auVar384,auVar118);
      auVar120 = vandps_avx(auVar120,local_440);
      local_3c0 = vminps_avx(auVar15,auVar118);
      auVar118 = vcmpps_avx(_local_880,local_3c0,2);
      auVar14 = auVar120 & auVar118;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar14 = vminps_avx(local_7a0,auVar153);
        auVar15 = vminps_avx(local_7c0,local_7e0);
        auVar14 = vminps_avx(auVar14,auVar15);
        auVar13 = vsubps_avx(auVar14,auVar13);
        auVar120 = vandps_avx(auVar118,auVar120);
        auVar91._4_4_ = local_600[1];
        auVar91._0_4_ = local_600[0];
        auVar91._8_4_ = local_600[2];
        auVar91._12_4_ = local_600[3];
        auVar91._16_4_ = fStack_5f0;
        auVar91._20_4_ = fStack_5ec;
        auVar91._24_4_ = fStack_5e8;
        auVar91._28_4_ = fStack_5e4;
        auVar118 = vminps_avx(auVar91,auVar237);
        auVar118 = vmaxps_avx(auVar118,ZEXT832(0) << 0x20);
        local_600[0] = fVar252 + fVar277 * (auVar118._0_4_ + 0.0) * 0.125;
        local_600[1] = fVar271 + fVar280 * (auVar118._4_4_ + 1.0) * 0.125;
        local_600[2] = fVar274 + fVar285 * (auVar118._8_4_ + 2.0) * 0.125;
        local_600[3] = fVar129 + fVar173 * (auVar118._12_4_ + 3.0) * 0.125;
        fStack_5f0 = fVar252 + fVar277 * (auVar118._16_4_ + 4.0) * 0.125;
        fStack_5ec = fVar271 + fVar280 * (auVar118._20_4_ + 5.0) * 0.125;
        fStack_5e8 = fVar274 + fVar285 * (auVar118._24_4_ + 6.0) * 0.125;
        fStack_5e4 = fVar129 + auVar118._28_4_ + 7.0;
        auVar90._4_4_ = local_620[1];
        auVar90._0_4_ = local_620[0];
        auVar90._8_4_ = local_620[2];
        auVar90._12_4_ = local_620[3];
        auVar90._16_4_ = fStack_610;
        auVar90._20_4_ = fStack_60c;
        auVar90._24_4_ = fStack_608;
        auVar90._28_4_ = fStack_604;
        auVar118 = vminps_avx(auVar90,auVar237);
        auVar118 = vmaxps_avx(auVar118,ZEXT832(0) << 0x20);
        local_620[0] = fVar252 + fVar277 * (auVar118._0_4_ + 0.0) * 0.125;
        local_620[1] = fVar271 + fVar280 * (auVar118._4_4_ + 1.0) * 0.125;
        local_620[2] = fVar274 + fVar285 * (auVar118._8_4_ + 2.0) * 0.125;
        local_620[3] = fVar129 + fVar173 * (auVar118._12_4_ + 3.0) * 0.125;
        fStack_610 = fVar252 + fVar277 * (auVar118._16_4_ + 4.0) * 0.125;
        fStack_60c = fVar271 + fVar280 * (auVar118._20_4_ + 5.0) * 0.125;
        fStack_608 = fVar274 + fVar285 * (auVar118._24_4_ + 6.0) * 0.125;
        fStack_604 = fVar129 + auVar118._28_4_ + 7.0;
        auVar61._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar61._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar61._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar61._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar61._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar61._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar61._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar61._28_4_ = 0x3f7ffffc;
        auVar118 = vmaxps_avx(auVar363,auVar61);
        auVar62._4_4_ = auVar118._4_4_ * auVar118._4_4_;
        auVar62._0_4_ = auVar118._0_4_ * auVar118._0_4_;
        auVar62._8_4_ = auVar118._8_4_ * auVar118._8_4_;
        auVar62._12_4_ = auVar118._12_4_ * auVar118._12_4_;
        auVar62._16_4_ = auVar118._16_4_ * auVar118._16_4_;
        auVar62._20_4_ = auVar118._20_4_ * auVar118._20_4_;
        auVar62._24_4_ = auVar118._24_4_ * auVar118._24_4_;
        auVar62._28_4_ = auVar118._28_4_;
        auVar13 = vsubps_avx(auVar17,auVar62);
        auVar63._4_4_ = auVar13._4_4_ * fVar175 * 4.0;
        auVar63._0_4_ = auVar13._0_4_ * fVar174 * 4.0;
        auVar63._8_4_ = auVar13._8_4_ * fVar176 * 4.0;
        auVar63._12_4_ = auVar13._12_4_ * fVar177 * 4.0;
        auVar63._16_4_ = auVar13._16_4_ * fVar385 * 4.0;
        auVar63._20_4_ = auVar13._20_4_ * fVar386 * 4.0;
        auVar63._24_4_ = auVar13._24_4_ * fVar387 * 4.0;
        auVar63._28_4_ = auVar118._28_4_;
        auVar14 = vsubps_avx(auVar44,auVar63);
        local_920 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
        auVar118 = local_920;
        if ((((((((local_920 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_920 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_920 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_920 >> 0x7f,0) == '\0') &&
              (local_920 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_920 >> 0xbf,0) == '\0') &&
            (local_920 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_920[0x1f]) {
          _local_8c0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_860 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar210 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar234 = ZEXT828(0) << 0x20;
          auVar155._8_4_ = 0x7f800000;
          auVar155._0_8_ = 0x7f8000007f800000;
          auVar155._12_4_ = 0x7f800000;
          auVar155._16_4_ = 0x7f800000;
          auVar155._20_4_ = 0x7f800000;
          auVar155._24_4_ = 0x7f800000;
          auVar155._28_4_ = 0x7f800000;
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          local_920 = auVar22;
          _local_8a0 = _local_8c0;
        }
        else {
          auVar17 = vsqrtps_avx(auVar14);
          auVar156._0_4_ = fVar174 + fVar174;
          auVar156._4_4_ = fVar175 + fVar175;
          auVar156._8_4_ = fVar176 + fVar176;
          auVar156._12_4_ = fVar177 + fVar177;
          auVar156._16_4_ = fVar385 + fVar385;
          auVar156._20_4_ = fVar386 + fVar386;
          auVar156._24_4_ = fVar387 + fVar387;
          auVar156._28_4_ = fVar269 + fVar269;
          auVar15 = vrcpps_avx(auVar156);
          fVar269 = auVar15._0_4_;
          fVar281 = auVar15._4_4_;
          auVar64._4_4_ = auVar156._4_4_ * fVar281;
          auVar64._0_4_ = auVar156._0_4_ * fVar269;
          fVar283 = auVar15._8_4_;
          auVar64._8_4_ = auVar156._8_4_ * fVar283;
          fVar241 = auVar15._12_4_;
          auVar64._12_4_ = auVar156._12_4_ * fVar241;
          fVar219 = auVar15._16_4_;
          auVar64._16_4_ = auVar156._16_4_ * fVar219;
          fVar221 = auVar15._20_4_;
          auVar64._20_4_ = auVar156._20_4_ * fVar221;
          fVar244 = auVar15._24_4_;
          auVar64._24_4_ = auVar156._24_4_ * fVar244;
          auVar64._28_4_ = auVar156._28_4_;
          auVar18 = vsubps_avx(auVar237,auVar64);
          fVar269 = fVar269 + fVar269 * auVar18._0_4_;
          fVar281 = fVar281 + fVar281 * auVar18._4_4_;
          fVar283 = fVar283 + fVar283 * auVar18._8_4_;
          fVar241 = fVar241 + fVar241 * auVar18._12_4_;
          fVar219 = fVar219 + fVar219 * auVar18._16_4_;
          fVar221 = fVar221 + fVar221 * auVar18._20_4_;
          fVar244 = fVar244 + fVar244 * auVar18._24_4_;
          fVar319 = auVar15._28_4_ + auVar18._28_4_;
          auVar157._0_8_ = local_b20._0_8_ ^ 0x8000000080000000;
          auVar157._8_4_ = -local_b20._8_4_;
          auVar157._12_4_ = -local_b20._12_4_;
          auVar157._16_4_ = -local_b20._16_4_;
          auVar157._20_4_ = -local_b20._20_4_;
          auVar157._24_4_ = -local_b20._24_4_;
          auVar157._28_4_ = -local_b20._28_4_;
          auVar15 = vsubps_avx(auVar157,auVar17);
          fVar248 = auVar15._0_4_ * fVar269;
          fVar245 = auVar15._4_4_ * fVar281;
          auVar65._4_4_ = fVar245;
          auVar65._0_4_ = fVar248;
          fVar270 = auVar15._8_4_ * fVar283;
          auVar65._8_4_ = fVar270;
          fVar273 = auVar15._12_4_ * fVar241;
          auVar65._12_4_ = fVar273;
          fVar284 = auVar15._16_4_ * fVar219;
          auVar65._16_4_ = fVar284;
          fVar286 = auVar15._20_4_ * fVar221;
          auVar65._20_4_ = fVar286;
          fVar315 = auVar15._24_4_ * fVar244;
          auVar65._24_4_ = fVar315;
          auVar65._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(auVar17,local_b20);
          fVar269 = auVar15._0_4_ * fVar269;
          fVar281 = auVar15._4_4_ * fVar281;
          auVar66._4_4_ = fVar281;
          auVar66._0_4_ = fVar269;
          fVar283 = auVar15._8_4_ * fVar283;
          auVar66._8_4_ = fVar283;
          fVar241 = auVar15._12_4_ * fVar241;
          auVar66._12_4_ = fVar241;
          fVar219 = auVar15._16_4_ * fVar219;
          auVar66._16_4_ = fVar219;
          fVar221 = auVar15._20_4_ * fVar221;
          auVar66._20_4_ = fVar221;
          fVar244 = auVar15._24_4_ * fVar244;
          auVar66._24_4_ = fVar244;
          auVar66._28_4_ = fStack_9e4;
          fVar252 = (fVar248 * fVar323 + local_4c0) * fVar371;
          fVar271 = (fVar245 * fVar398 + fStack_4bc) * fVar377;
          fVar274 = (fVar270 * fVar412 + fStack_4b8) * fVar378;
          fVar277 = (fVar273 * fVar130 + fStack_4b4) * fVar379;
          fVar280 = (fVar284 * fVar131 + fStack_4b0) * fStack_730;
          fVar171 = (fVar286 * fVar132 + fStack_4ac) * fStack_72c;
          fVar285 = (fVar315 * fVar133 + fStack_4a8) * fStack_728;
          auVar216._0_4_ = auVar402._0_4_ + fVar278 * fVar252;
          auVar216._4_4_ = auVar402._4_4_ + fVar218 * fVar271;
          auVar216._8_4_ = auVar402._8_4_ + fVar243 * fVar274;
          auVar216._12_4_ = auVar402._12_4_ + fVar223 * fVar277;
          auVar216._16_4_ = auVar402._16_4_ + fVar251 * fVar280;
          auVar216._20_4_ = auVar402._20_4_ + fVar282 * fVar171;
          auVar216._24_4_ = auVar402._24_4_ + fVar311 * fVar285;
          auVar216._28_4_ = auVar402._28_4_ + auVar15._28_4_ + fStack_4a4;
          auVar67._4_4_ = (float)local_b00._4_4_ * fVar245;
          auVar67._0_4_ = (float)local_b00._0_4_ * fVar248;
          auVar67._8_4_ = fStack_af8 * fVar270;
          auVar67._12_4_ = fStack_af4 * fVar273;
          auVar67._16_4_ = fStack_af0 * fVar284;
          auVar67._20_4_ = fStack_aec * fVar286;
          auVar67._24_4_ = fStack_ae8 * fVar315;
          auVar67._28_4_ = fVar319;
          local_ac0 = vsubps_avx(auVar67,auVar216);
          auVar239._0_4_ = auVar414._0_4_ + fVar272 * fVar252;
          auVar239._4_4_ = auVar414._4_4_ + fVar200 * fVar271;
          auVar239._8_4_ = auVar414._8_4_ + fVar242 * fVar274;
          auVar239._12_4_ = auVar414._12_4_ + fVar222 * fVar277;
          auVar239._16_4_ = auVar414._16_4_ + fVar247 * fVar280;
          auVar239._20_4_ = auVar414._20_4_ + fVar276 * fVar171;
          auVar239._24_4_ = auVar414._24_4_ + fVar303 * fVar285;
          auVar239._28_4_ = auVar414._28_4_ + fVar319;
          auVar68._4_4_ = (float)local_a00._4_4_ * fVar245;
          auVar68._0_4_ = (float)local_a00._0_4_ * fVar248;
          auVar68._8_4_ = fStack_9f8 * fVar270;
          auVar68._12_4_ = fStack_9f4 * fVar273;
          auVar68._16_4_ = fStack_9f0 * fVar284;
          auVar68._20_4_ = fStack_9ec * fVar286;
          auVar68._24_4_ = fStack_9e8 * fVar315;
          auVar68._28_4_ = fVar129;
          _local_ae0 = vsubps_avx(auVar68,auVar239);
          auVar262._0_4_ = auVar418._0_4_ + fVar275 * fVar252;
          auVar262._4_4_ = auVar418._4_4_ + fVar224 * fVar271;
          auVar262._8_4_ = auVar418._8_4_ + fVar220 * fVar274;
          auVar262._12_4_ = auVar418._12_4_ + fVar246 * fVar277;
          auVar262._16_4_ = auVar418._16_4_ + fVar249 * fVar280;
          auVar262._20_4_ = auVar418._20_4_ + fVar279 * fVar171;
          auVar262._24_4_ = auVar418._24_4_ + fVar307 * fVar285;
          auVar262._28_4_ = auVar418._28_4_ + 0.0;
          auVar69._4_4_ = (float)local_960._4_4_ * fVar245;
          auVar69._0_4_ = (float)local_960._0_4_ * fVar248;
          auVar69._8_4_ = fStack_958 * fVar270;
          auVar69._12_4_ = fStack_954 * fVar273;
          auVar69._16_4_ = fStack_950 * fVar284;
          auVar69._20_4_ = fStack_94c * fVar286;
          auVar69._24_4_ = fStack_948 * fVar315;
          auVar69._28_4_ = fVar129;
          auVar17 = vsubps_avx(auVar69,auVar262);
          fVar371 = (fVar269 * fVar323 + local_4c0) * fVar371;
          fVar377 = (fVar281 * fVar398 + fStack_4bc) * fVar377;
          fVar378 = (fVar283 * fVar412 + fStack_4b8) * fVar378;
          fVar379 = (fVar241 * fVar130 + fStack_4b4) * fVar379;
          fVar248 = (fVar219 * fVar131 + fStack_4b0) * fStack_730;
          fVar245 = (fVar221 * fVar132 + fStack_4ac) * fStack_72c;
          fVar270 = (fVar244 * fVar133 + fStack_4a8) * fStack_728;
          auVar300._0_4_ = auVar402._0_4_ + fVar278 * fVar371;
          auVar300._4_4_ = auVar402._4_4_ + fVar218 * fVar377;
          auVar300._8_4_ = auVar402._8_4_ + fVar243 * fVar378;
          auVar300._12_4_ = auVar402._12_4_ + fVar223 * fVar379;
          auVar300._16_4_ = auVar402._16_4_ + fVar251 * fVar248;
          auVar300._20_4_ = auVar402._20_4_ + fVar282 * fVar245;
          auVar300._24_4_ = auVar402._24_4_ + fVar311 * fVar270;
          auVar300._28_4_ = auVar402._28_4_ + fVar129;
          auVar70._4_4_ = fVar281 * (float)local_b00._4_4_;
          auVar70._0_4_ = fVar269 * (float)local_b00._0_4_;
          auVar70._8_4_ = fVar283 * fStack_af8;
          auVar70._12_4_ = fVar241 * fStack_af4;
          auVar70._16_4_ = fVar219 * fStack_af0;
          auVar70._20_4_ = fVar221 * fStack_aec;
          auVar70._24_4_ = fVar244 * fStack_ae8;
          auVar70._28_4_ = fStack_ae4;
          _local_8a0 = vsubps_avx(auVar70,auVar300);
          auVar301._0_4_ = auVar414._0_4_ + fVar272 * fVar371;
          auVar301._4_4_ = auVar414._4_4_ + fVar200 * fVar377;
          auVar301._8_4_ = auVar414._8_4_ + fVar242 * fVar378;
          auVar301._12_4_ = auVar414._12_4_ + fVar222 * fVar379;
          auVar301._16_4_ = auVar414._16_4_ + fVar247 * fVar248;
          auVar301._20_4_ = auVar414._20_4_ + fVar276 * fVar245;
          auVar301._24_4_ = auVar414._24_4_ + fVar303 * fVar270;
          auVar301._28_4_ = auVar414._28_4_ + local_8a0._28_4_;
          auVar71._4_4_ = (float)local_a00._4_4_ * fVar281;
          auVar71._0_4_ = (float)local_a00._0_4_ * fVar269;
          auVar71._8_4_ = fStack_9f8 * fVar283;
          auVar71._12_4_ = fStack_9f4 * fVar241;
          auVar71._16_4_ = fStack_9f0 * fVar219;
          auVar71._20_4_ = fStack_9ec * fVar221;
          auVar71._24_4_ = fStack_9e8 * fVar244;
          auVar71._28_4_ = fStack_ae4;
          _local_8c0 = vsubps_avx(auVar71,auVar301);
          auVar263._0_4_ = auVar418._0_4_ + fVar275 * fVar371;
          auVar263._4_4_ = auVar418._4_4_ + fVar224 * fVar377;
          auVar263._8_4_ = auVar418._8_4_ + fVar220 * fVar378;
          auVar263._12_4_ = auVar418._12_4_ + fVar246 * fVar379;
          auVar263._16_4_ = auVar418._16_4_ + fVar249 * fVar248;
          auVar263._20_4_ = auVar418._20_4_ + fVar279 * fVar245;
          auVar263._24_4_ = auVar418._24_4_ + fVar307 * fVar270;
          auVar263._28_4_ = auVar418._28_4_ + auVar17._28_4_ + fStack_4a4;
          auVar72._4_4_ = (float)local_960._4_4_ * fVar281;
          auVar72._0_4_ = (float)local_960._0_4_ * fVar269;
          auVar72._8_4_ = fStack_958 * fVar283;
          auVar72._12_4_ = fStack_954 * fVar241;
          auVar72._16_4_ = fStack_950 * fVar219;
          auVar72._20_4_ = fStack_94c * fVar221;
          auVar72._24_4_ = fStack_948 * fVar244;
          auVar72._28_4_ = local_8c0._28_4_;
          _local_860 = vsubps_avx(auVar72,auVar263);
          auVar15 = vcmpps_avx(auVar14,auVar363,5);
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar155 = vblendvps_avx(auVar264,auVar65,auVar15);
          auVar341._8_4_ = 0x7fffffff;
          auVar341._0_8_ = 0x7fffffff7fffffff;
          auVar341._12_4_ = 0x7fffffff;
          auVar341._16_4_ = 0x7fffffff;
          auVar341._20_4_ = 0x7fffffff;
          auVar341._24_4_ = 0x7fffffff;
          auVar341._28_4_ = 0x7fffffff;
          auVar14 = vandps_avx(auVar341,auVar43);
          auVar14 = vmaxps_avx(local_460,auVar14);
          auVar73._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar73._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar73._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar73._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar73._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar73._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar73._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar73._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar341,auVar16);
          auVar14 = vcmpps_avx(auVar14,auVar73,1);
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar261 = vblendvps_avx(auVar265,auVar66,auVar15);
          auVar363 = auVar15 & auVar14;
          if ((((((((auVar363 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar363 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar363 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar363 >> 0x7f,0) != '\0') ||
                (auVar363 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar363 >> 0xbf,0) != '\0') ||
              (auVar363 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar363[0x1f] < '\0') {
            auVar118 = vandps_avx(auVar14,auVar15);
            auVar146 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar363 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar14 = vcmpps_avx(auVar13,auVar363,2);
            auVar416._8_4_ = 0xff800000;
            auVar416._0_8_ = 0xff800000ff800000;
            auVar416._12_4_ = 0xff800000;
            auVar416._16_4_ = 0xff800000;
            auVar416._20_4_ = 0xff800000;
            auVar416._24_4_ = 0xff800000;
            auVar416._28_4_ = 0xff800000;
            auVar419._8_4_ = 0x7f800000;
            auVar419._0_8_ = 0x7f8000007f800000;
            auVar419._12_4_ = 0x7f800000;
            auVar419._16_4_ = 0x7f800000;
            auVar419._20_4_ = 0x7f800000;
            auVar419._24_4_ = 0x7f800000;
            auVar419._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar419,auVar416,auVar14);
            auVar329 = vpmovsxwd_avx(auVar146);
            auVar146 = vpunpckhwd_avx(auVar146,auVar146);
            auVar342._16_16_ = auVar146;
            auVar342._0_16_ = auVar329;
            auVar155 = vblendvps_avx(auVar155,auVar13,auVar342);
            auVar13 = vblendvps_avx(auVar416,auVar419,auVar14);
            auVar261 = vblendvps_avx(auVar261,auVar13,auVar342);
            auVar13 = vcmpps_avx(auVar363,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar199._0_4_ = auVar118._0_4_ ^ auVar13._0_4_;
            auVar199._4_4_ = auVar118._4_4_ ^ auVar13._4_4_;
            auVar199._8_4_ = auVar118._8_4_ ^ auVar13._8_4_;
            auVar199._12_4_ = auVar118._12_4_ ^ auVar13._12_4_;
            auVar199._16_4_ = auVar118._16_4_ ^ auVar13._16_4_;
            auVar199._20_4_ = auVar118._20_4_ ^ auVar13._20_4_;
            auVar199._24_4_ = auVar118._24_4_ ^ auVar13._24_4_;
            auVar199._28_4_ = auVar118._28_4_ ^ auVar13._28_4_;
            auVar118 = vorps_avx(auVar14,auVar199);
            auVar118 = vandps_avx(auVar15,auVar118);
          }
          auVar210 = local_ac0._0_28_;
          auVar234 = local_ae0._0_28_;
          auVar367 = auVar17._0_28_;
        }
        auVar302 = ZEXT3264(_local_880);
        _local_420 = _local_880;
        local_400 = vminps_avx(local_3c0,auVar155);
        _local_680 = vmaxps_avx(_local_880,auVar261);
        auVar268 = ZEXT3264(_local_680);
        _local_3e0 = _local_680;
        auVar13 = vcmpps_avx(_local_880,local_400,2);
        local_640 = vandps_avx(auVar120,auVar13);
        auVar13 = vcmpps_avx(_local_680,local_3c0,2);
        local_820 = vandps_avx(auVar120,auVar13);
        auVar120 = vorps_avx(local_820,local_640);
        auVar376 = ZEXT3264(local_aa0);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          local_a20 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6c0._0_4_ = auVar118._0_4_ ^ local_a20._0_4_;
          local_6c0._4_4_ = auVar118._4_4_ ^ local_a20._4_4_;
          local_6c0._8_4_ = auVar118._8_4_ ^ local_a20._8_4_;
          local_6c0._12_4_ = auVar118._12_4_ ^ local_a20._12_4_;
          local_6c0._16_4_ = auVar118._16_4_ ^ local_a20._16_4_;
          local_6c0._20_4_ = auVar118._20_4_ ^ local_a20._20_4_;
          local_6c0._24_4_ = auVar118._24_4_ ^ local_a20._24_4_;
          local_6c0._28_4_ = (uint)auVar118._28_4_ ^ (uint)local_a20._28_4_;
          auVar302 = ZEXT3264(local_640);
          auVar119._0_4_ =
               (float)local_b00._0_4_ * auVar210._0_4_ +
               (float)local_a00._0_4_ * auVar234._0_4_ + (float)local_960._0_4_ * auVar367._0_4_;
          auVar119._4_4_ =
               (float)local_b00._4_4_ * auVar210._4_4_ +
               (float)local_a00._4_4_ * auVar234._4_4_ + (float)local_960._4_4_ * auVar367._4_4_;
          auVar119._8_4_ =
               fStack_af8 * auVar210._8_4_ +
               fStack_9f8 * auVar234._8_4_ + fStack_958 * auVar367._8_4_;
          auVar119._12_4_ =
               fStack_af4 * auVar210._12_4_ +
               fStack_9f4 * auVar234._12_4_ + fStack_954 * auVar367._12_4_;
          auVar119._16_4_ =
               fStack_af0 * auVar210._16_4_ +
               fStack_9f0 * auVar234._16_4_ + fStack_950 * auVar367._16_4_;
          auVar119._20_4_ =
               fStack_aec * auVar210._20_4_ +
               fStack_9ec * auVar234._20_4_ + fStack_94c * auVar367._20_4_;
          auVar119._24_4_ =
               fStack_ae8 * auVar210._24_4_ +
               fStack_9e8 * auVar234._24_4_ + fStack_948 * auVar367._24_4_;
          auVar119._28_4_ = local_a20._28_4_ + fStack_ae4 + auVar118._28_4_;
          auVar158._8_4_ = 0x7fffffff;
          auVar158._0_8_ = 0x7fffffff7fffffff;
          auVar158._12_4_ = 0x7fffffff;
          auVar158._16_4_ = 0x7fffffff;
          auVar158._20_4_ = 0x7fffffff;
          auVar158._24_4_ = 0x7fffffff;
          auVar158._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar119,auVar158);
          auVar159._8_4_ = 0x3e99999a;
          auVar159._0_8_ = 0x3e99999a3e99999a;
          auVar159._12_4_ = 0x3e99999a;
          auVar159._16_4_ = 0x3e99999a;
          auVar159._20_4_ = 0x3e99999a;
          auVar159._24_4_ = 0x3e99999a;
          auVar159._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar159,1);
          auVar120 = vorps_avx(local_6c0,auVar120);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar192._8_4_ = 2;
          auVar192._0_8_ = 0x200000002;
          auVar192._12_4_ = 2;
          auVar192._16_4_ = 2;
          auVar192._20_4_ = 2;
          auVar192._24_4_ = 2;
          auVar192._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar192,auVar160,auVar120);
          local_6a0 = ZEXT432((uint)uVar98);
          local_740 = vpshufd_avx(ZEXT416((uint)uVar98),0);
          auVar146 = vpcmpgtd_avx(auVar120._16_16_,local_740);
          auVar329 = vpcmpgtd_avx(auVar120._0_16_,local_740);
          auVar161._16_16_ = auVar146;
          auVar161._0_16_ = auVar329;
          auVar120 = vblendps_avx(ZEXT1632(auVar329),auVar161,0xf0);
          local_6e0 = vandnps_avx(auVar120,local_640);
          auVar217 = ZEXT3264(local_6e0);
          auVar118 = local_640 & ~auVar120;
          auStack_718 = auVar153._8_24_;
          local_720 = uVar98;
          local_660 = auVar120;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            auVar268 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            fVar246 = (float)local_b00._0_4_;
            fVar223 = (float)local_b00._4_4_;
            fVar248 = fStack_af8;
            fVar245 = fStack_af4;
            fVar247 = fStack_af0;
            fVar249 = fStack_aec;
            fVar251 = fStack_ae8;
            fVar275 = (float)local_a00._0_4_;
            fVar278 = (float)local_a00._4_4_;
            fVar281 = fStack_9f8;
            fVar200 = fStack_9f4;
            fVar224 = fStack_9f0;
            fVar218 = fStack_9ec;
            fVar241 = fStack_9e8;
            fVar219 = (float)local_960._0_4_;
            fVar242 = (float)local_960._4_4_;
            fVar220 = fStack_958;
            fVar243 = fStack_954;
            fVar221 = fStack_950;
            fVar244 = fStack_94c;
            fVar222 = fStack_948;
          }
          else {
            local_840._4_4_ = (float)local_880._4_4_ + fStack_9dc;
            local_840._0_4_ = (float)local_880._0_4_ + local_9e0;
            fStack_838 = fStack_878 + fStack_9d8;
            fStack_834 = fStack_874 + fStack_9d4;
            fStack_830 = fStack_870 + fStack_9d0;
            fStack_82c = fStack_86c + fStack_9cc;
            fStack_828 = fStack_868 + fStack_9c8;
            fStack_824 = fStack_864 + fStack_9c4;
            auVar268 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            local_700 = local_820;
            do {
              auVar226 = auVar268._0_16_;
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar120 = auVar217._0_32_;
              auVar118 = vblendvps_avx(auVar162,_local_880,auVar120);
              auVar13 = vshufps_avx(auVar118,auVar118,0xb1);
              auVar13 = vminps_avx(auVar118,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar118 = vcmpps_avx(auVar118,auVar13,0);
              auVar13 = auVar120 & auVar118;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar118,auVar120);
              }
              local_7e0._0_8_ = uVar97;
              uVar93 = vmovmskps_avx(auVar120);
              uVar92 = 0;
              if (uVar93 != 0) {
                for (; (uVar93 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar98 = (ulong)uVar92;
              *(undefined4 *)(local_6e0 + uVar98 * 4) = 0;
              fVar269 = local_600[uVar98];
              uVar92 = *(uint *)(local_420 + uVar98 * 4);
              fVar272 = auVar136._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar272 = sqrtf((float)local_9a0._0_4_);
                auVar226._8_4_ = 0x7fffffff;
                auVar226._0_8_ = 0x7fffffff7fffffff;
                auVar226._12_4_ = 0x7fffffff;
              }
              auVar366 = ZEXT464(uVar92);
              auVar217 = ZEXT464((uint)fVar269);
              auVar329 = vminps_avx(_local_b30,_local_b50);
              auVar146 = vmaxps_avx(_local_b30,_local_b50);
              auVar107 = vminps_avx(_local_b40,_local_b60);
              auVar182 = vminps_avx(auVar329,auVar107);
              auVar329 = vmaxps_avx(_local_b40,_local_b60);
              auVar107 = vmaxps_avx(auVar146,auVar329);
              auVar146 = vandps_avx(auVar182,auVar226);
              auVar329 = vandps_avx(auVar107,auVar226);
              auVar146 = vmaxps_avx(auVar146,auVar329);
              auVar329 = vmovshdup_avx(auVar146);
              auVar329 = vmaxss_avx(auVar329,auVar146);
              auVar146 = vshufpd_avx(auVar146,auVar146,1);
              auVar146 = vmaxss_avx(auVar146,auVar329);
              local_ac0._0_4_ = auVar146._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar272 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar107,auVar107,0xff);
              lVar96 = 5;
              do {
                fVar283 = auVar217._0_4_;
                fVar281 = 1.0 - fVar283;
                auVar329 = auVar217._0_16_;
                auVar146 = vshufps_avx(auVar329,auVar329,0);
                fVar269 = auVar146._0_4_;
                fVar272 = auVar146._4_4_;
                fVar275 = auVar146._8_4_;
                fVar278 = auVar146._12_4_;
                auVar146 = vshufps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar281),0);
                fVar200 = auVar146._0_4_;
                fVar224 = auVar146._4_4_;
                fVar218 = auVar146._8_4_;
                fVar241 = auVar146._12_4_;
                fVar219 = (float)local_b40._0_4_ * fVar269 + (float)local_b50._0_4_ * fVar200;
                fVar242 = (float)local_b40._4_4_ * fVar272 + (float)local_b50._4_4_ * fVar224;
                fVar220 = fStack_b38 * fVar275 + fStack_b48 * fVar218;
                fVar243 = fStack_b34 * fVar278 + fStack_b44 * fVar241;
                auVar255._0_4_ =
                     fVar200 * ((float)local_b50._0_4_ * fVar269 + fVar200 * (float)local_b30._0_4_)
                     + fVar269 * fVar219;
                auVar255._4_4_ =
                     fVar224 * ((float)local_b50._4_4_ * fVar272 + fVar224 * (float)local_b30._4_4_)
                     + fVar272 * fVar242;
                auVar255._8_4_ =
                     fVar218 * (fStack_b48 * fVar275 + fVar218 * fStack_b28) + fVar275 * fVar220;
                auVar255._12_4_ =
                     fVar241 * (fStack_b44 * fVar278 + fVar241 * fStack_b24) + fVar278 * fVar243;
                auVar203._0_4_ =
                     fVar200 * fVar219 +
                     fVar269 * (fVar269 * (float)local_b60._0_4_ + (float)local_b40._0_4_ * fVar200)
                ;
                auVar203._4_4_ =
                     fVar224 * fVar242 +
                     fVar272 * (fVar272 * (float)local_b60._4_4_ + (float)local_b40._4_4_ * fVar224)
                ;
                auVar203._8_4_ =
                     fVar218 * fVar220 + fVar275 * (fVar275 * fStack_b58 + fStack_b38 * fVar218);
                auVar203._12_4_ =
                     fVar241 * fVar243 + fVar278 * (fVar278 * fStack_b54 + fStack_b34 * fVar241);
                auVar146 = vshufps_avx(auVar366._0_16_,auVar366._0_16_,0);
                auVar137._0_4_ = auVar146._0_4_ * (float)local_990._0_4_ + 0.0;
                auVar137._4_4_ = auVar146._4_4_ * (float)local_990._4_4_ + 0.0;
                auVar137._8_4_ = auVar146._8_4_ * fStack_988 + 0.0;
                auVar137._12_4_ = auVar146._12_4_ * fStack_984 + 0.0;
                auVar102._0_4_ = fVar200 * auVar255._0_4_ + fVar269 * auVar203._0_4_;
                auVar102._4_4_ = fVar224 * auVar255._4_4_ + fVar272 * auVar203._4_4_;
                auVar102._8_4_ = fVar218 * auVar255._8_4_ + fVar275 * auVar203._8_4_;
                auVar102._12_4_ = fVar241 * auVar255._12_4_ + fVar278 * auVar203._12_4_;
                local_920._0_16_ = auVar102;
                auVar146 = vsubps_avx(auVar137,auVar102);
                _local_ae0 = auVar146;
                auVar146 = vdpps_avx(auVar146,auVar146,0x7f);
                fVar269 = auVar146._0_4_;
                if (fVar269 < 0.0) {
                  fVar272 = sqrtf(fVar269);
                  auVar217 = ZEXT1664(auVar329);
                }
                else {
                  auVar329 = vsqrtss_avx(auVar146,auVar146);
                  fVar272 = auVar329._0_4_;
                }
                auVar329 = vsubps_avx(auVar203,auVar255);
                auVar291._0_4_ = auVar329._0_4_ * 3.0;
                auVar291._4_4_ = auVar329._4_4_ * 3.0;
                auVar291._8_4_ = auVar329._8_4_ * 3.0;
                auVar291._12_4_ = auVar329._12_4_ * 3.0;
                fVar275 = auVar217._0_4_;
                auVar329 = vshufps_avx(ZEXT416((uint)(fVar275 * 6.0)),ZEXT416((uint)(fVar275 * 6.0))
                                       ,0);
                auVar107 = ZEXT416((uint)((fVar281 - (fVar275 + fVar275)) * 6.0));
                auVar182 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)((fVar275 - (fVar281 + fVar281)) * 6.0));
                auVar207 = vshufps_avx(auVar107,auVar107,0);
                auVar4 = vshufps_avx(ZEXT416((uint)(fVar281 * 6.0)),ZEXT416((uint)(fVar281 * 6.0)),0
                                    );
                auVar107 = vdpps_avx(auVar291,auVar291,0x7f);
                auVar138._0_4_ =
                     auVar4._0_4_ * (float)local_b30._0_4_ +
                     auVar207._0_4_ * (float)local_b50._0_4_ +
                     auVar329._0_4_ * (float)local_b60._0_4_ +
                     auVar182._0_4_ * (float)local_b40._0_4_;
                auVar138._4_4_ =
                     auVar4._4_4_ * (float)local_b30._4_4_ +
                     auVar207._4_4_ * (float)local_b50._4_4_ +
                     auVar329._4_4_ * (float)local_b60._4_4_ +
                     auVar182._4_4_ * (float)local_b40._4_4_;
                auVar138._8_4_ =
                     auVar4._8_4_ * fStack_b28 +
                     auVar207._8_4_ * fStack_b48 +
                     auVar329._8_4_ * fStack_b58 + auVar182._8_4_ * fStack_b38;
                auVar138._12_4_ =
                     auVar4._12_4_ * fStack_b24 +
                     auVar207._12_4_ * fStack_b44 +
                     auVar329._12_4_ * fStack_b54 + auVar182._12_4_ * fStack_b34;
                auVar329 = vblendps_avx(auVar107,_DAT_01feba10,0xe);
                auVar182 = vrsqrtss_avx(auVar329,auVar329);
                fVar278 = auVar182._0_4_;
                fVar275 = auVar107._0_4_;
                auVar182 = vdpps_avx(auVar291,auVar138,0x7f);
                auVar207 = vshufps_avx(auVar107,auVar107,0);
                auVar139._0_4_ = auVar138._0_4_ * auVar207._0_4_;
                auVar139._4_4_ = auVar138._4_4_ * auVar207._4_4_;
                auVar139._8_4_ = auVar138._8_4_ * auVar207._8_4_;
                auVar139._12_4_ = auVar138._12_4_ * auVar207._12_4_;
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                auVar227._0_4_ = auVar291._0_4_ * auVar182._0_4_;
                auVar227._4_4_ = auVar291._4_4_ * auVar182._4_4_;
                auVar227._8_4_ = auVar291._8_4_ * auVar182._8_4_;
                auVar227._12_4_ = auVar291._12_4_ * auVar182._12_4_;
                auVar4 = vsubps_avx(auVar139,auVar227);
                auVar182 = vrcpss_avx(auVar329,auVar329);
                auVar329 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                      ZEXT416((uint)(auVar366._0_4_ * (float)local_980._0_4_)));
                auVar182 = ZEXT416((uint)(auVar182._0_4_ * (2.0 - fVar275 * auVar182._0_4_)));
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                uVar98 = CONCAT44(auVar291._4_4_,auVar291._0_4_);
                auVar360._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar360._8_4_ = -auVar291._8_4_;
                auVar360._12_4_ = -auVar291._12_4_;
                auVar207 = ZEXT416((uint)(fVar278 * 1.5 +
                                         fVar275 * -0.5 * fVar278 * fVar278 * fVar278));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar204._0_4_ = auVar207._0_4_ * auVar4._0_4_ * auVar182._0_4_;
                auVar204._4_4_ = auVar207._4_4_ * auVar4._4_4_ * auVar182._4_4_;
                auVar204._8_4_ = auVar207._8_4_ * auVar4._8_4_ * auVar182._8_4_;
                auVar204._12_4_ = auVar207._12_4_ * auVar4._12_4_ * auVar182._12_4_;
                local_940._0_4_ = auVar291._0_4_ * auVar207._0_4_;
                local_940._4_4_ = auVar291._4_4_ * auVar207._4_4_;
                local_940._8_4_ = auVar291._8_4_ * auVar207._8_4_;
                local_940._12_4_ = auVar291._12_4_ * auVar207._12_4_;
                if (fVar275 < 0.0) {
                  local_9c0._0_16_ = auVar360;
                  local_b20._0_16_ = auVar204;
                  fVar275 = sqrtf(fVar275);
                  auVar204 = local_b20._0_16_;
                  auVar360 = local_9c0._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar275 = auVar107._0_4_;
                }
                auVar107 = vdpps_avx(_local_ae0,local_940._0_16_,0x7f);
                local_9c0._0_4_ =
                     ((float)local_ac0._0_4_ / fVar275) * (fVar272 + 1.0) +
                     auVar329._0_4_ + fVar272 * (float)local_ac0._0_4_;
                auVar182 = vdpps_avx(auVar360,local_940._0_16_,0x7f);
                auVar207 = vdpps_avx(_local_ae0,auVar204,0x7f);
                auVar4 = vdpps_avx(_local_990,local_940._0_16_,0x7f);
                auVar5 = vdpps_avx(_local_ae0,auVar360,0x7f);
                fVar272 = auVar182._0_4_ + auVar207._0_4_;
                fVar275 = auVar107._0_4_;
                auVar103._0_4_ = fVar275 * fVar275;
                auVar103._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                auVar103._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                auVar103._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                auVar207 = vsubps_avx(auVar146,auVar103);
                local_940._0_16_ = ZEXT416((uint)fVar272);
                auVar182 = vdpps_avx(_local_ae0,_local_990,0x7f);
                fVar278 = auVar5._0_4_ - fVar275 * fVar272;
                fVar275 = auVar182._0_4_ - fVar275 * auVar4._0_4_;
                auVar182 = vrsqrtss_avx(auVar207,auVar207);
                fVar281 = auVar207._0_4_;
                fVar272 = auVar182._0_4_;
                fVar272 = fVar272 * 1.5 + fVar281 * -0.5 * fVar272 * fVar272 * fVar272;
                if (fVar281 < 0.0) {
                  local_b20._0_16_ = auVar4;
                  local_760._0_4_ = fVar278;
                  local_780._0_4_ = fVar275;
                  local_7a0._0_4_ = fVar272;
                  fVar281 = sqrtf(fVar281);
                  fVar272 = (float)local_7a0._0_4_;
                  fVar278 = (float)local_760._0_4_;
                  fVar275 = (float)local_780._0_4_;
                  auVar4 = local_b20._0_16_;
                }
                else {
                  auVar182 = vsqrtss_avx(auVar207,auVar207);
                  fVar281 = auVar182._0_4_;
                }
                auVar145 = vpermilps_avx(local_920._0_16_,0xff);
                auVar5 = vshufps_avx(auVar291,auVar291,0xff);
                fVar278 = fVar278 * fVar272 - auVar5._0_4_;
                auVar228._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar228._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar228._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar256._0_4_ = -fVar278;
                auVar256._4_4_ = 0x80000000;
                auVar256._8_4_ = 0x80000000;
                auVar256._12_4_ = 0x80000000;
                auVar182 = vinsertps_avx(ZEXT416((uint)(fVar275 * fVar272)),auVar228,0x10);
                auVar207 = vmovsldup_avx(ZEXT416((uint)(local_940._0_4_ * fVar275 * fVar272 -
                                                       auVar4._0_4_ * fVar278)));
                auVar182 = vdivps_avx(auVar182,auVar207);
                auVar302 = ZEXT1664(auVar107);
                auVar145 = ZEXT416((uint)(fVar281 - auVar145._0_4_));
                auVar4 = vinsertps_avx(auVar107,auVar145,0x10);
                auVar205._0_4_ = auVar4._0_4_ * auVar182._0_4_;
                auVar205._4_4_ = auVar4._4_4_ * auVar182._4_4_;
                auVar205._8_4_ = auVar4._8_4_ * auVar182._8_4_;
                auVar205._12_4_ = auVar4._12_4_ * auVar182._12_4_;
                auVar182 = vinsertps_avx(auVar256,local_940._0_16_,0x1c);
                auVar182 = vdivps_avx(auVar182,auVar207);
                auVar207 = vhaddps_avx(auVar205,auVar205);
                auVar179._0_4_ = auVar4._0_4_ * auVar182._0_4_;
                auVar179._4_4_ = auVar4._4_4_ * auVar182._4_4_;
                auVar179._8_4_ = auVar4._8_4_ * auVar182._8_4_;
                auVar179._12_4_ = auVar4._12_4_ * auVar182._12_4_;
                auVar182 = vhaddps_avx(auVar179,auVar179);
                fVar283 = fVar283 - auVar207._0_4_;
                auVar217 = ZEXT464((uint)fVar283);
                fVar272 = auVar366._0_4_ - auVar182._0_4_;
                auVar366 = ZEXT464((uint)fVar272);
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar268 = ZEXT1664(auVar229);
                auVar107 = vandps_avx(auVar107,auVar229);
                bVar60 = true;
                fVar246 = (float)local_b00._0_4_;
                fVar223 = (float)local_b00._4_4_;
                fVar248 = fStack_af8;
                fVar245 = fStack_af4;
                fVar247 = fStack_af0;
                fVar249 = fStack_aec;
                fVar251 = fStack_ae8;
                fVar275 = (float)local_a00._0_4_;
                fVar278 = (float)local_a00._4_4_;
                fVar281 = fStack_9f8;
                fVar200 = fStack_9f4;
                fVar224 = fStack_9f0;
                fVar218 = fStack_9ec;
                fVar241 = fStack_9e8;
                fVar219 = (float)local_960._0_4_;
                fVar242 = (float)local_960._4_4_;
                fVar220 = fStack_958;
                fVar243 = fStack_954;
                fVar221 = fStack_950;
                fVar244 = fStack_94c;
                fVar222 = fStack_948;
                if ((float)local_9c0._0_4_ <= auVar107._0_4_) {
LAB_0112737f:
                  auVar376 = ZEXT3264(local_aa0);
                }
                else {
                  auVar107 = vandps_avx(auVar145,auVar229);
                  if ((float)local_7c0._0_4_ * 1.9073486e-06 +
                      auVar329._0_4_ + (float)local_9c0._0_4_ <= auVar107._0_4_) goto LAB_0112737f;
                  fVar272 = fVar272 + (float)local_8f0._0_4_;
                  auVar366 = ZEXT464((uint)fVar272);
                  if (fVar272 < fVar250) {
LAB_01127356:
                    bVar60 = false;
                    unaff_R13B = 0;
                    goto LAB_0112737f;
                  }
                  fVar270 = *(float *)(ray + k * 4 + 0x100);
                  auVar302 = ZEXT464((uint)fVar270);
                  if (fVar270 < fVar272) goto LAB_01127356;
                  bVar60 = false;
                  auVar376 = ZEXT3264(local_aa0);
                  if ((fVar283 < 0.0) || (1.0 < fVar283)) {
                    unaff_R13B = 0;
                  }
                  else {
                    auVar146 = vrsqrtss_avx(auVar146,auVar146);
                    fVar273 = auVar146._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_a58].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      unaff_R13B = 0;
                    }
                    else {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar146 = ZEXT416((uint)(fVar273 * 1.5 +
                                                 fVar269 * -0.5 * fVar273 * fVar273 * fVar273));
                        auVar146 = vshufps_avx(auVar146,auVar146,0);
                        auVar140._0_4_ = auVar146._0_4_ * (float)local_ae0._0_4_;
                        auVar140._4_4_ = auVar146._4_4_ * (float)local_ae0._4_4_;
                        auVar140._8_4_ = auVar146._8_4_ * fStack_ad8;
                        auVar140._12_4_ = auVar146._12_4_ * fStack_ad4;
                        auVar104._0_4_ = auVar291._0_4_ + auVar5._0_4_ * auVar140._0_4_;
                        auVar104._4_4_ = auVar291._4_4_ + auVar5._4_4_ * auVar140._4_4_;
                        auVar104._8_4_ = auVar291._8_4_ + auVar5._8_4_ * auVar140._8_4_;
                        auVar104._12_4_ = auVar291._12_4_ + auVar5._12_4_ * auVar140._12_4_;
                        auVar146 = vshufps_avx(auVar140,auVar140,0xc9);
                        auVar329 = vshufps_avx(auVar291,auVar291,0xc9);
                        auVar141._0_4_ = auVar329._0_4_ * auVar140._0_4_;
                        auVar141._4_4_ = auVar329._4_4_ * auVar140._4_4_;
                        auVar141._8_4_ = auVar329._8_4_ * auVar140._8_4_;
                        auVar141._12_4_ = auVar329._12_4_ * auVar140._12_4_;
                        auVar180._0_4_ = auVar291._0_4_ * auVar146._0_4_;
                        auVar180._4_4_ = auVar291._4_4_ * auVar146._4_4_;
                        auVar180._8_4_ = auVar291._8_4_ * auVar146._8_4_;
                        auVar180._12_4_ = auVar291._12_4_ * auVar146._12_4_;
                        auVar107 = vsubps_avx(auVar180,auVar141);
                        auVar146 = vshufps_avx(auVar107,auVar107,0xc9);
                        auVar329 = vshufps_avx(auVar104,auVar104,0xc9);
                        auVar181._0_4_ = auVar329._0_4_ * auVar146._0_4_;
                        auVar181._4_4_ = auVar329._4_4_ * auVar146._4_4_;
                        auVar181._8_4_ = auVar329._8_4_ * auVar146._8_4_;
                        auVar181._12_4_ = auVar329._12_4_ * auVar146._12_4_;
                        auVar146 = vshufps_avx(auVar107,auVar107,0xd2);
                        auVar105._0_4_ = auVar104._0_4_ * auVar146._0_4_;
                        auVar105._4_4_ = auVar104._4_4_ * auVar146._4_4_;
                        auVar105._8_4_ = auVar104._8_4_ * auVar146._8_4_;
                        auVar105._12_4_ = auVar104._12_4_ * auVar146._12_4_;
                        auVar146 = vsubps_avx(auVar181,auVar105);
                        pRVar11 = context->user;
                        auVar329 = ZEXT416((uint)fVar283);
                        local_570 = vshufps_avx(auVar329,auVar329,0);
                        auStack_5d0 = vshufps_avx(auVar146,auVar146,0x55);
                        local_5b0 = vshufps_avx(auVar146,auVar146,0xaa);
                        local_590 = vshufps_avx(auVar146,auVar146,0);
                        local_5e0 = (RTCHitN  [16])auStack_5d0;
                        local_5c0 = local_5b0;
                        local_5a0 = local_590;
                        local_580 = local_570;
                        local_560 = ZEXT832(0) << 0x20;
                        local_540 = local_4a0._0_8_;
                        uStack_538 = local_4a0._8_8_;
                        uStack_530 = local_4a0._16_8_;
                        uStack_528 = local_4a0._24_8_;
                        local_520 = local_480._0_8_;
                        uStack_518 = local_480._8_8_;
                        uStack_510 = local_480._16_8_;
                        uStack_508 = local_480._24_8_;
                        local_a60[1] = local_a20;
                        *local_a60 = local_a20;
                        local_500 = pRVar11->instID[0];
                        uStack_4fc = local_500;
                        uStack_4f8 = local_500;
                        uStack_4f4 = local_500;
                        uStack_4f0 = local_500;
                        uStack_4ec = local_500;
                        uStack_4e8 = local_500;
                        uStack_4e4 = local_500;
                        local_4e0 = pRVar11->instPrimID[0];
                        uStack_4dc = local_4e0;
                        uStack_4d8 = local_4e0;
                        uStack_4d4 = local_4e0;
                        uStack_4d0 = local_4e0;
                        uStack_4cc = local_4e0;
                        uStack_4c8 = local_4e0;
                        uStack_4c4 = local_4e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar272;
                        local_b80 = *local_a68;
                        uStack_b78 = local_a68[1];
                        local_b70 = *local_a70;
                        uStack_b68 = local_a70[1];
                        local_a50.valid = (int *)&local_b80;
                        local_a50.geometryUserPtr = pGVar9->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_5e0;
                        local_a50.N = 8;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_a50);
                          auVar217 = ZEXT1664(auVar329);
                          auVar376 = ZEXT3264(local_aa0);
                          auVar268 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          fVar275 = (float)local_a00._0_4_;
                          fVar278 = (float)local_a00._4_4_;
                          fVar281 = fStack_9f8;
                          fVar200 = fStack_9f4;
                          fVar224 = fStack_9f0;
                          fVar218 = fStack_9ec;
                          fVar241 = fStack_9e8;
                          fVar219 = (float)local_960._0_4_;
                          fVar242 = (float)local_960._4_4_;
                          fVar220 = fStack_958;
                          fVar243 = fStack_954;
                          fVar221 = fStack_950;
                          fVar244 = fStack_94c;
                          fVar222 = fStack_948;
                        }
                        auVar82._8_8_ = uStack_b78;
                        auVar82._0_8_ = local_b80;
                        auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,auVar82);
                        auVar86._8_8_ = uStack_b68;
                        auVar86._0_8_ = local_b70;
                        auVar329 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                        auVar121._16_16_ = auVar329;
                        auVar121._0_16_ = auVar146;
                        auVar120 = local_a20 & ~auVar121;
                        fVar246 = (float)local_b00._0_4_;
                        fVar223 = (float)local_b00._4_4_;
                        fVar248 = fStack_af8;
                        fVar245 = fStack_af4;
                        fVar247 = fStack_af0;
                        fVar249 = fStack_aec;
                        fVar251 = fStack_ae8;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar122._0_4_ = auVar146._0_4_ ^ local_a20._0_4_;
                          auVar122._4_4_ = auVar146._4_4_ ^ local_a20._4_4_;
                          auVar122._8_4_ = auVar146._8_4_ ^ local_a20._8_4_;
                          auVar122._12_4_ = auVar146._12_4_ ^ local_a20._12_4_;
                          auVar122._16_4_ = auVar329._0_4_ ^ local_a20._16_4_;
                          auVar122._20_4_ = auVar329._4_4_ ^ local_a20._20_4_;
                          auVar122._24_4_ = auVar329._8_4_ ^ local_a20._24_4_;
                          auVar122._28_4_ = auVar329._12_4_ ^ local_a20._28_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var12)(&local_a50);
                            auVar217 = ZEXT1664(auVar217._0_16_);
                            auVar376 = ZEXT3264(local_aa0);
                            auVar268 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar246 = (float)local_b00._0_4_;
                            fVar223 = (float)local_b00._4_4_;
                            fVar248 = fStack_af8;
                            fVar245 = fStack_af4;
                            fVar247 = fStack_af0;
                            fVar249 = fStack_aec;
                            fVar251 = fStack_ae8;
                            fVar275 = (float)local_a00._0_4_;
                            fVar278 = (float)local_a00._4_4_;
                            fVar281 = fStack_9f8;
                            fVar200 = fStack_9f4;
                            fVar224 = fStack_9f0;
                            fVar218 = fStack_9ec;
                            fVar241 = fStack_9e8;
                            fVar219 = (float)local_960._0_4_;
                            fVar242 = (float)local_960._4_4_;
                            fVar220 = fStack_958;
                            fVar243 = fStack_954;
                            fVar221 = fStack_950;
                            fVar244 = fStack_94c;
                            fVar222 = fStack_948;
                          }
                          auVar83._8_8_ = uStack_b78;
                          auVar83._0_8_ = local_b80;
                          auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,auVar83);
                          auVar87._8_8_ = uStack_b68;
                          auVar87._0_8_ = local_b70;
                          auVar329 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                          auVar163._16_16_ = auVar329;
                          auVar163._0_16_ = auVar146;
                          auVar122._0_4_ = auVar146._0_4_ ^ local_a20._0_4_;
                          auVar122._4_4_ = auVar146._4_4_ ^ local_a20._4_4_;
                          auVar122._8_4_ = auVar146._8_4_ ^ local_a20._8_4_;
                          auVar122._12_4_ = auVar146._12_4_ ^ local_a20._12_4_;
                          auVar122._16_4_ = auVar329._0_4_ ^ local_a20._16_4_;
                          auVar122._20_4_ = auVar329._4_4_ ^ local_a20._20_4_;
                          auVar122._24_4_ = auVar329._8_4_ ^ local_a20._24_4_;
                          auVar122._28_4_ = auVar329._12_4_ ^ local_a20._28_4_;
                          auVar193._8_4_ = 0xff800000;
                          auVar193._0_8_ = 0xff800000ff800000;
                          auVar193._12_4_ = 0xff800000;
                          auVar193._16_4_ = 0xff800000;
                          auVar193._20_4_ = 0xff800000;
                          auVar193._24_4_ = 0xff800000;
                          auVar193._28_4_ = 0xff800000;
                          auVar120 = vblendvps_avx(auVar193,*(undefined1 (*) [32])
                                                             (local_a50.ray + 0x100),auVar163);
                          *(undefined1 (*) [32])(local_a50.ray + 0x100) = auVar120;
                        }
                        auVar366 = ZEXT464((uint)fVar272);
                        auVar302 = ZEXT464((uint)fVar270);
                        bVar80 = (auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar81 = (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar79 = (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar78 = SUB321(auVar122 >> 0x7f,0) != '\0';
                        bVar77 = (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar76 = SUB321(auVar122 >> 0xbf,0) != '\0';
                        bVar74 = (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar60 = auVar122[0x1f] < '\0';
                        unaff_R13B = ((((((bVar80 || bVar81) || bVar79) || bVar78) || bVar77) ||
                                      bVar76) || bVar74) || bVar60;
                        if (((((((!bVar80 && !bVar81) && !bVar79) && !bVar78) && !bVar77) && !bVar76
                             ) && !bVar74) && !bVar60) {
                          *(float *)(ray + k * 4 + 0x100) = fVar270;
                        }
                        bVar60 = false;
                        goto LAB_01127383;
                      }
                      unaff_R13B = 1;
                    }
                    bVar60 = false;
                  }
                }
LAB_01127383:
                if (!bVar60) goto LAB_01127764;
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              unaff_R13B = 0;
              fVar246 = (float)local_b00._0_4_;
              fVar223 = (float)local_b00._4_4_;
              fVar248 = fStack_af8;
              fVar245 = fStack_af4;
              fVar247 = fStack_af0;
              fVar249 = fStack_aec;
              fVar251 = fStack_ae8;
              fVar275 = (float)local_a00._0_4_;
              fVar278 = (float)local_a00._4_4_;
              fVar281 = fStack_9f8;
              fVar200 = fStack_9f4;
              fVar224 = fStack_9f0;
              fVar218 = fStack_9ec;
              fVar241 = fStack_9e8;
LAB_01127764:
              unaff_R13B = unaff_R13B & 1;
              uVar97 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_R13B);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar123._4_4_ = uVar2;
              auVar123._0_4_ = uVar2;
              auVar123._8_4_ = uVar2;
              auVar123._12_4_ = uVar2;
              auVar123._16_4_ = uVar2;
              auVar123._20_4_ = uVar2;
              auVar123._24_4_ = uVar2;
              auVar123._28_4_ = uVar2;
              auVar120 = vcmpps_avx(_local_840,auVar123,2);
              auVar118 = vandps_avx(auVar120,local_6e0);
              auVar217 = ZEXT3264(auVar118);
              auVar13 = local_6e0 & auVar120;
              uVar98 = local_720;
              local_6e0 = auVar118;
            } while ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar13 >> 0x7f,0) != '\0') ||
                       (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar13 >> 0xbf,0) != '\0') ||
                     (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar13[0x1f] < '\0');
          }
          auVar124._0_4_ =
               fVar246 * (float)local_8a0._0_4_ +
               fVar275 * (float)local_8c0._0_4_ + fVar219 * (float)local_860._0_4_;
          auVar124._4_4_ =
               fVar223 * (float)local_8a0._4_4_ +
               fVar278 * (float)local_8c0._4_4_ + fVar242 * (float)local_860._4_4_;
          auVar124._8_4_ = fVar248 * fStack_898 + fVar281 * fStack_8b8 + fVar220 * fStack_858;
          auVar124._12_4_ = fVar245 * fStack_894 + fVar200 * fStack_8b4 + fVar243 * fStack_854;
          auVar124._16_4_ = fVar247 * fStack_890 + fVar224 * fStack_8b0 + fVar221 * fStack_850;
          auVar124._20_4_ = fVar249 * fStack_88c + fVar218 * fStack_8ac + fVar244 * fStack_84c;
          auVar124._24_4_ = fVar251 * fStack_888 + fVar241 * fStack_8a8 + fVar222 * fStack_848;
          auVar124._28_4_ = auVar120._28_4_ + auVar120._28_4_ + auVar217._28_4_;
          auVar164._8_4_ = 0x7fffffff;
          auVar164._0_8_ = 0x7fffffff7fffffff;
          auVar164._12_4_ = 0x7fffffff;
          auVar164._16_4_ = 0x7fffffff;
          auVar164._20_4_ = 0x7fffffff;
          auVar164._24_4_ = 0x7fffffff;
          auVar164._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar124,auVar164);
          auVar165._8_4_ = 0x3e99999a;
          auVar165._0_8_ = 0x3e99999a3e99999a;
          auVar165._12_4_ = 0x3e99999a;
          auVar165._16_4_ = 0x3e99999a;
          auVar165._20_4_ = 0x3e99999a;
          auVar165._24_4_ = 0x3e99999a;
          auVar165._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar165,1);
          auVar118 = vorps_avx(auVar120,local_6c0);
          auVar166._0_4_ = local_9e0 + (float)local_680._0_4_;
          auVar166._4_4_ = fStack_9dc + (float)local_680._4_4_;
          auVar166._8_4_ = fStack_9d8 + fStack_678;
          auVar166._12_4_ = fStack_9d4 + fStack_674;
          auVar166._16_4_ = fStack_9d0 + fStack_670;
          auVar166._20_4_ = fStack_9cc + fStack_66c;
          auVar166._24_4_ = fStack_9c8 + fStack_668;
          auVar166._28_4_ = fStack_9c4 + fStack_664;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar194._4_4_ = uVar2;
          auVar194._0_4_ = uVar2;
          auVar194._8_4_ = uVar2;
          auVar194._12_4_ = uVar2;
          auVar194._16_4_ = uVar2;
          auVar194._20_4_ = uVar2;
          auVar194._24_4_ = uVar2;
          auVar194._28_4_ = uVar2;
          auVar120 = vcmpps_avx(auVar166,auVar194,2);
          _local_8a0 = vandps_avx(auVar120,local_820);
          auVar167._8_4_ = 3;
          auVar167._0_8_ = 0x300000003;
          auVar167._12_4_ = 3;
          auVar167._16_4_ = 3;
          auVar167._20_4_ = 3;
          auVar167._24_4_ = 3;
          auVar167._28_4_ = 3;
          auVar195._8_4_ = 2;
          auVar195._0_8_ = 0x200000002;
          auVar195._12_4_ = 2;
          auVar195._16_4_ = 2;
          auVar195._20_4_ = 2;
          auVar195._24_4_ = 2;
          auVar195._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar195,auVar167,auVar118);
          auVar146 = vpcmpgtd_avx(auVar120._16_16_,local_740);
          auVar329 = vpshufd_avx(local_6a0._0_16_,0);
          auVar329 = vpcmpgtd_avx(auVar120._0_16_,auVar329);
          auVar168._16_16_ = auVar146;
          auVar168._0_16_ = auVar329;
          _local_8c0 = vblendps_avx(ZEXT1632(auVar329),auVar168,0xf0);
          auVar120 = vandnps_avx(_local_8c0,_local_8a0);
          auVar118 = _local_8a0 & ~_local_8c0;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0x7f,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0xbf,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar118[0x1f] < '\0') {
            local_820 = _local_3e0;
            local_840._4_4_ = fStack_9dc + (float)local_3e0._4_4_;
            local_840._0_4_ = local_9e0 + (float)local_3e0._0_4_;
            fStack_838 = fStack_9d8 + fStack_3d8;
            fStack_834 = fStack_9d4 + fStack_3d4;
            fStack_830 = fStack_9d0 + fStack_3d0;
            fStack_82c = fStack_9cc + fStack_3cc;
            fStack_828 = fStack_9c8 + fStack_3c8;
            fStack_824 = fStack_9c4 + fStack_3c4;
            do {
              auVar230 = auVar268._0_16_;
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar118 = vblendvps_avx(auVar169,local_820,auVar120);
              auVar13 = vshufps_avx(auVar118,auVar118,0xb1);
              auVar13 = vminps_avx(auVar118,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar13 = vcmpps_avx(auVar118,auVar13,0);
              auVar14 = auVar120 & auVar13;
              auVar118 = auVar120;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar118 = vandps_avx(auVar13,auVar120);
              }
              local_7e0._0_8_ = uVar97;
              uVar93 = vmovmskps_avx(auVar118);
              uVar92 = 0;
              if (uVar93 != 0) {
                for (; (uVar93 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar98 = (ulong)uVar92;
              local_700 = auVar120;
              *(undefined4 *)(local_700 + uVar98 * 4) = 0;
              fVar269 = local_620[uVar98];
              uVar92 = *(uint *)(local_3c0 + uVar98 * 4);
              fVar272 = auVar19._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar272 = sqrtf((float)local_9a0._0_4_);
                auVar230._8_4_ = 0x7fffffff;
                auVar230._0_8_ = 0x7fffffff7fffffff;
                auVar230._12_4_ = 0x7fffffff;
              }
              auVar366 = ZEXT464(uVar92);
              auVar217 = ZEXT464((uint)fVar269);
              auVar329 = vminps_avx(_local_b30,_local_b50);
              auVar146 = vmaxps_avx(_local_b30,_local_b50);
              auVar107 = vminps_avx(_local_b40,_local_b60);
              auVar182 = vminps_avx(auVar329,auVar107);
              auVar329 = vmaxps_avx(_local_b40,_local_b60);
              auVar107 = vmaxps_avx(auVar146,auVar329);
              auVar146 = vandps_avx(auVar182,auVar230);
              auVar329 = vandps_avx(auVar107,auVar230);
              auVar146 = vmaxps_avx(auVar146,auVar329);
              auVar329 = vmovshdup_avx(auVar146);
              auVar329 = vmaxss_avx(auVar329,auVar146);
              auVar146 = vshufpd_avx(auVar146,auVar146,1);
              auVar146 = vmaxss_avx(auVar146,auVar329);
              local_ac0._0_4_ = auVar146._0_4_ * 1.9073486e-06;
              local_940._0_4_ = fVar272 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar107,auVar107,0xff);
              lVar96 = 5;
              do {
                fVar283 = auVar217._0_4_;
                fVar281 = 1.0 - fVar283;
                auVar329 = auVar217._0_16_;
                auVar146 = vshufps_avx(auVar329,auVar329,0);
                fVar269 = auVar146._0_4_;
                fVar272 = auVar146._4_4_;
                fVar275 = auVar146._8_4_;
                fVar278 = auVar146._12_4_;
                auVar146 = vshufps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar281),0);
                fVar200 = auVar146._0_4_;
                fVar224 = auVar146._4_4_;
                fVar218 = auVar146._8_4_;
                fVar241 = auVar146._12_4_;
                fVar219 = (float)local_b40._0_4_ * fVar269 + (float)local_b50._0_4_ * fVar200;
                fVar242 = (float)local_b40._4_4_ * fVar272 + (float)local_b50._4_4_ * fVar224;
                fVar220 = fStack_b38 * fVar275 + fStack_b48 * fVar218;
                fVar243 = fStack_b34 * fVar278 + fStack_b44 * fVar241;
                auVar257._0_4_ =
                     fVar200 * ((float)local_b50._0_4_ * fVar269 + fVar200 * (float)local_b30._0_4_)
                     + fVar269 * fVar219;
                auVar257._4_4_ =
                     fVar224 * ((float)local_b50._4_4_ * fVar272 + fVar224 * (float)local_b30._4_4_)
                     + fVar272 * fVar242;
                auVar257._8_4_ =
                     fVar218 * (fStack_b48 * fVar275 + fVar218 * fStack_b28) + fVar275 * fVar220;
                auVar257._12_4_ =
                     fVar241 * (fStack_b44 * fVar278 + fVar241 * fStack_b24) + fVar278 * fVar243;
                auVar206._0_4_ =
                     fVar200 * fVar219 +
                     fVar269 * (fVar269 * (float)local_b60._0_4_ + (float)local_b40._0_4_ * fVar200)
                ;
                auVar206._4_4_ =
                     fVar224 * fVar242 +
                     fVar272 * (fVar272 * (float)local_b60._4_4_ + (float)local_b40._4_4_ * fVar224)
                ;
                auVar206._8_4_ =
                     fVar218 * fVar220 + fVar275 * (fVar275 * fStack_b58 + fStack_b38 * fVar218);
                auVar206._12_4_ =
                     fVar241 * fVar243 + fVar278 * (fVar278 * fStack_b54 + fStack_b34 * fVar241);
                auVar146 = vshufps_avx(auVar366._0_16_,auVar366._0_16_,0);
                auVar142._0_4_ = auVar146._0_4_ * (float)local_990._0_4_ + 0.0;
                auVar142._4_4_ = auVar146._4_4_ * (float)local_990._4_4_ + 0.0;
                auVar142._8_4_ = auVar146._8_4_ * fStack_988 + 0.0;
                auVar142._12_4_ = auVar146._12_4_ * fStack_984 + 0.0;
                auVar106._0_4_ = fVar200 * auVar257._0_4_ + fVar269 * auVar206._0_4_;
                auVar106._4_4_ = fVar224 * auVar257._4_4_ + fVar272 * auVar206._4_4_;
                auVar106._8_4_ = fVar218 * auVar257._8_4_ + fVar275 * auVar206._8_4_;
                auVar106._12_4_ = fVar241 * auVar257._12_4_ + fVar278 * auVar206._12_4_;
                local_920._0_16_ = auVar106;
                auVar146 = vsubps_avx(auVar142,auVar106);
                _local_ae0 = auVar146;
                auVar146 = vdpps_avx(auVar146,auVar146,0x7f);
                fVar269 = auVar146._0_4_;
                if (fVar269 < 0.0) {
                  fVar272 = sqrtf(fVar269);
                  auVar217 = ZEXT1664(auVar329);
                }
                else {
                  auVar329 = vsqrtss_avx(auVar146,auVar146);
                  fVar272 = auVar329._0_4_;
                }
                auVar329 = vsubps_avx(auVar206,auVar257);
                auVar292._0_4_ = auVar329._0_4_ * 3.0;
                auVar292._4_4_ = auVar329._4_4_ * 3.0;
                auVar292._8_4_ = auVar329._8_4_ * 3.0;
                auVar292._12_4_ = auVar329._12_4_ * 3.0;
                fVar275 = auVar217._0_4_;
                auVar329 = vshufps_avx(ZEXT416((uint)(fVar275 * 6.0)),ZEXT416((uint)(fVar275 * 6.0))
                                       ,0);
                auVar107 = ZEXT416((uint)((fVar281 - (fVar275 + fVar275)) * 6.0));
                auVar182 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)((fVar275 - (fVar281 + fVar281)) * 6.0));
                auVar207 = vshufps_avx(auVar107,auVar107,0);
                auVar4 = vshufps_avx(ZEXT416((uint)(fVar281 * 6.0)),ZEXT416((uint)(fVar281 * 6.0)),0
                                    );
                auVar107 = vdpps_avx(auVar292,auVar292,0x7f);
                auVar143._0_4_ =
                     auVar4._0_4_ * (float)local_b30._0_4_ +
                     auVar207._0_4_ * (float)local_b50._0_4_ +
                     auVar329._0_4_ * (float)local_b60._0_4_ +
                     auVar182._0_4_ * (float)local_b40._0_4_;
                auVar143._4_4_ =
                     auVar4._4_4_ * (float)local_b30._4_4_ +
                     auVar207._4_4_ * (float)local_b50._4_4_ +
                     auVar329._4_4_ * (float)local_b60._4_4_ +
                     auVar182._4_4_ * (float)local_b40._4_4_;
                auVar143._8_4_ =
                     auVar4._8_4_ * fStack_b28 +
                     auVar207._8_4_ * fStack_b48 +
                     auVar329._8_4_ * fStack_b58 + auVar182._8_4_ * fStack_b38;
                auVar143._12_4_ =
                     auVar4._12_4_ * fStack_b24 +
                     auVar207._12_4_ * fStack_b44 +
                     auVar329._12_4_ * fStack_b54 + auVar182._12_4_ * fStack_b34;
                auVar329 = vblendps_avx(auVar107,_DAT_01feba10,0xe);
                auVar182 = vrsqrtss_avx(auVar329,auVar329);
                fVar278 = auVar182._0_4_;
                fVar275 = auVar107._0_4_;
                auVar182 = vdpps_avx(auVar292,auVar143,0x7f);
                auVar207 = vshufps_avx(auVar107,auVar107,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar207._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar207._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar207._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar207._12_4_;
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                auVar231._0_4_ = auVar292._0_4_ * auVar182._0_4_;
                auVar231._4_4_ = auVar292._4_4_ * auVar182._4_4_;
                auVar231._8_4_ = auVar292._8_4_ * auVar182._8_4_;
                auVar231._12_4_ = auVar292._12_4_ * auVar182._12_4_;
                auVar4 = vsubps_avx(auVar144,auVar231);
                auVar182 = vrcpss_avx(auVar329,auVar329);
                auVar329 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                      ZEXT416((uint)(auVar366._0_4_ * (float)local_940._0_4_)));
                auVar182 = ZEXT416((uint)(auVar182._0_4_ * (2.0 - fVar275 * auVar182._0_4_)));
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                uVar98 = CONCAT44(auVar292._4_4_,auVar292._0_4_);
                local_9c0._0_8_ = uVar98 ^ 0x8000000080000000;
                local_9c0._8_4_ = -auVar292._8_4_;
                local_9c0._12_4_ = -auVar292._12_4_;
                auVar207 = ZEXT416((uint)(fVar278 * 1.5 +
                                         fVar275 * -0.5 * fVar278 * fVar278 * fVar278));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar208._0_4_ = auVar207._0_4_ * auVar4._0_4_ * auVar182._0_4_;
                auVar208._4_4_ = auVar207._4_4_ * auVar4._4_4_ * auVar182._4_4_;
                auVar208._8_4_ = auVar207._8_4_ * auVar4._8_4_ * auVar182._8_4_;
                auVar208._12_4_ = auVar207._12_4_ * auVar4._12_4_ * auVar182._12_4_;
                auVar330._0_4_ = auVar292._0_4_ * auVar207._0_4_;
                auVar330._4_4_ = auVar292._4_4_ * auVar207._4_4_;
                auVar330._8_4_ = auVar292._8_4_ * auVar207._8_4_;
                auVar330._12_4_ = auVar292._12_4_ * auVar207._12_4_;
                if (fVar275 < 0.0) {
                  local_980._0_16_ = auVar330;
                  local_b20._0_16_ = auVar208;
                  fVar275 = sqrtf(fVar275);
                  auVar208 = local_b20._0_16_;
                  auVar330 = local_980._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar275 = auVar107._0_4_;
                }
                auVar107 = vdpps_avx(_local_ae0,auVar330,0x7f);
                fVar272 = ((float)local_ac0._0_4_ / fVar275) * (fVar272 + 1.0) +
                          auVar329._0_4_ + fVar272 * (float)local_ac0._0_4_;
                auVar182 = vdpps_avx(local_9c0._0_16_,auVar330,0x7f);
                auVar207 = vdpps_avx(_local_ae0,auVar208,0x7f);
                auVar4 = vdpps_avx(_local_990,auVar330,0x7f);
                auVar5 = vdpps_avx(_local_ae0,local_9c0._0_16_,0x7f);
                fVar275 = auVar182._0_4_ + auVar207._0_4_;
                fVar278 = auVar107._0_4_;
                auVar108._0_4_ = fVar278 * fVar278;
                auVar108._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                auVar108._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                auVar108._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                auVar207 = vsubps_avx(auVar146,auVar108);
                local_9c0._0_16_ = ZEXT416((uint)fVar275);
                auVar182 = vdpps_avx(_local_ae0,_local_990,0x7f);
                fVar281 = auVar5._0_4_ - fVar278 * fVar275;
                fVar278 = auVar182._0_4_ - fVar278 * auVar4._0_4_;
                auVar182 = vrsqrtss_avx(auVar207,auVar207);
                fVar200 = auVar207._0_4_;
                fVar275 = auVar182._0_4_;
                fVar275 = fVar275 * 1.5 + fVar200 * -0.5 * fVar275 * fVar275 * fVar275;
                if (fVar200 < 0.0) {
                  local_980._0_16_ = auVar107;
                  local_b20._0_16_ = auVar4;
                  local_760._0_4_ = fVar281;
                  local_780._0_4_ = fVar278;
                  local_7a0._0_4_ = fVar275;
                  fVar200 = sqrtf(fVar200);
                  fVar275 = (float)local_7a0._0_4_;
                  fVar281 = (float)local_760._0_4_;
                  fVar278 = (float)local_780._0_4_;
                  auVar4 = local_b20._0_16_;
                  auVar107 = local_980._0_16_;
                }
                else {
                  auVar182 = vsqrtss_avx(auVar207,auVar207);
                  fVar200 = auVar182._0_4_;
                }
                auVar376 = ZEXT3264(local_aa0);
                auVar145 = vpermilps_avx(local_920._0_16_,0xff);
                auVar5 = vshufps_avx(auVar292,auVar292,0xff);
                fVar224 = fVar281 * fVar275 - auVar5._0_4_;
                auVar232._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar232._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar232._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar258._0_4_ = -fVar224;
                auVar258._4_4_ = 0x80000000;
                auVar258._8_4_ = 0x80000000;
                auVar258._12_4_ = 0x80000000;
                fVar281 = local_9c0._0_4_ * fVar278 * fVar275;
                auVar302 = ZEXT464((uint)fVar281);
                auVar182 = vinsertps_avx(ZEXT416((uint)(fVar278 * fVar275)),auVar232,0x10);
                auVar207 = vmovsldup_avx(ZEXT416((uint)(fVar281 - auVar4._0_4_ * fVar224)));
                auVar182 = vdivps_avx(auVar182,auVar207);
                auVar145 = ZEXT416((uint)(fVar200 - auVar145._0_4_));
                auVar4 = vinsertps_avx(auVar107,auVar145,0x10);
                auVar209._0_4_ = auVar4._0_4_ * auVar182._0_4_;
                auVar209._4_4_ = auVar4._4_4_ * auVar182._4_4_;
                auVar209._8_4_ = auVar4._8_4_ * auVar182._8_4_;
                auVar209._12_4_ = auVar4._12_4_ * auVar182._12_4_;
                auVar182 = vinsertps_avx(auVar258,local_9c0._0_16_,0x1c);
                auVar182 = vdivps_avx(auVar182,auVar207);
                auVar207 = vhaddps_avx(auVar209,auVar209);
                auVar183._0_4_ = auVar4._0_4_ * auVar182._0_4_;
                auVar183._4_4_ = auVar4._4_4_ * auVar182._4_4_;
                auVar183._8_4_ = auVar4._8_4_ * auVar182._8_4_;
                auVar183._12_4_ = auVar4._12_4_ * auVar182._12_4_;
                auVar182 = vhaddps_avx(auVar183,auVar183);
                fVar283 = fVar283 - auVar207._0_4_;
                auVar217 = ZEXT464((uint)fVar283);
                fVar275 = auVar366._0_4_ - auVar182._0_4_;
                auVar366 = ZEXT464((uint)fVar275);
                auVar233._8_4_ = 0x7fffffff;
                auVar233._0_8_ = 0x7fffffff7fffffff;
                auVar233._12_4_ = 0x7fffffff;
                auVar268 = ZEXT1664(auVar233);
                auVar107 = vandps_avx(auVar107,auVar233);
                bVar60 = true;
                if (auVar107._0_4_ < fVar272) {
                  auVar107 = vandps_avx(auVar145,auVar233);
                  if (auVar107._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + auVar329._0_4_ + fVar272) {
                    fVar275 = fVar275 + (float)local_8f0._0_4_;
                    auVar366 = ZEXT464((uint)fVar275);
                    if ((((fVar250 <= fVar275) &&
                         (fVar272 = *(float *)(ray + k * 4 + 0x100), fVar275 <= fVar272)) &&
                        (0.0 <= fVar283)) && (fVar283 <= 1.0)) {
                      auVar146 = vrsqrtss_avx(auVar146,auVar146);
                      fVar278 = auVar146._0_4_;
                      pGVar9 = (context->scene->geometries).items[local_a58].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R13B = true;
                        }
                        else {
                          auVar146 = ZEXT416((uint)(fVar278 * 1.5 +
                                                   fVar269 * -0.5 * fVar278 * fVar278 * fVar278));
                          auVar146 = vshufps_avx(auVar146,auVar146,0);
                          auVar147._0_4_ = auVar146._0_4_ * (float)local_ae0._0_4_;
                          auVar147._4_4_ = auVar146._4_4_ * (float)local_ae0._4_4_;
                          auVar147._8_4_ = auVar146._8_4_ * fStack_ad8;
                          auVar147._12_4_ = auVar146._12_4_ * fStack_ad4;
                          auVar109._0_4_ = auVar292._0_4_ + auVar5._0_4_ * auVar147._0_4_;
                          auVar109._4_4_ = auVar292._4_4_ + auVar5._4_4_ * auVar147._4_4_;
                          auVar109._8_4_ = auVar292._8_4_ + auVar5._8_4_ * auVar147._8_4_;
                          auVar109._12_4_ = auVar292._12_4_ + auVar5._12_4_ * auVar147._12_4_;
                          auVar146 = vshufps_avx(auVar147,auVar147,0xc9);
                          auVar329 = vshufps_avx(auVar292,auVar292,0xc9);
                          auVar148._0_4_ = auVar329._0_4_ * auVar147._0_4_;
                          auVar148._4_4_ = auVar329._4_4_ * auVar147._4_4_;
                          auVar148._8_4_ = auVar329._8_4_ * auVar147._8_4_;
                          auVar148._12_4_ = auVar329._12_4_ * auVar147._12_4_;
                          auVar184._0_4_ = auVar292._0_4_ * auVar146._0_4_;
                          auVar184._4_4_ = auVar292._4_4_ * auVar146._4_4_;
                          auVar184._8_4_ = auVar292._8_4_ * auVar146._8_4_;
                          auVar184._12_4_ = auVar292._12_4_ * auVar146._12_4_;
                          auVar107 = vsubps_avx(auVar184,auVar148);
                          auVar146 = vshufps_avx(auVar107,auVar107,0xc9);
                          auVar329 = vshufps_avx(auVar109,auVar109,0xc9);
                          auVar185._0_4_ = auVar329._0_4_ * auVar146._0_4_;
                          auVar185._4_4_ = auVar329._4_4_ * auVar146._4_4_;
                          auVar185._8_4_ = auVar329._8_4_ * auVar146._8_4_;
                          auVar185._12_4_ = auVar329._12_4_ * auVar146._12_4_;
                          auVar146 = vshufps_avx(auVar107,auVar107,0xd2);
                          auVar110._0_4_ = auVar109._0_4_ * auVar146._0_4_;
                          auVar110._4_4_ = auVar109._4_4_ * auVar146._4_4_;
                          auVar110._8_4_ = auVar109._8_4_ * auVar146._8_4_;
                          auVar110._12_4_ = auVar109._12_4_ * auVar146._12_4_;
                          auVar146 = vsubps_avx(auVar185,auVar110);
                          pRVar11 = context->user;
                          auVar329 = ZEXT416((uint)fVar283);
                          local_570 = vshufps_avx(auVar329,auVar329,0);
                          auStack_5d0 = vshufps_avx(auVar146,auVar146,0x55);
                          local_5b0 = vshufps_avx(auVar146,auVar146,0xaa);
                          local_590 = vshufps_avx(auVar146,auVar146,0);
                          local_5e0 = (RTCHitN  [16])auStack_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = local_570;
                          local_560 = ZEXT832(0) << 0x20;
                          local_540 = local_4a0._0_8_;
                          uStack_538 = local_4a0._8_8_;
                          uStack_530 = local_4a0._16_8_;
                          uStack_528 = local_4a0._24_8_;
                          local_520 = local_480._0_8_;
                          uStack_518 = local_480._8_8_;
                          uStack_510 = local_480._16_8_;
                          uStack_508 = local_480._24_8_;
                          local_a60[1] = local_a20;
                          *local_a60 = local_a20;
                          local_500 = pRVar11->instID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          local_4e0 = pRVar11->instPrimID[0];
                          uStack_4dc = local_4e0;
                          uStack_4d8 = local_4e0;
                          uStack_4d4 = local_4e0;
                          uStack_4d0 = local_4e0;
                          uStack_4cc = local_4e0;
                          uStack_4c8 = local_4e0;
                          uStack_4c4 = local_4e0;
                          *(float *)(ray + k * 4 + 0x100) = fVar275;
                          local_b80 = *local_a68;
                          uStack_b78 = local_a68[1];
                          local_b70 = *local_a70;
                          uStack_b68 = local_a70[1];
                          local_a50.valid = (int *)&local_b80;
                          local_a50.geometryUserPtr = pGVar9->userPtr;
                          local_a50.context = context->user;
                          local_a50.hit = local_5e0;
                          local_a50.N = 8;
                          local_a50.ray = (RTCRayN *)ray;
                          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar302 = ZEXT464((uint)fVar281);
                            (*pGVar9->occlusionFilterN)(&local_a50);
                            auVar217 = ZEXT1664(auVar329);
                            auVar376 = ZEXT3264(local_aa0);
                            auVar268 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar84._8_8_ = uStack_b78;
                          auVar84._0_8_ = local_b80;
                          auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,auVar84);
                          auVar88._8_8_ = uStack_b68;
                          auVar88._0_8_ = local_b70;
                          auVar329 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                          auVar125._16_16_ = auVar329;
                          auVar125._0_16_ = auVar146;
                          auVar120 = local_a20 & ~auVar125;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar120[0x1f]) {
                            auVar126._0_4_ = auVar146._0_4_ ^ local_a20._0_4_;
                            auVar126._4_4_ = auVar146._4_4_ ^ local_a20._4_4_;
                            auVar126._8_4_ = auVar146._8_4_ ^ local_a20._8_4_;
                            auVar126._12_4_ = auVar146._12_4_ ^ local_a20._12_4_;
                            auVar126._16_4_ = auVar329._0_4_ ^ local_a20._16_4_;
                            auVar126._20_4_ = auVar329._4_4_ ^ local_a20._20_4_;
                            auVar126._24_4_ = auVar329._8_4_ ^ local_a20._24_4_;
                            auVar126._28_4_ = auVar329._12_4_ ^ local_a20._28_4_;
                          }
                          else {
                            p_Var12 = context->args->filter;
                            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar302 = ZEXT1664(auVar302._0_16_);
                              (*p_Var12)(&local_a50);
                              auVar217 = ZEXT1664(auVar217._0_16_);
                              auVar376 = ZEXT3264(local_aa0);
                              auVar268 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar85._8_8_ = uStack_b78;
                            auVar85._0_8_ = local_b80;
                            auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,auVar85);
                            auVar89._8_8_ = uStack_b68;
                            auVar89._0_8_ = local_b70;
                            auVar329 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                            auVar170._16_16_ = auVar329;
                            auVar170._0_16_ = auVar146;
                            auVar126._0_4_ = auVar146._0_4_ ^ local_a20._0_4_;
                            auVar126._4_4_ = auVar146._4_4_ ^ local_a20._4_4_;
                            auVar126._8_4_ = auVar146._8_4_ ^ local_a20._8_4_;
                            auVar126._12_4_ = auVar146._12_4_ ^ local_a20._12_4_;
                            auVar126._16_4_ = auVar329._0_4_ ^ local_a20._16_4_;
                            auVar126._20_4_ = auVar329._4_4_ ^ local_a20._20_4_;
                            auVar126._24_4_ = auVar329._8_4_ ^ local_a20._24_4_;
                            auVar126._28_4_ = auVar329._12_4_ ^ local_a20._28_4_;
                            auVar196._8_4_ = 0xff800000;
                            auVar196._0_8_ = 0xff800000ff800000;
                            auVar196._12_4_ = 0xff800000;
                            auVar196._16_4_ = 0xff800000;
                            auVar196._20_4_ = 0xff800000;
                            auVar196._24_4_ = 0xff800000;
                            auVar196._28_4_ = 0xff800000;
                            auVar120 = vblendvps_avx(auVar196,*(undefined1 (*) [32])
                                                               (local_a50.ray + 0x100),auVar170);
                            *(undefined1 (*) [32])(local_a50.ray + 0x100) = auVar120;
                          }
                          bVar80 = (auVar126 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar81 = (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar79 = (auVar126 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar78 = SUB321(auVar126 >> 0x7f,0) != '\0';
                          bVar77 = (auVar126 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar76 = SUB321(auVar126 >> 0xbf,0) != '\0';
                          bVar74 = (auVar126 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar60 = auVar126[0x1f] < '\0';
                          unaff_R13B = ((((((bVar80 || bVar81) || bVar79) || bVar78) || bVar77) ||
                                        bVar76) || bVar74) || bVar60;
                          if (((((((!bVar80 && !bVar81) && !bVar79) && !bVar78) && !bVar77) &&
                               !bVar76) && !bVar74) && !bVar60) {
                            *(float *)(ray + k * 4 + 0x100) = fVar272;
                          }
                        }
                        auVar366 = ZEXT464((uint)fVar275);
                        bVar60 = false;
                        goto LAB_01127ef1;
                      }
                    }
                    bVar60 = false;
                    unaff_R13B = 0;
                  }
                }
LAB_01127ef1:
                if (!bVar60) goto LAB_0112826e;
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              unaff_R13B = 0;
LAB_0112826e:
              unaff_R13B = unaff_R13B & 1;
              uVar97 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_R13B);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar2;
              auVar127._0_4_ = uVar2;
              auVar127._8_4_ = uVar2;
              auVar127._12_4_ = uVar2;
              auVar127._16_4_ = uVar2;
              auVar127._20_4_ = uVar2;
              auVar127._24_4_ = uVar2;
              auVar127._28_4_ = uVar2;
              auVar118 = vcmpps_avx(_local_840,auVar127,2);
              auVar120 = vandps_avx(auVar118,local_700);
              local_700 = local_700 & auVar118;
              uVar98 = local_720;
            } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_700 >> 0x7f,0) != '\0') ||
                       (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0xbf,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_700[0x1f] < '\0');
          }
          auVar120 = vandps_avx(local_660,local_640);
          auVar118 = vandps_avx(_local_8c0,_local_8a0);
          auVar197._0_4_ = local_9e0 + local_420._0_4_;
          auVar197._4_4_ = fStack_9dc + local_420._4_4_;
          auVar197._8_4_ = fStack_9d8 + local_420._8_4_;
          auVar197._12_4_ = fStack_9d4 + local_420._12_4_;
          auVar197._16_4_ = fStack_9d0 + local_420._16_4_;
          auVar197._20_4_ = fStack_9cc + local_420._20_4_;
          auVar197._24_4_ = fStack_9c8 + local_420._24_4_;
          auVar197._28_4_ = fStack_9c4 + local_420._28_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar240._4_4_ = uVar2;
          auVar240._0_4_ = uVar2;
          auVar240._8_4_ = uVar2;
          auVar240._12_4_ = uVar2;
          auVar240._16_4_ = uVar2;
          auVar240._20_4_ = uVar2;
          auVar240._24_4_ = uVar2;
          auVar240._28_4_ = uVar2;
          auVar13 = vcmpps_avx(auVar197,auVar240,2);
          auVar120 = vandps_avx(auVar13,auVar120);
          auVar266._0_4_ = local_9e0 + local_3e0._0_4_;
          auVar266._4_4_ = fStack_9dc + local_3e0._4_4_;
          auVar266._8_4_ = fStack_9d8 + local_3e0._8_4_;
          auVar266._12_4_ = fStack_9d4 + local_3e0._12_4_;
          auVar266._16_4_ = fStack_9d0 + local_3e0._16_4_;
          auVar266._20_4_ = fStack_9cc + local_3e0._20_4_;
          auVar266._24_4_ = fStack_9c8 + local_3e0._24_4_;
          auVar266._28_4_ = fStack_9c4 + local_3e0._28_4_;
          auVar268 = ZEXT3264(auVar266);
          auVar13 = vcmpps_avx(auVar266,auVar240,2);
          auVar118 = vandps_avx(auVar13,auVar118);
          auVar118 = vorps_avx(auVar120,auVar118);
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0x7f,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0xbf,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar118[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar118;
            auVar120 = vblendvps_avx(_local_3e0,_local_420,auVar120);
            *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar120;
            uVar3 = vmovlps_avx(local_8e0);
            *(undefined8 *)(afStack_140 + uVar94 * 0x18) = uVar3;
            auStack_138[uVar94 * 0x18] = (int)uVar98 + 1;
            uVar94 = (ulong)((int)uVar94 + 1);
          }
        }
        goto LAB_01126438;
      }
      auVar376 = ZEXT3264(local_aa0);
    }
    auVar217 = ZEXT3264(CONCAT428(fStack_9c4,
                                  CONCAT424(fStack_9c8,
                                            CONCAT420(fStack_9cc,
                                                      CONCAT416(fStack_9d0,
                                                                CONCAT412(fStack_9d4,
                                                                          CONCAT48(fStack_9d8,
                                                                                   CONCAT44(
                                                  fStack_9dc,local_9e0))))))));
    do {
      uVar92 = (uint)uVar94;
      if (uVar92 == 0) {
        if ((uVar97 & 1) != 0) {
          return local_c69;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar128._4_4_ = uVar2;
        auVar128._0_4_ = uVar2;
        auVar128._8_4_ = uVar2;
        auVar128._12_4_ = uVar2;
        auVar128._16_4_ = uVar2;
        auVar128._20_4_ = uVar2;
        auVar128._24_4_ = uVar2;
        auVar128._28_4_ = uVar2;
        auVar120 = vcmpps_avx(local_3a0,auVar128,2);
        uVar92 = vmovmskps_avx(auVar120);
        uVar92 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar92;
        local_c69 = uVar92 != 0;
        if (!local_c69) {
          return local_c69;
        }
        goto LAB_0112598a;
      }
      uVar94 = (ulong)(uVar92 - 1);
      lVar96 = uVar94 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_160 + lVar96);
      auVar117._0_4_ = auVar217._0_4_ + auVar120._0_4_;
      auVar117._4_4_ = auVar217._4_4_ + auVar120._4_4_;
      auVar117._8_4_ = auVar217._8_4_ + auVar120._8_4_;
      auVar117._12_4_ = auVar217._12_4_ + auVar120._12_4_;
      auVar117._16_4_ = auVar217._16_4_ + auVar120._16_4_;
      auVar117._20_4_ = auVar217._20_4_ + auVar120._20_4_;
      auVar117._24_4_ = auVar217._24_4_ + auVar120._24_4_;
      auVar117._28_4_ = auVar217._28_4_ + auVar120._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar215._4_4_ = uVar2;
      auVar215._0_4_ = uVar2;
      auVar215._8_4_ = uVar2;
      auVar215._12_4_ = uVar2;
      auVar215._16_4_ = uVar2;
      auVar215._20_4_ = uVar2;
      auVar215._24_4_ = uVar2;
      auVar215._28_4_ = uVar2;
      auVar13 = vcmpps_avx(auVar117,auVar215,2);
      auVar118 = vandps_avx(auVar13,*(undefined1 (*) [32])(auStack_180 + lVar96));
      _local_5e0 = auVar118;
      auVar13 = *(undefined1 (*) [32])(auStack_180 + lVar96) & auVar13;
      bVar80 = (auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = SUB321(auVar13 >> 0x7f,0) == '\0';
      bVar77 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar76 = SUB321(auVar13 >> 0xbf,0) == '\0';
      bVar74 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar60 = -1 < auVar13[0x1f];
      if (((((((!bVar80 || !bVar81) || !bVar79) || !bVar78) || !bVar77) || !bVar76) || !bVar74) ||
          !bVar60) {
        auVar191._8_4_ = 0x7f800000;
        auVar191._0_8_ = 0x7f8000007f800000;
        auVar191._12_4_ = 0x7f800000;
        auVar191._16_4_ = 0x7f800000;
        auVar191._20_4_ = 0x7f800000;
        auVar191._24_4_ = 0x7f800000;
        auVar191._28_4_ = 0x7f800000;
        auVar120 = vblendvps_avx(auVar191,auVar120,auVar118);
        auVar13 = vshufps_avx(auVar120,auVar120,0xb1);
        auVar13 = vminps_avx(auVar120,auVar13);
        auVar14 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar14 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar120 = vcmpps_avx(auVar120,auVar13,0);
        auVar13 = auVar118 & auVar120;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar118 = vandps_avx(auVar120,auVar118);
        }
        fVar269 = afStack_140[uVar94 * 0x18 + 1];
        uVar98 = (ulong)auStack_138[uVar94 * 0x18];
        uVar95 = vmovmskps_avx(auVar118);
        uVar93 = 0;
        if (uVar95 != 0) {
          for (; (uVar95 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
          }
        }
        fVar272 = afStack_140[uVar94 * 0x18];
        *(undefined4 *)(local_5e0 + (ulong)uVar93 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar96) = _local_5e0;
        uVar95 = uVar92 - 1;
        if ((((((((_local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_5e0 >> 0x7f,0) != '\0') ||
              (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_5e0 >> 0xbf,0) != '\0') ||
            (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_5e0[0x1f] < '\0') {
          uVar95 = uVar92;
        }
        auVar146 = vshufps_avx(ZEXT416((uint)(fVar269 - fVar272)),ZEXT416((uint)(fVar269 - fVar272))
                               ,0);
        local_420._4_4_ = fVar272 + auVar146._4_4_ * 0.14285715;
        local_420._0_4_ = fVar272 + auVar146._0_4_ * 0.0;
        fStack_418 = fVar272 + auVar146._8_4_ * 0.2857143;
        fStack_414 = fVar272 + auVar146._12_4_ * 0.42857146;
        fStack_410 = fVar272 + auVar146._0_4_ * 0.5714286;
        fStack_40c = fVar272 + auVar146._4_4_ * 0.71428573;
        fStack_408 = fVar272 + auVar146._8_4_ * 0.8571429;
        fStack_404 = fVar272 + auVar146._12_4_;
        local_8e0._8_8_ = 0;
        local_8e0._0_8_ = *(ulong *)(local_420 + (ulong)uVar93 * 4);
        uVar94 = (ulong)uVar95;
      }
      auVar217 = ZEXT3264(CONCAT428(fStack_9c4,
                                    CONCAT424(fStack_9c8,
                                              CONCAT420(fStack_9cc,
                                                        CONCAT416(fStack_9d0,
                                                                  CONCAT412(fStack_9d4,
                                                                            CONCAT48(fStack_9d8,
                                                                                     CONCAT44(
                                                  fStack_9dc,local_9e0))))))));
    } while (((((((bVar80 && bVar81) && bVar79) && bVar78) && bVar77) && bVar76) && bVar74) &&
             bVar60);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }